

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp_bicubic_pack8.h
# Opt level: O0

void ncnn::resize_bicubic_image_pack8
               (Mat *src,Mat *dst,float *alpha,int *xofs,float *beta,int *yofs)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  undefined8 uVar38;
  undefined8 uVar39;
  undefined8 uVar40;
  undefined8 uVar41;
  undefined8 uVar42;
  undefined8 uVar43;
  undefined8 uVar44;
  undefined8 uVar45;
  undefined8 uVar46;
  undefined8 uVar47;
  undefined8 uVar48;
  undefined8 uVar49;
  undefined8 uVar50;
  undefined8 uVar51;
  undefined8 uVar52;
  undefined8 uVar53;
  undefined8 uVar54;
  undefined8 uVar55;
  undefined8 uVar56;
  undefined8 uVar57;
  undefined8 uVar58;
  undefined8 uVar59;
  undefined8 uVar60;
  undefined8 uVar61;
  undefined8 uVar62;
  undefined8 uVar63;
  undefined8 uVar64;
  undefined8 uVar65;
  undefined8 uVar66;
  undefined8 uVar67;
  undefined8 uVar68;
  undefined8 uVar69;
  undefined8 uVar70;
  undefined8 uVar71;
  undefined8 uVar72;
  undefined8 uVar73;
  undefined8 uVar74;
  undefined8 uVar75;
  undefined8 uVar76;
  undefined8 uVar77;
  undefined8 uVar78;
  undefined8 uVar79;
  undefined8 uVar80;
  undefined8 uVar81;
  undefined8 *puVar82;
  undefined8 *puVar83;
  undefined8 *puVar84;
  int iVar85;
  int iVar86;
  int iVar87;
  long in_RCX;
  uint *in_RDX;
  long *in_RSI;
  long *in_RDI;
  uint *in_R8;
  long in_R9;
  float fVar88;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar116;
  float fVar117;
  float fVar125;
  float fVar126;
  float fVar135;
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  float fVar114;
  float fVar118;
  float fVar127;
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  float fVar115;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar128;
  float fVar129;
  float fVar130;
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  __m256 _D;
  __m256 _rows3_4;
  __m256 _rows2_3;
  __m256 _rows1_2;
  __m256 _rows0_1;
  int dx_4;
  float *Dp;
  float *rows3p;
  float *rows2p;
  float *rows1p;
  float *rows0p;
  __m256 _b3;
  __m256 _b2;
  __m256 _b1;
  __m256 _b0;
  __m256 _rows3_3;
  __m256 _rows2_2;
  __m256 _rows1_1;
  __m256 _rows0;
  __m256 _S33_3;
  __m256 _S32_3;
  __m256 _S31_3;
  __m256 _S30_3;
  __m256 _S23_2;
  __m256 _S22_2;
  __m256 _S21_2;
  __m256 _S20_2;
  __m256 _S13_1;
  __m256 _S12_1;
  __m256 _S11_1;
  __m256 _S10_1;
  __m256 _S03;
  __m256 _S02;
  __m256 _S01;
  __m256 _S00;
  __m256 _a3_3;
  __m256 _a2_3;
  __m256 _a1_3;
  __m256 _a0_3;
  float *S3p_3;
  float *S2p_2;
  float *S1p_1;
  float *S0p;
  int sx_3;
  int dx_3;
  float *rows3p_4;
  float *rows2p_3;
  float *rows1p_2;
  float *rows0p_1;
  float *alphap_3;
  float *S3_3;
  float *S2_2;
  float *S1_1;
  float *S0;
  __m256 _rows3_2;
  __m256 _rows2_1;
  __m256 _rows1;
  __m256 _S33_2;
  __m256 _S32_2;
  __m256 _S31_2;
  __m256 _S30_2;
  __m256 _S23_1;
  __m256 _S22_1;
  __m256 _S21_1;
  __m256 _S20_1;
  __m256 _S13;
  __m256 _S12;
  __m256 _S11;
  __m256 _S10;
  __m256 _a3_2;
  __m256 _a2_2;
  __m256 _a1_2;
  __m256 _a0_2;
  float *S3p_2;
  float *S2p_1;
  float *S1p;
  int sx_2;
  int dx_2;
  float *rows3p_3;
  float *rows2p_2;
  float *rows1p_1;
  float *alphap_2;
  float *S3_2;
  float *S2_1;
  float *S1;
  float *rows2_old;
  float *rows1_old_1;
  float *rows0_old_2;
  __m256 _rows3_1;
  __m256 _rows2;
  __m256 _S33_1;
  __m256 _S32_1;
  __m256 _S31_1;
  __m256 _S30_1;
  __m256 _S23;
  __m256 _S22;
  __m256 _S21;
  __m256 _S20;
  __m256 _a3_1;
  __m256 _a2_1;
  __m256 _a1_1;
  __m256 _a0_1;
  float *S3p_1;
  float *S2p;
  int sx_1;
  int dx_1;
  float *rows3p_2;
  float *rows2p_1;
  float *alphap_1;
  float *S3_1;
  float *S2;
  float *rows1_old;
  float *rows0_old_1;
  __m256 _rows3;
  __m256 _S33;
  __m256 _S32;
  __m256 _S31;
  __m256 _S30;
  __m256 _a3;
  __m256 _a2;
  __m256 _a1;
  __m256 _a0;
  float *S3p;
  int sx;
  int dx;
  float *rows3p_1;
  float *alphap;
  float *S3;
  float *rows0_old;
  int sy;
  int dy;
  int prev_sy1;
  float *rows3;
  float *rows2;
  float *rows1;
  float *rows0;
  Mat rowsbuf3;
  Mat rowsbuf2;
  Mat rowsbuf1;
  Mat rowsbuf0;
  int h;
  int w;
  Allocator *in_stack_ffffffffffffbe18;
  undefined8 in_stack_ffffffffffffbe20;
  int iVar137;
  undefined8 **ppuVar136;
  size_t in_stack_ffffffffffffbe28;
  undefined8 in_stack_ffffffffffffbe30;
  int iVar138;
  Mat *in_stack_ffffffffffffbe38;
  undefined8 local_3880;
  undefined8 uStack_3878;
  undefined8 uStack_3870;
  undefined8 uStack_3868;
  int local_37cc;
  undefined8 *local_37c8;
  undefined8 *local_37c0;
  undefined8 *local_37b8;
  undefined8 *local_37b0;
  undefined8 *local_37a8;
  undefined8 local_3720;
  undefined8 uStack_3718;
  undefined8 uStack_3710;
  undefined8 uStack_3708;
  undefined8 local_3700;
  undefined8 uStack_36f8;
  undefined8 uStack_36f0;
  undefined8 uStack_36e8;
  undefined8 local_36e0;
  undefined8 uStack_36d8;
  undefined8 uStack_36d0;
  undefined8 uStack_36c8;
  undefined8 local_36c0;
  undefined8 uStack_36b8;
  undefined8 uStack_36b0;
  undefined8 uStack_36a8;
  int local_33ec;
  uint *local_33c8;
  undefined8 local_33a0;
  undefined8 uStack_3398;
  undefined8 uStack_3390;
  undefined8 uStack_3388;
  undefined8 local_3380;
  undefined8 uStack_3378;
  undefined8 uStack_3370;
  undefined8 uStack_3368;
  undefined8 local_3360;
  undefined8 uStack_3358;
  undefined8 uStack_3350;
  undefined8 uStack_3348;
  int local_3114;
  uint *local_30f8;
  undefined8 local_30c0;
  undefined8 uStack_30b8;
  undefined8 uStack_30b0;
  undefined8 uStack_30a8;
  undefined8 local_30a0;
  undefined8 uStack_3098;
  undefined8 uStack_3090;
  undefined8 uStack_3088;
  int local_2edc;
  uint *local_2ec8;
  undefined8 local_2ea0;
  undefined8 uStack_2e98;
  undefined8 uStack_2e90;
  undefined8 uStack_2e88;
  int local_2d6c;
  uint *local_2d60;
  int local_2d40;
  int local_2d3c;
  undefined8 *local_2d38;
  undefined8 *local_2d30;
  undefined8 *local_2d28;
  undefined8 *local_2d20;
  undefined8 *local_2d18;
  int *local_2d10;
  undefined8 local_2d08;
  undefined4 local_2d00;
  long *local_2cf8;
  undefined4 local_2cf0;
  undefined4 local_2cec;
  undefined4 local_2ce8;
  undefined4 local_2ce4;
  undefined4 local_2ce0;
  undefined8 local_2cd8;
  undefined8 *local_2cd0;
  int *local_2cc8;
  undefined8 local_2cc0;
  undefined4 local_2cb8;
  long *local_2cb0;
  undefined4 local_2ca8;
  undefined4 local_2ca4;
  undefined4 local_2ca0;
  undefined4 local_2c9c;
  undefined4 local_2c98;
  undefined8 local_2c90;
  undefined8 *local_2c78;
  int *local_2c70;
  undefined8 local_2c68;
  undefined4 local_2c60;
  long *local_2c58;
  undefined4 local_2c50;
  undefined4 local_2c4c;
  undefined4 local_2c48;
  undefined4 local_2c44;
  undefined4 local_2c40;
  undefined8 local_2c38;
  undefined8 *local_2c30;
  int *local_2c28;
  undefined8 local_2c20;
  undefined4 local_2c18;
  long *local_2c10;
  undefined4 local_2c08;
  undefined4 local_2c04;
  undefined4 local_2c00;
  undefined4 local_2bfc;
  undefined4 local_2bf8;
  undefined8 local_2bf0;
  int local_2be8;
  int local_2be4;
  long local_2be0;
  uint *local_2bd8;
  long local_2bd0;
  uint *local_2bc8;
  long *local_2bc0;
  long *local_2bb8;
  undefined8 *local_2bb0;
  undefined8 *local_2ba8;
  undefined8 *local_2ba0;
  undefined8 *local_2b98;
  undefined8 *local_2b90;
  undefined8 *local_2b88;
  undefined8 *local_2b80;
  undefined8 *local_2b78;
  undefined8 *local_2b70;
  undefined8 *local_2b68;
  undefined8 *local_2b60;
  undefined8 *local_2b58;
  undefined8 *local_2b50;
  undefined8 *local_2b48;
  undefined8 *local_2b40;
  undefined8 *local_2b38;
  undefined8 *local_2b30;
  undefined8 *local_2b28;
  undefined8 *local_2b20;
  undefined8 *local_2b18;
  undefined8 *local_2b10;
  undefined8 *local_2b08;
  undefined8 *local_2b00;
  undefined8 *local_2af8;
  undefined8 *local_2af0;
  undefined8 *local_2ae8;
  undefined8 *local_2ae0;
  undefined8 *local_2ad8;
  undefined8 *local_2ad0;
  undefined8 *local_2ac8;
  undefined8 *local_2ac0;
  undefined8 *local_2ab8;
  undefined8 *local_2ab0;
  undefined8 *local_2aa8;
  undefined8 *local_2aa0;
  undefined8 *local_2a98;
  undefined8 *local_2a90;
  undefined8 *local_2a88;
  undefined8 *local_2a80;
  undefined8 *local_2a78;
  undefined8 *local_2a70;
  undefined8 *local_2a68;
  undefined8 *local_2a60;
  undefined8 *local_2a58;
  undefined8 **local_2a50;
  undefined8 **local_2a40;
  undefined8 **local_2a30;
  undefined8 **local_2a20;
  int local_2a0c;
  long *local_2a08;
  int local_29fc;
  long *local_29f8;
  int local_29ec;
  long *local_29e8;
  int local_29dc;
  long *local_29d8;
  int local_29cc;
  long *local_29c8;
  int local_29bc;
  long *local_29b8;
  int local_29ac;
  long *local_29a8;
  int local_299c;
  long *local_2998;
  int local_298c;
  long *local_2988;
  int local_297c;
  long *local_2978;
  int local_296c;
  long *local_2968;
  undefined8 local_2960;
  undefined8 uStack_2958;
  undefined8 uStack_2950;
  undefined8 uStack_2948;
  undefined8 *local_2928;
  undefined8 local_2920;
  undefined8 uStack_2918;
  undefined8 uStack_2910;
  undefined8 uStack_2908;
  undefined8 *local_28e8;
  undefined8 local_28e0;
  undefined8 uStack_28d8;
  undefined8 uStack_28d0;
  undefined8 uStack_28c8;
  undefined8 *local_28a8;
  undefined8 local_28a0;
  undefined8 uStack_2898;
  undefined8 uStack_2890;
  undefined8 uStack_2888;
  undefined8 *local_2868;
  undefined8 local_2860;
  undefined8 uStack_2858;
  undefined8 uStack_2850;
  undefined8 uStack_2848;
  undefined8 *local_2828;
  undefined8 local_2820;
  undefined8 uStack_2818;
  undefined8 uStack_2810;
  undefined8 uStack_2808;
  undefined8 *local_27e8;
  undefined8 local_27e0;
  undefined8 uStack_27d8;
  undefined8 uStack_27d0;
  undefined8 uStack_27c8;
  undefined8 *local_27a8;
  undefined8 local_27a0;
  undefined8 uStack_2798;
  undefined8 uStack_2790;
  undefined8 uStack_2788;
  undefined8 *local_2768;
  undefined8 local_2760;
  undefined8 uStack_2758;
  undefined8 uStack_2750;
  undefined8 uStack_2748;
  undefined8 *local_2728;
  undefined8 local_2720;
  undefined8 uStack_2718;
  undefined8 uStack_2710;
  undefined8 uStack_2708;
  undefined8 *local_26e8;
  undefined8 local_26e0;
  undefined8 uStack_26d8;
  undefined8 uStack_26d0;
  undefined8 uStack_26c8;
  undefined8 *local_26b8;
  uint local_26b0;
  uint local_26ac;
  uint local_26a8;
  uint local_26a4;
  uint local_26a0;
  uint local_269c;
  uint local_2698;
  uint local_2694;
  uint local_2690;
  uint local_268c;
  uint local_2688;
  uint local_2684;
  uint local_2680;
  uint local_267c;
  uint local_2678;
  uint local_2674;
  uint local_2670;
  uint local_266c;
  uint local_2668;
  uint local_2664;
  undefined8 local_2660;
  undefined8 uStack_2658;
  undefined8 uStack_2650;
  undefined8 uStack_2648;
  undefined8 local_2640;
  undefined8 uStack_2638;
  undefined8 uStack_2630;
  undefined8 uStack_2628;
  undefined8 local_2620;
  undefined8 uStack_2618;
  undefined8 uStack_2610;
  undefined8 uStack_2608;
  undefined8 local_2600;
  undefined8 uStack_25f8;
  undefined8 uStack_25f0;
  undefined8 uStack_25e8;
  undefined8 local_25e0;
  undefined8 uStack_25d8;
  undefined8 uStack_25d0;
  undefined8 uStack_25c8;
  undefined8 local_25c0;
  undefined8 uStack_25b8;
  undefined8 uStack_25b0;
  undefined8 uStack_25a8;
  undefined8 local_25a0;
  undefined8 uStack_2598;
  undefined8 uStack_2590;
  undefined8 uStack_2588;
  undefined8 local_2580;
  undefined8 uStack_2578;
  undefined8 uStack_2570;
  undefined8 uStack_2568;
  undefined8 local_2560;
  undefined8 uStack_2558;
  undefined8 uStack_2550;
  undefined8 uStack_2548;
  undefined8 local_2540;
  undefined8 uStack_2538;
  undefined8 uStack_2530;
  undefined8 uStack_2528;
  undefined8 local_2520;
  undefined8 uStack_2518;
  undefined8 uStack_2510;
  undefined8 uStack_2508;
  undefined8 local_2500;
  undefined8 uStack_24f8;
  undefined8 uStack_24f0;
  undefined8 uStack_24e8;
  undefined8 local_24e0;
  undefined8 uStack_24d8;
  undefined8 uStack_24d0;
  undefined8 uStack_24c8;
  undefined8 local_24c0;
  undefined8 uStack_24b8;
  undefined8 uStack_24b0;
  undefined8 uStack_24a8;
  undefined8 local_24a0;
  undefined8 uStack_2498;
  undefined8 uStack_2490;
  undefined8 uStack_2488;
  undefined8 local_2480;
  undefined8 uStack_2478;
  undefined8 uStack_2470;
  undefined8 uStack_2468;
  undefined8 local_2460;
  undefined8 uStack_2458;
  undefined8 uStack_2450;
  undefined8 uStack_2448;
  undefined8 local_2440;
  undefined8 uStack_2438;
  undefined8 uStack_2430;
  undefined8 uStack_2428;
  undefined8 local_2420;
  undefined8 uStack_2418;
  undefined8 uStack_2410;
  undefined8 uStack_2408;
  undefined8 local_2400;
  undefined8 uStack_23f8;
  undefined8 uStack_23f0;
  undefined8 uStack_23e8;
  undefined8 local_23e0;
  undefined8 uStack_23d8;
  undefined8 uStack_23d0;
  undefined8 uStack_23c8;
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  undefined8 local_23a0;
  undefined8 uStack_2398;
  undefined8 uStack_2390;
  undefined8 uStack_2388;
  undefined8 local_2380;
  undefined8 uStack_2378;
  undefined8 uStack_2370;
  undefined8 uStack_2368;
  undefined8 local_2360;
  undefined8 uStack_2358;
  undefined8 uStack_2350;
  undefined8 uStack_2348;
  undefined8 local_2340;
  undefined8 uStack_2338;
  undefined8 uStack_2330;
  undefined8 uStack_2328;
  float local_2320;
  float fStack_231c;
  float fStack_2318;
  float fStack_2314;
  float fStack_2310;
  float fStack_230c;
  float fStack_2308;
  float fStack_2304;
  undefined8 local_2300;
  undefined8 uStack_22f8;
  undefined8 uStack_22f0;
  undefined8 uStack_22e8;
  undefined8 local_22e0;
  undefined8 uStack_22d8;
  undefined8 uStack_22d0;
  undefined8 uStack_22c8;
  undefined8 local_22c0;
  undefined8 uStack_22b8;
  undefined8 uStack_22b0;
  undefined8 uStack_22a8;
  undefined8 local_22a0;
  undefined8 uStack_2298;
  undefined8 uStack_2290;
  undefined8 uStack_2288;
  float local_2280;
  float fStack_227c;
  float fStack_2278;
  float fStack_2274;
  float fStack_2270;
  float fStack_226c;
  float fStack_2268;
  float fStack_2264;
  undefined8 local_2260;
  undefined8 uStack_2258;
  undefined8 uStack_2250;
  undefined8 uStack_2248;
  undefined8 local_2240;
  undefined8 uStack_2238;
  undefined8 uStack_2230;
  undefined8 uStack_2228;
  undefined8 local_2220;
  undefined8 uStack_2218;
  undefined8 uStack_2210;
  undefined8 uStack_2208;
  undefined8 local_2200;
  undefined8 uStack_21f8;
  undefined8 uStack_21f0;
  undefined8 uStack_21e8;
  float local_21e0;
  float fStack_21dc;
  float fStack_21d8;
  float fStack_21d4;
  float fStack_21d0;
  float fStack_21cc;
  float fStack_21c8;
  float fStack_21c4;
  undefined8 local_21c0;
  undefined8 uStack_21b8;
  undefined8 uStack_21b0;
  undefined8 uStack_21a8;
  undefined8 local_21a0;
  undefined8 uStack_2198;
  undefined8 uStack_2190;
  undefined8 uStack_2188;
  undefined8 local_2180;
  undefined8 uStack_2178;
  undefined8 uStack_2170;
  undefined8 uStack_2168;
  undefined8 local_2160;
  undefined8 uStack_2158;
  undefined8 uStack_2150;
  undefined8 uStack_2148;
  float local_2140;
  float fStack_213c;
  float fStack_2138;
  float fStack_2134;
  float fStack_2130;
  float fStack_212c;
  float fStack_2128;
  float fStack_2124;
  undefined8 local_2120;
  undefined8 uStack_2118;
  undefined8 uStack_2110;
  undefined8 uStack_2108;
  undefined8 local_2100;
  undefined8 uStack_20f8;
  undefined8 uStack_20f0;
  undefined8 uStack_20e8;
  undefined8 local_20e0;
  undefined8 uStack_20d8;
  undefined8 uStack_20d0;
  undefined8 uStack_20c8;
  undefined8 local_20c0;
  undefined8 uStack_20b8;
  undefined8 uStack_20b0;
  undefined8 uStack_20a8;
  float local_20a0;
  float fStack_209c;
  float fStack_2098;
  float fStack_2094;
  float fStack_2090;
  float fStack_208c;
  float fStack_2088;
  float fStack_2084;
  undefined8 local_2080;
  undefined8 uStack_2078;
  undefined8 uStack_2070;
  undefined8 uStack_2068;
  undefined8 local_2060;
  undefined8 uStack_2058;
  undefined8 uStack_2050;
  undefined8 uStack_2048;
  undefined8 local_2040;
  undefined8 uStack_2038;
  undefined8 uStack_2030;
  undefined8 uStack_2028;
  undefined8 local_2020;
  undefined8 uStack_2018;
  undefined8 uStack_2010;
  undefined8 uStack_2008;
  float local_2000;
  float fStack_1ffc;
  float fStack_1ff8;
  float fStack_1ff4;
  float fStack_1ff0;
  float fStack_1fec;
  float fStack_1fe8;
  float fStack_1fe4;
  undefined8 local_1fe0;
  undefined8 uStack_1fd8;
  undefined8 uStack_1fd0;
  undefined8 uStack_1fc8;
  undefined8 local_1fc0;
  undefined8 uStack_1fb8;
  undefined8 uStack_1fb0;
  undefined8 uStack_1fa8;
  undefined8 local_1fa0;
  undefined8 uStack_1f98;
  undefined8 uStack_1f90;
  undefined8 uStack_1f88;
  undefined8 local_1f80;
  undefined8 uStack_1f78;
  undefined8 uStack_1f70;
  undefined8 uStack_1f68;
  float local_1f60;
  float fStack_1f5c;
  float fStack_1f58;
  float fStack_1f54;
  float fStack_1f50;
  float fStack_1f4c;
  float fStack_1f48;
  float fStack_1f44;
  undefined8 local_1f40;
  undefined8 uStack_1f38;
  undefined8 uStack_1f30;
  undefined8 uStack_1f28;
  undefined8 local_1f20;
  undefined8 uStack_1f18;
  undefined8 uStack_1f10;
  undefined8 uStack_1f08;
  undefined8 local_1f00;
  undefined8 uStack_1ef8;
  undefined8 uStack_1ef0;
  undefined8 uStack_1ee8;
  undefined8 local_1ee0;
  undefined8 uStack_1ed8;
  undefined8 uStack_1ed0;
  undefined8 uStack_1ec8;
  float local_1ec0;
  float fStack_1ebc;
  float fStack_1eb8;
  float fStack_1eb4;
  float fStack_1eb0;
  float fStack_1eac;
  float fStack_1ea8;
  float fStack_1ea4;
  undefined8 local_1ea0;
  undefined8 uStack_1e98;
  undefined8 uStack_1e90;
  undefined8 uStack_1e88;
  undefined8 local_1e80;
  undefined8 uStack_1e78;
  undefined8 uStack_1e70;
  undefined8 uStack_1e68;
  undefined8 local_1e60;
  undefined8 uStack_1e58;
  undefined8 uStack_1e50;
  undefined8 uStack_1e48;
  undefined8 local_1e40;
  undefined8 uStack_1e38;
  undefined8 uStack_1e30;
  undefined8 uStack_1e28;
  float local_1e20;
  float fStack_1e1c;
  float fStack_1e18;
  float fStack_1e14;
  float fStack_1e10;
  float fStack_1e0c;
  float fStack_1e08;
  float fStack_1e04;
  undefined8 local_1e00;
  undefined8 uStack_1df8;
  undefined8 uStack_1df0;
  undefined8 uStack_1de8;
  undefined8 local_1de0;
  undefined8 uStack_1dd8;
  undefined8 uStack_1dd0;
  undefined8 uStack_1dc8;
  undefined8 local_1dc0;
  undefined8 uStack_1db8;
  undefined8 uStack_1db0;
  undefined8 uStack_1da8;
  undefined8 local_1da0;
  undefined8 uStack_1d98;
  undefined8 uStack_1d90;
  undefined8 uStack_1d88;
  float local_1d80;
  float fStack_1d7c;
  float fStack_1d78;
  float fStack_1d74;
  float fStack_1d70;
  float fStack_1d6c;
  float fStack_1d68;
  float fStack_1d64;
  undefined8 local_1d60;
  undefined8 uStack_1d58;
  undefined8 uStack_1d50;
  undefined8 uStack_1d48;
  undefined8 local_1d40;
  undefined8 uStack_1d38;
  undefined8 uStack_1d30;
  undefined8 uStack_1d28;
  undefined8 local_1d20;
  undefined8 uStack_1d18;
  undefined8 uStack_1d10;
  undefined8 uStack_1d08;
  undefined8 local_1d00;
  undefined8 uStack_1cf8;
  undefined8 uStack_1cf0;
  undefined8 uStack_1ce8;
  float local_1ce0;
  float fStack_1cdc;
  float fStack_1cd8;
  float fStack_1cd4;
  float fStack_1cd0;
  float fStack_1ccc;
  float fStack_1cc8;
  float fStack_1cc4;
  undefined8 local_1cc0;
  undefined8 uStack_1cb8;
  undefined8 uStack_1cb0;
  undefined8 uStack_1ca8;
  undefined8 local_1ca0;
  undefined8 uStack_1c98;
  undefined8 uStack_1c90;
  undefined8 uStack_1c88;
  undefined8 local_1c80;
  undefined8 uStack_1c78;
  undefined8 uStack_1c70;
  undefined8 uStack_1c68;
  undefined8 local_1c60;
  undefined8 uStack_1c58;
  undefined8 uStack_1c50;
  undefined8 uStack_1c48;
  float local_1c40;
  float fStack_1c3c;
  float fStack_1c38;
  float fStack_1c34;
  float fStack_1c30;
  float fStack_1c2c;
  float fStack_1c28;
  float fStack_1c24;
  undefined8 local_1c20;
  undefined8 uStack_1c18;
  undefined8 uStack_1c10;
  undefined8 uStack_1c08;
  undefined8 local_1c00;
  undefined8 uStack_1bf8;
  undefined8 uStack_1bf0;
  undefined8 uStack_1be8;
  undefined8 local_1be0;
  undefined8 uStack_1bd8;
  undefined8 uStack_1bd0;
  undefined8 uStack_1bc8;
  undefined8 local_1bc0;
  undefined8 uStack_1bb8;
  undefined8 uStack_1bb0;
  undefined8 uStack_1ba8;
  float local_1ba0;
  float fStack_1b9c;
  float fStack_1b98;
  float fStack_1b94;
  float fStack_1b90;
  float fStack_1b8c;
  float fStack_1b88;
  float fStack_1b84;
  undefined8 local_1b80;
  undefined8 uStack_1b78;
  undefined8 uStack_1b70;
  undefined8 uStack_1b68;
  undefined8 local_1b60;
  undefined8 uStack_1b58;
  undefined8 uStack_1b50;
  undefined8 uStack_1b48;
  undefined8 local_1b40;
  undefined8 uStack_1b38;
  undefined8 uStack_1b30;
  undefined8 uStack_1b28;
  undefined8 local_1b20;
  undefined8 uStack_1b18;
  undefined8 uStack_1b10;
  undefined8 uStack_1b08;
  float local_1b00;
  float fStack_1afc;
  float fStack_1af8;
  float fStack_1af4;
  float fStack_1af0;
  float fStack_1aec;
  float fStack_1ae8;
  float fStack_1ae4;
  undefined8 local_1ae0;
  undefined8 uStack_1ad8;
  undefined8 uStack_1ad0;
  undefined8 uStack_1ac8;
  undefined8 local_1ac0;
  undefined8 uStack_1ab8;
  undefined8 uStack_1ab0;
  undefined8 uStack_1aa8;
  undefined8 local_1aa0;
  undefined8 uStack_1a98;
  undefined8 uStack_1a90;
  undefined8 uStack_1a88;
  undefined8 local_1a80;
  undefined8 uStack_1a78;
  undefined8 uStack_1a70;
  undefined8 uStack_1a68;
  float local_1a60;
  float fStack_1a5c;
  float fStack_1a58;
  float fStack_1a54;
  float fStack_1a50;
  float fStack_1a4c;
  float fStack_1a48;
  float fStack_1a44;
  undefined8 local_1a40;
  undefined8 uStack_1a38;
  undefined8 uStack_1a30;
  undefined8 uStack_1a28;
  undefined8 local_1a20;
  undefined8 uStack_1a18;
  undefined8 uStack_1a10;
  undefined8 uStack_1a08;
  undefined8 local_1a00;
  undefined8 uStack_19f8;
  undefined8 uStack_19f0;
  undefined8 uStack_19e8;
  undefined8 local_19e0;
  undefined8 uStack_19d8;
  undefined8 uStack_19d0;
  undefined8 uStack_19c8;
  float local_19c0;
  float fStack_19bc;
  float fStack_19b8;
  float fStack_19b4;
  float fStack_19b0;
  float fStack_19ac;
  float fStack_19a8;
  float fStack_19a4;
  undefined8 local_19a0;
  undefined8 uStack_1998;
  undefined8 uStack_1990;
  undefined8 uStack_1988;
  undefined8 local_1980;
  undefined8 uStack_1978;
  undefined8 uStack_1970;
  undefined8 uStack_1968;
  undefined8 local_1960;
  undefined8 uStack_1958;
  undefined8 uStack_1950;
  undefined8 uStack_1948;
  undefined8 local_1940;
  undefined8 uStack_1938;
  undefined8 uStack_1930;
  undefined8 uStack_1928;
  float local_1920;
  float fStack_191c;
  float fStack_1918;
  float fStack_1914;
  float fStack_1910;
  float fStack_190c;
  float fStack_1908;
  float fStack_1904;
  undefined8 local_1900;
  undefined8 uStack_18f8;
  undefined8 uStack_18f0;
  undefined8 uStack_18e8;
  undefined8 local_18e0;
  undefined8 uStack_18d8;
  undefined8 uStack_18d0;
  undefined8 uStack_18c8;
  undefined8 local_18c0;
  undefined8 uStack_18b8;
  undefined8 uStack_18b0;
  undefined8 uStack_18a8;
  undefined8 local_18a0;
  undefined8 uStack_1898;
  undefined8 uStack_1890;
  undefined8 uStack_1888;
  float local_1880;
  float fStack_187c;
  float fStack_1878;
  float fStack_1874;
  float fStack_1870;
  float fStack_186c;
  float fStack_1868;
  float fStack_1864;
  undefined8 local_1860;
  undefined8 uStack_1858;
  undefined8 uStack_1850;
  undefined8 uStack_1848;
  undefined8 local_1840;
  undefined8 uStack_1838;
  undefined8 uStack_1830;
  undefined8 uStack_1828;
  undefined8 local_1820;
  undefined8 uStack_1818;
  undefined8 uStack_1810;
  undefined8 uStack_1808;
  undefined8 local_1800;
  undefined8 uStack_17f8;
  undefined8 uStack_17f0;
  undefined8 uStack_17e8;
  float local_17e0;
  float fStack_17dc;
  float fStack_17d8;
  float fStack_17d4;
  float fStack_17d0;
  float fStack_17cc;
  float fStack_17c8;
  float fStack_17c4;
  undefined8 local_17c0;
  undefined8 uStack_17b8;
  undefined8 uStack_17b0;
  undefined8 uStack_17a8;
  undefined8 local_17a0;
  undefined8 uStack_1798;
  undefined8 uStack_1790;
  undefined8 uStack_1788;
  undefined8 local_1780;
  undefined8 uStack_1778;
  undefined8 uStack_1770;
  undefined8 uStack_1768;
  undefined8 local_1760;
  undefined8 uStack_1758;
  undefined8 uStack_1750;
  undefined8 uStack_1748;
  float local_1740;
  float fStack_173c;
  float fStack_1738;
  float fStack_1734;
  float fStack_1730;
  float fStack_172c;
  float fStack_1728;
  float fStack_1724;
  undefined8 local_1720;
  undefined8 uStack_1718;
  undefined8 uStack_1710;
  undefined8 uStack_1708;
  undefined8 local_1700;
  undefined8 uStack_16f8;
  undefined8 uStack_16f0;
  undefined8 uStack_16e8;
  undefined8 local_16e0;
  undefined8 uStack_16d8;
  undefined8 uStack_16d0;
  undefined8 uStack_16c8;
  undefined8 local_16c0;
  undefined8 uStack_16b8;
  undefined8 uStack_16b0;
  undefined8 uStack_16a8;
  float local_16a0;
  float fStack_169c;
  float fStack_1698;
  float fStack_1694;
  float fStack_1690;
  float fStack_168c;
  float fStack_1688;
  float fStack_1684;
  undefined8 local_1680;
  undefined8 uStack_1678;
  undefined8 uStack_1670;
  undefined8 uStack_1668;
  undefined8 local_1660;
  undefined8 uStack_1658;
  undefined8 uStack_1650;
  undefined8 uStack_1648;
  undefined8 local_1640;
  undefined8 uStack_1638;
  undefined8 uStack_1630;
  undefined8 uStack_1628;
  undefined8 local_1620;
  undefined8 uStack_1618;
  undefined8 uStack_1610;
  undefined8 uStack_1608;
  float local_1600;
  float fStack_15fc;
  float fStack_15f8;
  float fStack_15f4;
  float fStack_15f0;
  float fStack_15ec;
  float fStack_15e8;
  float fStack_15e4;
  undefined8 local_15e0;
  undefined8 uStack_15d8;
  undefined8 uStack_15d0;
  undefined8 uStack_15c8;
  undefined8 local_15c0;
  undefined8 uStack_15b8;
  undefined8 uStack_15b0;
  undefined8 uStack_15a8;
  undefined8 local_15a0;
  undefined8 uStack_1598;
  undefined8 uStack_1590;
  undefined8 uStack_1588;
  undefined8 local_1580;
  undefined8 uStack_1578;
  undefined8 uStack_1570;
  undefined8 uStack_1568;
  float local_1560;
  float fStack_155c;
  float fStack_1558;
  float fStack_1554;
  float fStack_1550;
  float fStack_154c;
  float fStack_1548;
  float fStack_1544;
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined8 uStack_1530;
  undefined8 uStack_1528;
  undefined8 local_1520;
  undefined8 uStack_1518;
  undefined8 uStack_1510;
  undefined8 uStack_1508;
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  undefined8 local_14e0;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  float local_14c0;
  float fStack_14bc;
  float fStack_14b8;
  float fStack_14b4;
  float fStack_14b0;
  float fStack_14ac;
  float fStack_14a8;
  float fStack_14a4;
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  undefined8 local_1460;
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  float local_1420;
  float fStack_141c;
  float fStack_1418;
  float fStack_1414;
  float fStack_1410;
  float fStack_140c;
  float fStack_1408;
  float fStack_1404;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  float local_1380;
  float fStack_137c;
  float fStack_1378;
  float fStack_1374;
  float fStack_1370;
  float fStack_136c;
  float fStack_1368;
  float fStack_1364;
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  float local_12e0;
  float fStack_12dc;
  float fStack_12d8;
  float fStack_12d4;
  float fStack_12d0;
  float fStack_12cc;
  float fStack_12c8;
  float fStack_12c4;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  float local_1240;
  float fStack_123c;
  float fStack_1238;
  float fStack_1234;
  float fStack_1230;
  float fStack_122c;
  float fStack_1228;
  float fStack_1224;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  float local_11a0;
  float fStack_119c;
  float fStack_1198;
  float fStack_1194;
  float fStack_1190;
  float fStack_118c;
  float fStack_1188;
  float fStack_1184;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  float local_1100;
  float fStack_10fc;
  float fStack_10f8;
  float fStack_10f4;
  float fStack_10f0;
  float fStack_10ec;
  float fStack_10e8;
  float fStack_10e4;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  float local_1060;
  float fStack_105c;
  float fStack_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float fStack_1048;
  float fStack_1044;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  float local_fc0;
  float fStack_fbc;
  float fStack_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float fStack_fa8;
  float fStack_fa4;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  float local_f20;
  float fStack_f1c;
  float fStack_f18;
  float fStack_f14;
  float fStack_f10;
  float fStack_f0c;
  float fStack_f08;
  float fStack_f04;
  int local_ef0;
  undefined4 local_eec;
  undefined8 **local_ee8;
  int local_ed0;
  undefined4 local_ecc;
  undefined8 **local_ec8;
  int local_eb0;
  undefined4 local_eac;
  undefined8 **local_ea8;
  int local_e90;
  undefined4 local_e8c;
  undefined8 **local_e88;
  undefined8 *local_e80;
  undefined8 *local_e70;
  undefined8 *local_e60;
  undefined8 *local_e50;
  undefined1 local_e40 [32];
  uint local_e20;
  uint local_e1c;
  uint local_e18;
  uint local_e14;
  uint local_e10;
  uint local_e0c;
  uint local_e08;
  uint local_e04;
  undefined1 local_e00 [32];
  uint local_de0;
  uint local_ddc;
  uint local_dd8;
  uint local_dd4;
  uint local_dd0;
  uint local_dcc;
  uint local_dc8;
  uint local_dc4;
  undefined1 local_dc0 [32];
  uint local_da0;
  uint local_d9c;
  uint local_d98;
  uint local_d94;
  uint local_d90;
  uint local_d8c;
  uint local_d88;
  uint local_d84;
  undefined1 local_d80 [32];
  uint local_d60;
  uint local_d5c;
  uint local_d58;
  uint local_d54;
  uint local_d50;
  uint local_d4c;
  uint local_d48;
  uint local_d44;
  undefined1 local_d40 [32];
  uint local_d20;
  uint local_d1c;
  uint local_d18;
  uint local_d14;
  uint local_d10;
  uint local_d0c;
  uint local_d08;
  uint local_d04;
  undefined1 local_d00 [32];
  uint local_ce0;
  uint local_cdc;
  uint local_cd8;
  uint local_cd4;
  uint local_cd0;
  uint local_ccc;
  uint local_cc8;
  uint local_cc4;
  undefined1 local_cc0 [32];
  uint local_ca0;
  uint local_c9c;
  uint local_c98;
  uint local_c94;
  uint local_c90;
  uint local_c8c;
  uint local_c88;
  uint local_c84;
  undefined1 local_c80 [32];
  uint local_c60;
  uint local_c5c;
  uint local_c58;
  uint local_c54;
  uint local_c50;
  uint local_c4c;
  uint local_c48;
  uint local_c44;
  undefined1 local_c40 [32];
  uint local_c20;
  uint local_c1c;
  uint local_c18;
  uint local_c14;
  uint local_c10;
  uint local_c0c;
  uint local_c08;
  uint local_c04;
  undefined1 local_c00 [32];
  uint local_be0;
  uint local_bdc;
  uint local_bd8;
  uint local_bd4;
  uint local_bd0;
  uint local_bcc;
  uint local_bc8;
  uint local_bc4;
  undefined1 local_bc0 [32];
  uint local_ba0;
  uint local_b9c;
  uint local_b98;
  uint local_b94;
  uint local_b90;
  uint local_b8c;
  uint local_b88;
  uint local_b84;
  undefined1 local_b80 [32];
  uint local_b60;
  uint local_b5c;
  uint local_b58;
  uint local_b54;
  uint local_b50;
  uint local_b4c;
  uint local_b48;
  uint local_b44;
  undefined1 local_b40 [32];
  uint local_b20;
  uint local_b1c;
  uint local_b18;
  uint local_b14;
  uint local_b10;
  uint local_b0c;
  uint local_b08;
  uint local_b04;
  undefined1 local_b00 [32];
  uint local_ae0;
  uint local_adc;
  uint local_ad8;
  uint local_ad4;
  uint local_ad0;
  uint local_acc;
  uint local_ac8;
  uint local_ac4;
  undefined1 local_ac0 [32];
  uint local_aa0;
  uint local_a9c;
  uint local_a98;
  uint local_a94;
  uint local_a90;
  uint local_a8c;
  uint local_a88;
  uint local_a84;
  undefined1 local_a80 [32];
  uint local_a60;
  uint local_a5c;
  uint local_a58;
  uint local_a54;
  uint local_a50;
  uint local_a4c;
  uint local_a48;
  uint local_a44;
  undefined1 local_a40 [32];
  uint local_a20;
  uint local_a1c;
  uint local_a18;
  uint local_a14;
  uint local_a10;
  uint local_a0c;
  uint local_a08;
  uint local_a04;
  undefined1 local_a00 [32];
  uint local_9e0;
  uint local_9dc;
  uint local_9d8;
  uint local_9d4;
  uint local_9d0;
  uint local_9cc;
  uint local_9c8;
  uint local_9c4;
  undefined1 local_9c0 [32];
  uint local_9a0;
  uint local_99c;
  uint local_998;
  uint local_994;
  uint local_990;
  uint local_98c;
  uint local_988;
  uint local_984;
  undefined1 local_980 [32];
  uint local_960;
  uint local_95c;
  uint local_958;
  uint local_954;
  uint local_950;
  uint local_94c;
  uint local_948;
  uint local_944;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  float local_920;
  float fStack_91c;
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  float fStack_904;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  float local_8e0;
  float fStack_8dc;
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  float local_8a0;
  float fStack_89c;
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  float local_860;
  float fStack_85c;
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  float local_820;
  float fStack_81c;
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  float local_7e0;
  float fStack_7dc;
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  float local_7a0;
  float fStack_79c;
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  float local_760;
  float fStack_75c;
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  float local_720;
  float fStack_71c;
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  float local_6e0;
  float fStack_6dc;
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  float local_6a0;
  float fStack_69c;
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  float local_5e0;
  float fStack_5dc;
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  float local_4e0;
  float fStack_4dc;
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  float local_4a0;
  float fStack_49c;
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  float local_460;
  float fStack_45c;
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  float local_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  float local_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  float local_1e0;
  float fStack_1dc;
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  float local_1a0;
  float fStack_19c;
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  float local_160;
  float fStack_15c;
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined8 local_f0;
  undefined4 local_e4;
  undefined8 local_e0;
  int local_d4;
  undefined8 **local_d0;
  undefined8 local_c8;
  undefined4 local_bc;
  undefined8 local_b8;
  int local_ac;
  undefined8 **local_a8;
  undefined8 local_a0;
  undefined4 local_94;
  undefined8 local_90;
  int local_84;
  undefined8 **local_80;
  undefined8 local_78;
  undefined4 local_6c;
  undefined8 local_68;
  int local_5c;
  undefined8 **local_58;
  undefined8 **local_50;
  undefined8 **local_48;
  undefined8 **local_40;
  undefined8 **local_38;
  
  iVar138 = (int)((ulong)in_stack_ffffffffffffbe30 >> 0x20);
  iVar137 = (int)((ulong)in_stack_ffffffffffffbe20 >> 0x20);
  local_2be4 = *(int *)((long)in_RSI + 0x2c);
  local_2be8 = (int)in_RSI[6];
  local_d0 = &local_2c30;
  local_e0 = 0x20;
  local_e4 = 8;
  local_f0 = 0;
  local_2c30 = (undefined8 *)0x0;
  local_2c28 = (int *)0x0;
  local_2c20 = 0;
  local_2c18 = 0;
  local_2c10 = (long *)0x0;
  local_2c08 = 0;
  local_2c04 = 0;
  local_2c00 = 0;
  local_2bfc = 0;
  local_2bf8 = 0;
  local_2bf0 = 0;
  local_2be0 = in_R9;
  local_2bd8 = in_R8;
  local_2bd0 = in_RCX;
  local_2bc8 = in_RDX;
  local_2bc0 = in_RSI;
  local_2bb8 = in_RDI;
  local_d4 = local_2be4;
  Mat::create(in_stack_ffffffffffffbe38,iVar138,in_stack_ffffffffffffbe28,iVar137,
              in_stack_ffffffffffffbe18);
  local_a8 = &local_2c78;
  local_ac = local_2be4;
  local_b8 = 0x20;
  local_bc = 8;
  local_c8 = 0;
  local_2c78 = (undefined8 *)0x0;
  local_2c70 = (int *)0x0;
  local_2c68 = 0;
  local_2c60 = 0;
  local_2c58 = (long *)0x0;
  local_2c50 = 0;
  local_2c4c = 0;
  local_2c48 = 0;
  local_2c44 = 0;
  local_2c40 = 0;
  local_2c38 = 0;
  Mat::create(in_stack_ffffffffffffbe38,iVar138,in_stack_ffffffffffffbe28,iVar137,
              in_stack_ffffffffffffbe18);
  local_80 = &local_2cd0;
  local_84 = local_2be4;
  local_90 = 0x20;
  local_94 = 8;
  local_a0 = 0;
  local_2cd0 = (undefined8 *)0x0;
  local_2cc8 = (int *)0x0;
  local_2cc0 = 0;
  local_2cb8 = 0;
  local_2cb0 = (long *)0x0;
  local_2ca8 = 0;
  local_2ca4 = 0;
  local_2ca0 = 0;
  local_2c9c = 0;
  local_2c98 = 0;
  local_2c90 = 0;
  Mat::create(in_stack_ffffffffffffbe38,iVar138,in_stack_ffffffffffffbe28,iVar137,
              in_stack_ffffffffffffbe18);
  local_58 = &local_2d18;
  local_5c = local_2be4;
  local_68 = 0x20;
  local_6c = 8;
  local_78 = 0;
  local_2d18 = (undefined8 *)0x0;
  local_2d10 = (int *)0x0;
  local_2d08 = 0;
  local_2d00 = 0;
  local_2cf8 = (long *)0x0;
  local_2cf0 = 0;
  local_2cec = 0;
  local_2ce8 = 0;
  local_2ce4 = 0;
  local_2ce0 = 0;
  local_2cd8 = 0;
  Mat::create(in_stack_ffffffffffffbe38,iVar138,in_stack_ffffffffffffbe28,iVar137,
              in_stack_ffffffffffffbe18);
  local_38 = &local_2c30;
  local_2d20 = local_2c30;
  local_40 = &local_2c78;
  local_2d28 = local_2c78;
  local_48 = &local_2cd0;
  local_2d30 = local_2cd0;
  local_50 = &local_2d18;
  local_2d38 = local_2d18;
  local_2d3c = -3;
  for (local_2d40 = 0; puVar84 = local_2d20, puVar83 = local_2d28, puVar82 = local_2d30,
      local_2d40 < local_2be8; local_2d40 = local_2d40 + 1) {
    iVar137 = *(int *)(local_2be0 + (long)local_2d40 * 4);
    if (iVar137 != local_2d3c) {
      if (iVar137 == local_2d3c + 1) {
        local_2d20 = local_2d28;
        local_2d28 = local_2d30;
        local_2d30 = local_2d38;
        local_2d38 = puVar84;
        local_297c = iVar137 + 2;
        local_2978 = local_2bb8;
        lVar2 = *local_2bb8;
        iVar138 = *(int *)((long)local_2bb8 + 0x2c);
        lVar3 = local_2bb8[2];
        local_2d60 = local_2bc8;
        for (local_2d6c = 0; local_2d6c < local_2be4; local_2d6c = local_2d6c + 1) {
          local_2a60 = (undefined8 *)
                       (lVar2 + (long)iVar138 * (long)local_297c * lVar3 +
                       (long)(*(int *)(local_2bd0 + (long)local_2d6c * 4) << 3) * 4);
          local_2664 = *local_2d60;
          auVar10 = vinsertps_avx(ZEXT416(local_2664),ZEXT416(local_2664),0x10);
          auVar10 = vinsertps_avx(auVar10,ZEXT416(local_2664),0x20);
          auVar10 = vinsertps_avx(auVar10,ZEXT416(local_2664),0x30);
          auVar11 = vinsertps_avx(ZEXT416(local_2664),ZEXT416(local_2664),0x10);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(local_2664),0x20);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(local_2664),0x30);
          auVar89._16_16_ = auVar10;
          auVar89._0_16_ = auVar11;
          local_e40._0_8_ = auVar11._0_8_;
          local_e40._8_8_ = auVar11._8_8_;
          local_e40._16_8_ = auVar10._0_8_;
          local_e40._24_8_ = auVar10._8_8_;
          local_2668 = local_2d60[1];
          auVar12 = vinsertps_avx(ZEXT416(local_2668),ZEXT416(local_2668),0x10);
          auVar12 = vinsertps_avx(auVar12,ZEXT416(local_2668),0x20);
          auVar12 = vinsertps_avx(auVar12,ZEXT416(local_2668),0x30);
          auVar13 = vinsertps_avx(ZEXT416(local_2668),ZEXT416(local_2668),0x10);
          auVar13 = vinsertps_avx(auVar13,ZEXT416(local_2668),0x20);
          auVar13 = vinsertps_avx(auVar13,ZEXT416(local_2668),0x30);
          auVar90._16_16_ = auVar12;
          auVar90._0_16_ = auVar13;
          local_e00._0_8_ = auVar13._0_8_;
          local_e00._8_8_ = auVar13._8_8_;
          local_e00._16_8_ = auVar12._0_8_;
          local_e00._24_8_ = auVar12._8_8_;
          local_266c = local_2d60[2];
          auVar14 = vinsertps_avx(ZEXT416(local_266c),ZEXT416(local_266c),0x10);
          auVar14 = vinsertps_avx(auVar14,ZEXT416(local_266c),0x20);
          auVar14 = vinsertps_avx(auVar14,ZEXT416(local_266c),0x30);
          auVar15 = vinsertps_avx(ZEXT416(local_266c),ZEXT416(local_266c),0x10);
          auVar15 = vinsertps_avx(auVar15,ZEXT416(local_266c),0x20);
          auVar15 = vinsertps_avx(auVar15,ZEXT416(local_266c),0x30);
          auVar91._16_16_ = auVar14;
          auVar91._0_16_ = auVar15;
          local_dc0._0_8_ = auVar15._0_8_;
          local_dc0._8_8_ = auVar15._8_8_;
          local_dc0._16_8_ = auVar14._0_8_;
          local_dc0._24_8_ = auVar14._8_8_;
          local_2670 = local_2d60[3];
          auVar16 = vinsertps_avx(ZEXT416(local_2670),ZEXT416(local_2670),0x10);
          auVar16 = vinsertps_avx(auVar16,ZEXT416(local_2670),0x20);
          auVar16 = vinsertps_avx(auVar16,ZEXT416(local_2670),0x30);
          auVar17 = vinsertps_avx(ZEXT416(local_2670),ZEXT416(local_2670),0x10);
          auVar17 = vinsertps_avx(auVar17,ZEXT416(local_2670),0x20);
          auVar17 = vinsertps_avx(auVar17,ZEXT416(local_2670),0x30);
          auVar92._16_16_ = auVar16;
          auVar92._0_16_ = auVar17;
          local_d80._0_8_ = auVar17._0_8_;
          local_d80._8_8_ = auVar17._8_8_;
          local_d80._16_8_ = auVar16._0_8_;
          local_d80._24_8_ = auVar16._8_8_;
          local_2a58 = local_2a60 + -4;
          uVar18 = *local_2a58;
          uVar19 = local_2a60[-3];
          uVar20 = local_2a60[-2];
          uVar21 = local_2a60[-1];
          uVar22 = *local_2a60;
          uVar23 = local_2a60[1];
          uVar24 = local_2a60[2];
          uVar25 = local_2a60[3];
          local_2a68 = local_2a60 + 4;
          uVar26 = *local_2a68;
          uVar27 = local_2a60[5];
          uVar28 = local_2a60[6];
          uVar29 = local_2a60[7];
          local_2a70 = local_2a60 + 8;
          uVar30 = *local_2a70;
          uVar31 = local_2a60[9];
          uVar32 = local_2a60[10];
          uVar33 = local_2a60[0xb];
          local_23c0._0_4_ = (float)uVar18;
          local_23c0._4_4_ = (float)((ulong)uVar18 >> 0x20);
          uStack_23b8._0_4_ = (float)uVar19;
          uStack_23b8._4_4_ = (float)((ulong)uVar19 >> 0x20);
          uStack_23b0._0_4_ = (float)uVar20;
          uStack_23b0._4_4_ = (float)((ulong)uVar20 >> 0x20);
          uStack_23a8._0_4_ = (float)uVar21;
          uStack_23a8._4_4_ = (float)((ulong)uVar21 >> 0x20);
          local_23e0._0_4_ = auVar11._0_4_;
          local_23e0._4_4_ = auVar11._4_4_;
          uStack_23d8._0_4_ = auVar11._8_4_;
          uStack_23d8._4_4_ = auVar11._12_4_;
          uStack_23d0._0_4_ = auVar10._0_4_;
          uStack_23d0._4_4_ = auVar10._4_4_;
          uStack_23c8._0_4_ = auVar10._8_4_;
          local_2ea0 = CONCAT44(local_23c0._4_4_ * local_23e0._4_4_,
                                (float)local_23c0 * (float)local_23e0);
          uStack_2e98 = CONCAT44(uStack_23b8._4_4_ * uStack_23d8._4_4_,
                                 (float)uStack_23b8 * (float)uStack_23d8);
          uStack_2e90 = CONCAT44(uStack_23b0._4_4_ * uStack_23d0._4_4_,
                                 (float)uStack_23b0 * (float)uStack_23d0);
          uStack_2e88 = CONCAT44(uStack_23a8._4_4_,(float)uStack_23a8 * (float)uStack_23c8);
          local_f80 = local_e00._0_8_;
          uStack_f78 = local_e00._8_8_;
          uStack_f70 = local_e00._16_8_;
          uStack_f68 = local_e00._24_8_;
          local_fa0 = local_2ea0;
          uStack_f98 = uStack_2e98;
          uStack_f90 = uStack_2e90;
          uStack_f88 = uStack_2e88;
          local_f60._0_4_ = (float)uVar22;
          local_f20 = (float)local_f60;
          local_f60._4_4_ = (float)((ulong)uVar22 >> 0x20);
          fStack_f1c = local_f60._4_4_;
          uStack_f58._0_4_ = (float)uVar23;
          fStack_f18 = (float)uStack_f58;
          uStack_f58._4_4_ = (float)((ulong)uVar23 >> 0x20);
          fStack_f14 = uStack_f58._4_4_;
          uStack_f50._0_4_ = (float)uVar24;
          fStack_f10 = (float)uStack_f50;
          uStack_f50._4_4_ = (float)((ulong)uVar24 >> 0x20);
          fStack_f0c = uStack_f50._4_4_;
          uStack_f48._0_4_ = (float)uVar25;
          fStack_f08 = (float)uStack_f48;
          uStack_f48._4_4_ = (float)((ulong)uVar25 >> 0x20);
          fStack_f04 = uStack_f48._4_4_;
          local_f40._0_4_ = auVar13._0_4_;
          local_f40._4_4_ = auVar13._4_4_;
          uStack_f38._0_4_ = auVar13._8_4_;
          uStack_f38._4_4_ = auVar13._12_4_;
          uStack_f30._0_4_ = auVar12._0_4_;
          uStack_f30._4_4_ = auVar12._4_4_;
          uStack_f28._0_4_ = auVar12._8_4_;
          local_920 = (float)local_f60 * (float)local_f40;
          fStack_91c = local_f60._4_4_ * local_f40._4_4_;
          fStack_918 = (float)uStack_f58 * (float)uStack_f38;
          fStack_914 = uStack_f58._4_4_ * uStack_f38._4_4_;
          fStack_910 = (float)uStack_f50 * (float)uStack_f30;
          fStack_90c = uStack_f50._4_4_ * uStack_f30._4_4_;
          fStack_908 = (float)uStack_f48 * (float)uStack_f28;
          local_940 = local_2ea0;
          uStack_938 = uStack_2e98;
          uStack_930 = uStack_2e90;
          uStack_928 = uStack_2e88;
          fVar88 = local_920 + (float)local_23c0 * (float)local_23e0;
          fVar109 = fStack_91c + local_23c0._4_4_ * local_23e0._4_4_;
          fVar110 = fStack_918 + (float)uStack_23b8 * (float)uStack_23d8;
          fVar112 = fStack_914 + uStack_23b8._4_4_ * uStack_23d8._4_4_;
          fVar116 = fStack_910 + (float)uStack_23b0 * (float)uStack_23d0;
          fVar125 = fStack_90c + uStack_23b0._4_4_ * uStack_23d0._4_4_;
          fVar135 = fStack_908 + (float)uStack_23a8 * (float)uStack_23c8;
          local_1040 = CONCAT44(fVar109,fVar88);
          uStack_1038 = CONCAT44(fVar112,fVar110);
          uStack_1030 = CONCAT44(fVar125,fVar116);
          uStack_1028 = CONCAT44(uStack_f48._4_4_ + uStack_23a8._4_4_,fVar135);
          local_1020 = local_dc0._0_8_;
          uStack_1018 = local_dc0._8_8_;
          uStack_1010 = local_dc0._16_8_;
          uStack_1008 = local_dc0._24_8_;
          local_1000._0_4_ = (float)uVar26;
          local_fc0 = (float)local_1000;
          local_1000._4_4_ = (float)((ulong)uVar26 >> 0x20);
          fStack_fbc = local_1000._4_4_;
          uStack_ff8._0_4_ = (float)uVar27;
          fStack_fb8 = (float)uStack_ff8;
          uStack_ff8._4_4_ = (float)((ulong)uVar27 >> 0x20);
          fStack_fb4 = uStack_ff8._4_4_;
          uStack_ff0._0_4_ = (float)uVar28;
          fStack_fb0 = (float)uStack_ff0;
          uStack_ff0._4_4_ = (float)((ulong)uVar28 >> 0x20);
          fStack_fac = uStack_ff0._4_4_;
          uStack_fe8._0_4_ = (float)uVar29;
          fStack_fa8 = (float)uStack_fe8;
          uStack_fe8._4_4_ = (float)((ulong)uVar29 >> 0x20);
          fStack_fa4 = uStack_fe8._4_4_;
          local_fe0._0_4_ = auVar15._0_4_;
          local_fe0._4_4_ = auVar15._4_4_;
          uStack_fd8._0_4_ = auVar15._8_4_;
          uStack_fd8._4_4_ = auVar15._12_4_;
          uStack_fd0._0_4_ = auVar14._0_4_;
          uStack_fd0._4_4_ = auVar14._4_4_;
          uStack_fc8._0_4_ = auVar14._8_4_;
          local_8e0 = (float)local_1000 * (float)local_fe0;
          fStack_8dc = local_1000._4_4_ * local_fe0._4_4_;
          fStack_8d8 = (float)uStack_ff8 * (float)uStack_fd8;
          fStack_8d4 = uStack_ff8._4_4_ * uStack_fd8._4_4_;
          fStack_8d0 = (float)uStack_ff0 * (float)uStack_fd0;
          fStack_8cc = uStack_ff0._4_4_ * uStack_fd0._4_4_;
          fStack_8c8 = (float)uStack_fe8 * (float)uStack_fc8;
          fVar88 = local_8e0 + fVar88;
          fVar109 = fStack_8dc + fVar109;
          fVar110 = fStack_8d8 + fVar110;
          fVar112 = fStack_8d4 + fVar112;
          fVar116 = fStack_8d0 + fVar116;
          fVar125 = fStack_8cc + fVar125;
          fVar135 = fStack_8c8 + fVar135;
          uStack_fe8._4_4_ = uStack_fe8._4_4_ + uStack_f48._4_4_ + uStack_23a8._4_4_;
          local_10e0 = CONCAT44(fVar109,fVar88);
          uStack_10d8 = CONCAT44(fVar112,fVar110);
          uStack_10d0 = CONCAT44(fVar125,fVar116);
          uStack_10c8 = CONCAT44(uStack_fe8._4_4_,fVar135);
          local_10c0 = local_d80._0_8_;
          uStack_10b8 = local_d80._8_8_;
          uStack_10b0 = local_d80._16_8_;
          uStack_10a8 = local_d80._24_8_;
          local_10a0._0_4_ = (float)uVar30;
          local_1060 = (float)local_10a0;
          local_10a0._4_4_ = (float)((ulong)uVar30 >> 0x20);
          fStack_105c = local_10a0._4_4_;
          uStack_1098._0_4_ = (float)uVar31;
          fStack_1058 = (float)uStack_1098;
          uStack_1098._4_4_ = (float)((ulong)uVar31 >> 0x20);
          fStack_1054 = uStack_1098._4_4_;
          uStack_1090._0_4_ = (float)uVar32;
          fStack_1050 = (float)uStack_1090;
          uStack_1090._4_4_ = (float)((ulong)uVar32 >> 0x20);
          fStack_104c = uStack_1090._4_4_;
          uStack_1088._0_4_ = (float)uVar33;
          fStack_1048 = (float)uStack_1088;
          uStack_1088._4_4_ = (float)((ulong)uVar33 >> 0x20);
          fStack_1044 = uStack_1088._4_4_;
          local_1080._0_4_ = auVar17._0_4_;
          local_1080._4_4_ = auVar17._4_4_;
          uStack_1078._0_4_ = auVar17._8_4_;
          uStack_1078._4_4_ = auVar17._12_4_;
          uStack_1070._0_4_ = auVar16._0_4_;
          uStack_1070._4_4_ = auVar16._4_4_;
          uStack_1068._0_4_ = auVar16._8_4_;
          local_8a0 = (float)local_10a0 * (float)local_1080;
          fStack_89c = local_10a0._4_4_ * local_1080._4_4_;
          fStack_898 = (float)uStack_1098 * (float)uStack_1078;
          fStack_894 = uStack_1098._4_4_ * uStack_1078._4_4_;
          fStack_890 = (float)uStack_1090 * (float)uStack_1070;
          fStack_88c = uStack_1090._4_4_ * uStack_1070._4_4_;
          fStack_888 = (float)uStack_1088 * (float)uStack_1068;
          local_26e0 = CONCAT44(fStack_89c + fVar109,local_8a0 + fVar88);
          uStack_26d8 = CONCAT44(fStack_894 + fVar112,fStack_898 + fVar110);
          uStack_26d0 = CONCAT44(fStack_88c + fVar125,fStack_890 + fVar116);
          uStack_26c8 = CONCAT44(uStack_1088._4_4_ + uStack_fe8._4_4_,fStack_888 + fVar135);
          local_26b8 = (undefined8 *)((long)puVar84 + (long)(local_2d6c << 3) * 4);
          *local_26b8 = local_26e0;
          local_26b8[1] = uStack_26d8;
          local_26b8[2] = uStack_26d0;
          local_26b8[3] = uStack_26c8;
          local_2d60 = local_2d60 + 4;
          local_23e0 = local_e40._0_8_;
          uStack_23d8 = local_e40._8_8_;
          uStack_23d0 = local_e40._16_8_;
          uStack_23c8 = local_e40._24_8_;
          local_23c0 = uVar18;
          uStack_23b8 = uVar19;
          uStack_23b0 = uVar20;
          uStack_23a8 = uVar21;
          local_10a0 = uVar30;
          uStack_1098 = uVar31;
          uStack_1090 = uVar32;
          uStack_1088 = uVar33;
          local_1080 = local_d80._0_8_;
          uStack_1078 = local_d80._8_8_;
          uStack_1070 = local_d80._16_8_;
          uStack_1068 = local_d80._24_8_;
          local_1000 = uVar26;
          uStack_ff8 = uVar27;
          uStack_ff0 = uVar28;
          uStack_fe8 = uVar29;
          local_fe0 = local_dc0._0_8_;
          uStack_fd8 = local_dc0._8_8_;
          uStack_fd0 = local_dc0._16_8_;
          uStack_fc8 = local_dc0._24_8_;
          local_f60 = uVar22;
          uStack_f58 = uVar23;
          uStack_f50 = uVar24;
          uStack_f48 = uVar25;
          local_f40 = local_e00._0_8_;
          uStack_f38 = local_e00._8_8_;
          uStack_f30 = local_e00._16_8_;
          uStack_f28 = local_e00._24_8_;
          local_e40 = auVar89;
          local_e20 = local_2664;
          local_e1c = local_2664;
          local_e18 = local_2664;
          local_e14 = local_2664;
          local_e10 = local_2664;
          local_e0c = local_2664;
          local_e08 = local_2664;
          local_e04 = local_2664;
          local_e00 = auVar90;
          local_de0 = local_2668;
          local_ddc = local_2668;
          local_dd8 = local_2668;
          local_dd4 = local_2668;
          local_dd0 = local_2668;
          local_dcc = local_2668;
          local_dc8 = local_2668;
          local_dc4 = local_2668;
          local_dc0 = auVar91;
          local_da0 = local_266c;
          local_d9c = local_266c;
          local_d98 = local_266c;
          local_d94 = local_266c;
          local_d90 = local_266c;
          local_d8c = local_266c;
          local_d88 = local_266c;
          local_d84 = local_266c;
          local_d80 = auVar92;
          local_d60 = local_2670;
          local_d5c = local_2670;
          local_d58 = local_2670;
          local_d54 = local_2670;
          local_d50 = local_2670;
          local_d4c = local_2670;
          local_d48 = local_2670;
          local_d44 = local_2670;
          fStack_904 = fStack_f04;
          local_900 = local_1040;
          uStack_8f8 = uStack_1038;
          uStack_8f0 = uStack_1030;
          uStack_8e8 = uStack_1028;
          fStack_8c4 = fStack_fa4;
          local_8c0 = local_10e0;
          uStack_8b8 = uStack_10d8;
          uStack_8b0 = uStack_10d0;
          uStack_8a8 = uStack_10c8;
          fStack_884 = fStack_1044;
        }
      }
      else if (iVar137 == local_2d3c + 2) {
        local_2d20 = local_2d30;
        local_2d28 = local_2d38;
        local_2d30 = puVar84;
        local_2d38 = puVar83;
        local_298c = iVar137 + 1;
        local_2988 = local_2bb8;
        lVar2 = *local_2bb8;
        iVar138 = *(int *)((long)local_2bb8 + 0x2c);
        lVar3 = local_2bb8[2];
        local_299c = iVar137 + 2;
        local_2998 = local_2bb8;
        lVar4 = *local_2bb8;
        iVar1 = *(int *)((long)local_2bb8 + 0x2c);
        lVar5 = local_2bb8[2];
        local_2ec8 = local_2bc8;
        for (local_2edc = 0; local_2edc < local_2be4; local_2edc = local_2edc + 1) {
          iVar85 = *(int *)(local_2bd0 + (long)local_2edc * 4) << 3;
          local_2a80 = (undefined8 *)
                       (lVar2 + (long)iVar138 * (long)local_298c * lVar3 + (long)iVar85 * 4);
          local_2aa0 = (undefined8 *)
                       (lVar4 + (long)iVar1 * (long)local_299c * lVar5 + (long)iVar85 * 4);
          local_2674 = *local_2ec8;
          auVar10 = vinsertps_avx(ZEXT416(local_2674),ZEXT416(local_2674),0x10);
          auVar10 = vinsertps_avx(auVar10,ZEXT416(local_2674),0x20);
          auVar10 = vinsertps_avx(auVar10,ZEXT416(local_2674),0x30);
          auVar11 = vinsertps_avx(ZEXT416(local_2674),ZEXT416(local_2674),0x10);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(local_2674),0x20);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(local_2674),0x30);
          auVar93._16_16_ = auVar10;
          auVar93._0_16_ = auVar11;
          local_d40._0_8_ = auVar11._0_8_;
          local_d40._8_8_ = auVar11._8_8_;
          local_d40._16_8_ = auVar10._0_8_;
          local_d40._24_8_ = auVar10._8_8_;
          local_2678 = local_2ec8[1];
          auVar12 = vinsertps_avx(ZEXT416(local_2678),ZEXT416(local_2678),0x10);
          auVar12 = vinsertps_avx(auVar12,ZEXT416(local_2678),0x20);
          auVar12 = vinsertps_avx(auVar12,ZEXT416(local_2678),0x30);
          auVar13 = vinsertps_avx(ZEXT416(local_2678),ZEXT416(local_2678),0x10);
          auVar13 = vinsertps_avx(auVar13,ZEXT416(local_2678),0x20);
          auVar13 = vinsertps_avx(auVar13,ZEXT416(local_2678),0x30);
          auVar94._16_16_ = auVar12;
          auVar94._0_16_ = auVar13;
          local_d00._0_8_ = auVar13._0_8_;
          local_d00._8_8_ = auVar13._8_8_;
          local_d00._16_8_ = auVar12._0_8_;
          local_d00._24_8_ = auVar12._8_8_;
          local_267c = local_2ec8[2];
          auVar14 = vinsertps_avx(ZEXT416(local_267c),ZEXT416(local_267c),0x10);
          auVar14 = vinsertps_avx(auVar14,ZEXT416(local_267c),0x20);
          auVar14 = vinsertps_avx(auVar14,ZEXT416(local_267c),0x30);
          auVar15 = vinsertps_avx(ZEXT416(local_267c),ZEXT416(local_267c),0x10);
          auVar15 = vinsertps_avx(auVar15,ZEXT416(local_267c),0x20);
          auVar15 = vinsertps_avx(auVar15,ZEXT416(local_267c),0x30);
          auVar95._16_16_ = auVar14;
          auVar95._0_16_ = auVar15;
          local_cc0._0_8_ = auVar15._0_8_;
          local_cc0._8_8_ = auVar15._8_8_;
          local_cc0._16_8_ = auVar14._0_8_;
          local_cc0._24_8_ = auVar14._8_8_;
          local_2680 = local_2ec8[3];
          auVar16 = vinsertps_avx(ZEXT416(local_2680),ZEXT416(local_2680),0x10);
          auVar16 = vinsertps_avx(auVar16,ZEXT416(local_2680),0x20);
          auVar16 = vinsertps_avx(auVar16,ZEXT416(local_2680),0x30);
          auVar17 = vinsertps_avx(ZEXT416(local_2680),ZEXT416(local_2680),0x10);
          auVar17 = vinsertps_avx(auVar17,ZEXT416(local_2680),0x20);
          auVar17 = vinsertps_avx(auVar17,ZEXT416(local_2680),0x30);
          auVar96._16_16_ = auVar16;
          auVar96._0_16_ = auVar17;
          local_c80._0_8_ = auVar17._0_8_;
          local_c80._8_8_ = auVar17._8_8_;
          local_c80._16_8_ = auVar16._0_8_;
          local_c80._24_8_ = auVar16._8_8_;
          local_2a78 = local_2a80 + -4;
          uVar18 = *local_2a78;
          uVar19 = local_2a80[-3];
          uVar20 = local_2a80[-2];
          uVar21 = local_2a80[-1];
          uVar22 = *local_2a80;
          uVar23 = local_2a80[1];
          uVar24 = local_2a80[2];
          uVar25 = local_2a80[3];
          local_2a88 = local_2a80 + 4;
          uVar26 = *local_2a88;
          uVar27 = local_2a80[5];
          uVar28 = local_2a80[6];
          uVar29 = local_2a80[7];
          local_2a90 = local_2a80 + 8;
          uVar30 = *local_2a90;
          uVar31 = local_2a80[9];
          uVar32 = local_2a80[10];
          uVar33 = local_2a80[0xb];
          local_2a98 = local_2aa0 + -4;
          uVar34 = *local_2a98;
          uVar35 = local_2aa0[-3];
          uVar36 = local_2aa0[-2];
          uVar37 = local_2aa0[-1];
          uVar38 = *local_2aa0;
          uVar39 = local_2aa0[1];
          uVar40 = local_2aa0[2];
          uVar41 = local_2aa0[3];
          local_2aa8 = local_2aa0 + 4;
          uVar42 = *local_2aa8;
          uVar43 = local_2aa0[5];
          uVar44 = local_2aa0[6];
          uVar45 = local_2aa0[7];
          local_2ab0 = local_2aa0 + 8;
          uVar46 = *local_2ab0;
          uVar47 = local_2aa0[9];
          uVar48 = local_2aa0[10];
          uVar49 = local_2aa0[0xb];
          local_2400._0_4_ = (float)uVar18;
          local_2400._4_4_ = (float)((ulong)uVar18 >> 0x20);
          uStack_23f8._0_4_ = (float)uVar19;
          uStack_23f8._4_4_ = (float)((ulong)uVar19 >> 0x20);
          uStack_23f0._0_4_ = (float)uVar20;
          uStack_23f0._4_4_ = (float)((ulong)uVar20 >> 0x20);
          uStack_23e8._0_4_ = (float)uVar21;
          uStack_23e8._4_4_ = (float)((ulong)uVar21 >> 0x20);
          local_2420._0_4_ = auVar11._0_4_;
          local_2420._4_4_ = auVar11._4_4_;
          uStack_2418._0_4_ = auVar11._8_4_;
          uStack_2418._4_4_ = auVar11._12_4_;
          uStack_2410._0_4_ = auVar10._0_4_;
          uStack_2410._4_4_ = auVar10._4_4_;
          uStack_2408._0_4_ = auVar10._8_4_;
          local_30a0 = CONCAT44(local_2400._4_4_ * local_2420._4_4_,
                                (float)local_2400 * (float)local_2420);
          uStack_3098 = CONCAT44(uStack_23f8._4_4_ * uStack_2418._4_4_,
                                 (float)uStack_23f8 * (float)uStack_2418);
          uStack_3090 = CONCAT44(uStack_23f0._4_4_ * uStack_2410._4_4_,
                                 (float)uStack_23f0 * (float)uStack_2410);
          uStack_3088 = CONCAT44(uStack_23e8._4_4_,(float)uStack_23e8 * (float)uStack_2408);
          local_2460 = local_d40._0_8_;
          uStack_2458 = local_d40._8_8_;
          uStack_2450 = local_d40._16_8_;
          uStack_2448 = local_d40._24_8_;
          local_2440._0_4_ = (float)uVar34;
          local_2440._4_4_ = (float)((ulong)uVar34 >> 0x20);
          uStack_2438._0_4_ = (float)uVar35;
          uStack_2438._4_4_ = (float)((ulong)uVar35 >> 0x20);
          uStack_2430._0_4_ = (float)uVar36;
          uStack_2430._4_4_ = (float)((ulong)uVar36 >> 0x20);
          uStack_2428._0_4_ = (float)uVar37;
          uStack_2428._4_4_ = (float)((ulong)uVar37 >> 0x20);
          local_30c0 = CONCAT44(local_2440._4_4_ * local_2420._4_4_,
                                (float)local_2440 * (float)local_2420);
          uStack_30b8 = CONCAT44(uStack_2438._4_4_ * uStack_2418._4_4_,
                                 (float)uStack_2438 * (float)uStack_2418);
          uStack_30b0 = CONCAT44(uStack_2430._4_4_ * uStack_2410._4_4_,
                                 (float)uStack_2430 * (float)uStack_2410);
          uStack_30a8 = CONCAT44(uStack_2428._4_4_,(float)uStack_2428 * (float)uStack_2408);
          local_1160 = local_d00._0_8_;
          uStack_1158 = local_d00._8_8_;
          uStack_1150 = local_d00._16_8_;
          uStack_1148 = local_d00._24_8_;
          local_1180 = local_30a0;
          uStack_1178 = uStack_3098;
          uStack_1170 = uStack_3090;
          uStack_1168 = uStack_3088;
          local_1140._0_4_ = (float)uVar22;
          local_1100 = (float)local_1140;
          local_1140._4_4_ = (float)((ulong)uVar22 >> 0x20);
          fStack_10fc = local_1140._4_4_;
          uStack_1138._0_4_ = (float)uVar23;
          fStack_10f8 = (float)uStack_1138;
          uStack_1138._4_4_ = (float)((ulong)uVar23 >> 0x20);
          fStack_10f4 = uStack_1138._4_4_;
          uStack_1130._0_4_ = (float)uVar24;
          fStack_10f0 = (float)uStack_1130;
          uStack_1130._4_4_ = (float)((ulong)uVar24 >> 0x20);
          fStack_10ec = uStack_1130._4_4_;
          uStack_1128._0_4_ = (float)uVar25;
          fStack_10e8 = (float)uStack_1128;
          uStack_1128._4_4_ = (float)((ulong)uVar25 >> 0x20);
          fStack_10e4 = uStack_1128._4_4_;
          local_1120._0_4_ = auVar13._0_4_;
          local_1120._4_4_ = auVar13._4_4_;
          uStack_1118._0_4_ = auVar13._8_4_;
          uStack_1118._4_4_ = auVar13._12_4_;
          uStack_1110._0_4_ = auVar12._0_4_;
          uStack_1110._4_4_ = auVar12._4_4_;
          uStack_1108._0_4_ = auVar12._8_4_;
          local_860 = (float)local_1140 * (float)local_1120;
          fStack_85c = local_1140._4_4_ * local_1120._4_4_;
          fStack_858 = (float)uStack_1138 * (float)uStack_1118;
          fStack_854 = uStack_1138._4_4_ * uStack_1118._4_4_;
          fStack_850 = (float)uStack_1130 * (float)uStack_1110;
          fStack_84c = uStack_1130._4_4_ * uStack_1110._4_4_;
          fStack_848 = (float)uStack_1128 * (float)uStack_1108;
          local_880 = local_30a0;
          uStack_878 = uStack_3098;
          uStack_870 = uStack_3090;
          uStack_868 = uStack_3088;
          fVar88 = local_860 + (float)local_2400 * (float)local_2420;
          fVar110 = fStack_85c + local_2400._4_4_ * local_2420._4_4_;
          fVar116 = fStack_858 + (float)uStack_23f8 * (float)uStack_2418;
          fVar135 = fStack_854 + uStack_23f8._4_4_ * uStack_2418._4_4_;
          fVar113 = fStack_850 + (float)uStack_23f0 * (float)uStack_2410;
          fVar117 = fStack_84c + uStack_23f0._4_4_ * uStack_2410._4_4_;
          fVar126 = fStack_848 + (float)uStack_23e8 * (float)uStack_2408;
          local_12c0 = CONCAT44(fVar110,fVar88);
          uStack_12b8 = CONCAT44(fVar135,fVar116);
          uStack_12b0 = CONCAT44(fVar117,fVar113);
          uStack_12a8 = CONCAT44(uStack_1128._4_4_ + uStack_23e8._4_4_,fVar126);
          local_1200 = local_d00._0_8_;
          uStack_11f8 = local_d00._8_8_;
          uStack_11f0 = local_d00._16_8_;
          uStack_11e8 = local_d00._24_8_;
          local_1220 = local_30c0;
          uStack_1218 = uStack_30b8;
          uStack_1210 = uStack_30b0;
          uStack_1208 = uStack_30a8;
          local_11e0._0_4_ = (float)uVar38;
          local_11a0 = (float)local_11e0;
          local_11e0._4_4_ = (float)((ulong)uVar38 >> 0x20);
          fStack_119c = local_11e0._4_4_;
          uStack_11d8._0_4_ = (float)uVar39;
          fStack_1198 = (float)uStack_11d8;
          uStack_11d8._4_4_ = (float)((ulong)uVar39 >> 0x20);
          fStack_1194 = uStack_11d8._4_4_;
          uStack_11d0._0_4_ = (float)uVar40;
          fStack_1190 = (float)uStack_11d0;
          uStack_11d0._4_4_ = (float)((ulong)uVar40 >> 0x20);
          fStack_118c = uStack_11d0._4_4_;
          uStack_11c8._0_4_ = (float)uVar41;
          fStack_1188 = (float)uStack_11c8;
          uStack_11c8._4_4_ = (float)((ulong)uVar41 >> 0x20);
          fStack_1184 = uStack_11c8._4_4_;
          local_11c0 = local_d00._0_8_;
          uStack_11b8 = local_d00._8_8_;
          uStack_11b0 = local_d00._16_8_;
          uStack_11a8 = local_d00._24_8_;
          local_820 = (float)local_11e0 * (float)local_1120;
          fStack_81c = local_11e0._4_4_ * local_1120._4_4_;
          fStack_818 = (float)uStack_11d8 * (float)uStack_1118;
          fStack_814 = uStack_11d8._4_4_ * uStack_1118._4_4_;
          fStack_810 = (float)uStack_11d0 * (float)uStack_1110;
          fStack_80c = uStack_11d0._4_4_ * uStack_1110._4_4_;
          fStack_808 = (float)uStack_11c8 * (float)uStack_1108;
          local_840 = local_30c0;
          uStack_838 = uStack_30b8;
          uStack_830 = uStack_30b0;
          uStack_828 = uStack_30a8;
          fVar109 = local_820 + (float)local_2440 * (float)local_2420;
          fVar112 = fStack_81c + local_2440._4_4_ * local_2420._4_4_;
          fVar125 = fStack_818 + (float)uStack_2438 * (float)uStack_2418;
          fVar111 = fStack_814 + uStack_2438._4_4_ * uStack_2418._4_4_;
          fVar114 = fStack_810 + (float)uStack_2430 * (float)uStack_2410;
          fVar118 = fStack_80c + uStack_2430._4_4_ * uStack_2410._4_4_;
          fVar127 = fStack_808 + (float)uStack_2428 * (float)uStack_2408;
          local_1360 = CONCAT44(fVar112,fVar109);
          uStack_1358 = CONCAT44(fVar111,fVar125);
          uStack_1350 = CONCAT44(fVar118,fVar114);
          uStack_1348 = CONCAT44(uStack_11c8._4_4_ + uStack_2428._4_4_,fVar127);
          local_12a0 = local_cc0._0_8_;
          uStack_1298 = local_cc0._8_8_;
          uStack_1290 = local_cc0._16_8_;
          uStack_1288 = local_cc0._24_8_;
          local_1280._0_4_ = (float)uVar26;
          local_1240 = (float)local_1280;
          local_1280._4_4_ = (float)((ulong)uVar26 >> 0x20);
          fStack_123c = local_1280._4_4_;
          uStack_1278._0_4_ = (float)uVar27;
          fStack_1238 = (float)uStack_1278;
          uStack_1278._4_4_ = (float)((ulong)uVar27 >> 0x20);
          fStack_1234 = uStack_1278._4_4_;
          uStack_1270._0_4_ = (float)uVar28;
          fStack_1230 = (float)uStack_1270;
          uStack_1270._4_4_ = (float)((ulong)uVar28 >> 0x20);
          fStack_122c = uStack_1270._4_4_;
          uStack_1268._0_4_ = (float)uVar29;
          fStack_1228 = (float)uStack_1268;
          uStack_1268._4_4_ = (float)((ulong)uVar29 >> 0x20);
          fStack_1224 = uStack_1268._4_4_;
          local_1260._0_4_ = auVar15._0_4_;
          local_1260._4_4_ = auVar15._4_4_;
          uStack_1258._0_4_ = auVar15._8_4_;
          uStack_1258._4_4_ = auVar15._12_4_;
          uStack_1250._0_4_ = auVar14._0_4_;
          uStack_1250._4_4_ = auVar14._4_4_;
          uStack_1248._0_4_ = auVar14._8_4_;
          local_7e0 = (float)local_1280 * (float)local_1260;
          fStack_7dc = local_1280._4_4_ * local_1260._4_4_;
          fStack_7d8 = (float)uStack_1278 * (float)uStack_1258;
          fStack_7d4 = uStack_1278._4_4_ * uStack_1258._4_4_;
          fStack_7d0 = (float)uStack_1270 * (float)uStack_1250;
          fStack_7cc = uStack_1270._4_4_ * uStack_1250._4_4_;
          fStack_7c8 = (float)uStack_1268 * (float)uStack_1248;
          fVar88 = local_7e0 + fVar88;
          fVar110 = fStack_7dc + fVar110;
          fVar116 = fStack_7d8 + fVar116;
          fVar135 = fStack_7d4 + fVar135;
          fVar113 = fStack_7d0 + fVar113;
          fVar117 = fStack_7cc + fVar117;
          fVar126 = fStack_7c8 + fVar126;
          uStack_1268._4_4_ = uStack_1268._4_4_ + uStack_1128._4_4_ + uStack_23e8._4_4_;
          local_1400 = CONCAT44(fVar110,fVar88);
          uStack_13f8 = CONCAT44(fVar135,fVar116);
          uStack_13f0 = CONCAT44(fVar117,fVar113);
          uStack_13e8 = CONCAT44(uStack_1268._4_4_,fVar126);
          local_1340 = local_cc0._0_8_;
          uStack_1338 = local_cc0._8_8_;
          uStack_1330 = local_cc0._16_8_;
          uStack_1328 = local_cc0._24_8_;
          local_1320._0_4_ = (float)uVar42;
          local_12e0 = (float)local_1320;
          local_1320._4_4_ = (float)((ulong)uVar42 >> 0x20);
          fStack_12dc = local_1320._4_4_;
          uStack_1318._0_4_ = (float)uVar43;
          fStack_12d8 = (float)uStack_1318;
          uStack_1318._4_4_ = (float)((ulong)uVar43 >> 0x20);
          fStack_12d4 = uStack_1318._4_4_;
          uStack_1310._0_4_ = (float)uVar44;
          fStack_12d0 = (float)uStack_1310;
          uStack_1310._4_4_ = (float)((ulong)uVar44 >> 0x20);
          fStack_12cc = uStack_1310._4_4_;
          uStack_1308._0_4_ = (float)uVar45;
          fStack_12c8 = (float)uStack_1308;
          uStack_1308._4_4_ = (float)((ulong)uVar45 >> 0x20);
          fStack_12c4 = uStack_1308._4_4_;
          local_1300 = local_cc0._0_8_;
          uStack_12f8 = local_cc0._8_8_;
          uStack_12f0 = local_cc0._16_8_;
          uStack_12e8 = local_cc0._24_8_;
          local_7a0 = (float)local_1320 * (float)local_1260;
          fStack_79c = local_1320._4_4_ * local_1260._4_4_;
          fStack_798 = (float)uStack_1318 * (float)uStack_1258;
          fStack_794 = uStack_1318._4_4_ * uStack_1258._4_4_;
          fStack_790 = (float)uStack_1310 * (float)uStack_1250;
          fStack_78c = uStack_1310._4_4_ * uStack_1250._4_4_;
          fStack_788 = (float)uStack_1308 * (float)uStack_1248;
          fVar109 = local_7a0 + fVar109;
          fVar112 = fStack_79c + fVar112;
          fVar125 = fStack_798 + fVar125;
          fVar111 = fStack_794 + fVar111;
          fVar114 = fStack_790 + fVar114;
          fVar118 = fStack_78c + fVar118;
          fVar127 = fStack_788 + fVar127;
          uStack_1308._4_4_ = uStack_1308._4_4_ + uStack_11c8._4_4_ + uStack_2428._4_4_;
          local_14a0 = CONCAT44(fVar112,fVar109);
          uStack_1498 = CONCAT44(fVar111,fVar125);
          uStack_1490 = CONCAT44(fVar118,fVar114);
          uStack_1488 = CONCAT44(uStack_1308._4_4_,fVar127);
          local_13e0 = local_c80._0_8_;
          uStack_13d8 = local_c80._8_8_;
          uStack_13d0 = local_c80._16_8_;
          uStack_13c8 = local_c80._24_8_;
          local_13c0._0_4_ = (float)uVar30;
          local_1380 = (float)local_13c0;
          local_13c0._4_4_ = (float)((ulong)uVar30 >> 0x20);
          fStack_137c = local_13c0._4_4_;
          uStack_13b8._0_4_ = (float)uVar31;
          fStack_1378 = (float)uStack_13b8;
          uStack_13b8._4_4_ = (float)((ulong)uVar31 >> 0x20);
          fStack_1374 = uStack_13b8._4_4_;
          uStack_13b0._0_4_ = (float)uVar32;
          fStack_1370 = (float)uStack_13b0;
          uStack_13b0._4_4_ = (float)((ulong)uVar32 >> 0x20);
          fStack_136c = uStack_13b0._4_4_;
          uStack_13a8._0_4_ = (float)uVar33;
          fStack_1368 = (float)uStack_13a8;
          uStack_13a8._4_4_ = (float)((ulong)uVar33 >> 0x20);
          fStack_1364 = uStack_13a8._4_4_;
          local_13a0._0_4_ = auVar17._0_4_;
          local_13a0._4_4_ = auVar17._4_4_;
          uStack_1398._0_4_ = auVar17._8_4_;
          uStack_1398._4_4_ = auVar17._12_4_;
          uStack_1390._0_4_ = auVar16._0_4_;
          uStack_1390._4_4_ = auVar16._4_4_;
          uStack_1388._0_4_ = auVar16._8_4_;
          local_760 = (float)local_13c0 * (float)local_13a0;
          fStack_75c = local_13c0._4_4_ * local_13a0._4_4_;
          fStack_758 = (float)uStack_13b8 * (float)uStack_1398;
          fStack_754 = uStack_13b8._4_4_ * uStack_1398._4_4_;
          fStack_750 = (float)uStack_13b0 * (float)uStack_1390;
          fStack_74c = uStack_13b0._4_4_ * uStack_1390._4_4_;
          fStack_748 = (float)uStack_13a8 * (float)uStack_1388;
          local_2720 = CONCAT44(fStack_75c + fVar110,local_760 + fVar88);
          uStack_2718 = CONCAT44(fStack_754 + fVar135,fStack_758 + fVar116);
          uStack_2710 = CONCAT44(fStack_74c + fVar117,fStack_750 + fVar113);
          uStack_2708 = CONCAT44(uStack_13a8._4_4_ + uStack_1268._4_4_,fStack_748 + fVar126);
          local_1480 = local_c80._0_8_;
          uStack_1478 = local_c80._8_8_;
          uStack_1470 = local_c80._16_8_;
          uStack_1468 = local_c80._24_8_;
          local_1460._0_4_ = (float)uVar46;
          local_1420 = (float)local_1460;
          local_1460._4_4_ = (float)((ulong)uVar46 >> 0x20);
          fStack_141c = local_1460._4_4_;
          uStack_1458._0_4_ = (float)uVar47;
          fStack_1418 = (float)uStack_1458;
          uStack_1458._4_4_ = (float)((ulong)uVar47 >> 0x20);
          fStack_1414 = uStack_1458._4_4_;
          uStack_1450._0_4_ = (float)uVar48;
          fStack_1410 = (float)uStack_1450;
          uStack_1450._4_4_ = (float)((ulong)uVar48 >> 0x20);
          fStack_140c = uStack_1450._4_4_;
          uStack_1448._0_4_ = (float)uVar49;
          fStack_1408 = (float)uStack_1448;
          uStack_1448._4_4_ = (float)((ulong)uVar49 >> 0x20);
          fStack_1404 = uStack_1448._4_4_;
          local_1440 = local_c80._0_8_;
          uStack_1438 = local_c80._8_8_;
          uStack_1430 = local_c80._16_8_;
          uStack_1428 = local_c80._24_8_;
          local_720 = (float)local_1460 * (float)local_13a0;
          fStack_71c = local_1460._4_4_ * local_13a0._4_4_;
          fStack_718 = (float)uStack_1458 * (float)uStack_1398;
          fStack_714 = uStack_1458._4_4_ * uStack_1398._4_4_;
          fStack_710 = (float)uStack_1450 * (float)uStack_1390;
          fStack_70c = uStack_1450._4_4_ * uStack_1390._4_4_;
          fStack_708 = (float)uStack_1448 * (float)uStack_1388;
          local_2760 = CONCAT44(fStack_71c + fVar112,local_720 + fVar109);
          uStack_2758 = CONCAT44(fStack_714 + fVar111,fStack_718 + fVar125);
          uStack_2750 = CONCAT44(fStack_70c + fVar118,fStack_710 + fVar114);
          uStack_2748 = CONCAT44(uStack_1448._4_4_ + uStack_1308._4_4_,fStack_708 + fVar127);
          local_26e8 = (undefined8 *)((long)puVar84 + (long)(local_2edc << 3) * 4);
          *local_26e8 = local_2720;
          local_26e8[1] = uStack_2718;
          local_26e8[2] = uStack_2710;
          local_26e8[3] = uStack_2708;
          local_2728 = (undefined8 *)((long)puVar83 + (long)(local_2edc << 3) * 4);
          *local_2728 = local_2760;
          local_2728[1] = uStack_2758;
          local_2728[2] = uStack_2750;
          local_2728[3] = uStack_2748;
          local_2ec8 = local_2ec8 + 4;
          local_2440 = uVar34;
          uStack_2438 = uVar35;
          uStack_2430 = uVar36;
          uStack_2428 = uVar37;
          local_2420 = local_d40._0_8_;
          uStack_2418 = local_d40._8_8_;
          uStack_2410 = local_d40._16_8_;
          uStack_2408 = local_d40._24_8_;
          local_2400 = uVar18;
          uStack_23f8 = uVar19;
          uStack_23f0 = uVar20;
          uStack_23e8 = uVar21;
          local_1460 = uVar46;
          uStack_1458 = uVar47;
          uStack_1450 = uVar48;
          uStack_1448 = uVar49;
          local_13c0 = uVar30;
          uStack_13b8 = uVar31;
          uStack_13b0 = uVar32;
          uStack_13a8 = uVar33;
          local_13a0 = local_c80._0_8_;
          uStack_1398 = local_c80._8_8_;
          uStack_1390 = local_c80._16_8_;
          uStack_1388 = local_c80._24_8_;
          local_1320 = uVar42;
          uStack_1318 = uVar43;
          uStack_1310 = uVar44;
          uStack_1308 = uVar45;
          local_1280 = uVar26;
          uStack_1278 = uVar27;
          uStack_1270 = uVar28;
          uStack_1268 = uVar29;
          local_1260 = local_cc0._0_8_;
          uStack_1258 = local_cc0._8_8_;
          uStack_1250 = local_cc0._16_8_;
          uStack_1248 = local_cc0._24_8_;
          local_11e0 = uVar38;
          uStack_11d8 = uVar39;
          uStack_11d0 = uVar40;
          uStack_11c8 = uVar41;
          local_1140 = uVar22;
          uStack_1138 = uVar23;
          uStack_1130 = uVar24;
          uStack_1128 = uVar25;
          local_1120 = local_d00._0_8_;
          uStack_1118 = local_d00._8_8_;
          uStack_1110 = local_d00._16_8_;
          uStack_1108 = local_d00._24_8_;
          local_d40 = auVar93;
          local_d20 = local_2674;
          local_d1c = local_2674;
          local_d18 = local_2674;
          local_d14 = local_2674;
          local_d10 = local_2674;
          local_d0c = local_2674;
          local_d08 = local_2674;
          local_d04 = local_2674;
          local_d00 = auVar94;
          local_ce0 = local_2678;
          local_cdc = local_2678;
          local_cd8 = local_2678;
          local_cd4 = local_2678;
          local_cd0 = local_2678;
          local_ccc = local_2678;
          local_cc8 = local_2678;
          local_cc4 = local_2678;
          local_cc0 = auVar95;
          local_ca0 = local_267c;
          local_c9c = local_267c;
          local_c98 = local_267c;
          local_c94 = local_267c;
          local_c90 = local_267c;
          local_c8c = local_267c;
          local_c88 = local_267c;
          local_c84 = local_267c;
          local_c80 = auVar96;
          local_c60 = local_2680;
          local_c5c = local_2680;
          local_c58 = local_2680;
          local_c54 = local_2680;
          local_c50 = local_2680;
          local_c4c = local_2680;
          local_c48 = local_2680;
          local_c44 = local_2680;
          fStack_844 = fStack_10e4;
          fStack_804 = fStack_1184;
          local_800 = local_12c0;
          uStack_7f8 = uStack_12b8;
          uStack_7f0 = uStack_12b0;
          uStack_7e8 = uStack_12a8;
          fStack_7c4 = fStack_1224;
          local_7c0 = local_1360;
          uStack_7b8 = uStack_1358;
          uStack_7b0 = uStack_1350;
          uStack_7a8 = uStack_1348;
          fStack_784 = fStack_12c4;
          local_780 = local_1400;
          uStack_778 = uStack_13f8;
          uStack_770 = uStack_13f0;
          uStack_768 = uStack_13e8;
          fStack_744 = fStack_1364;
          local_740 = local_14a0;
          uStack_738 = uStack_1498;
          uStack_730 = uStack_1490;
          uStack_728 = uStack_1488;
          fStack_704 = fStack_1404;
        }
      }
      else if (iVar137 == local_2d3c + 3) {
        local_2d20 = local_2d38;
        local_2d28 = puVar84;
        local_2d30 = puVar83;
        local_2d38 = puVar82;
        local_29a8 = local_2bb8;
        lVar2 = *local_2bb8;
        iVar138 = *(int *)((long)local_2bb8 + 0x2c);
        lVar3 = local_2bb8[2];
        local_29bc = iVar137 + 1;
        local_29b8 = local_2bb8;
        lVar4 = *local_2bb8;
        iVar1 = *(int *)((long)local_2bb8 + 0x2c);
        lVar5 = local_2bb8[2];
        local_29cc = iVar137 + 2;
        local_29c8 = local_2bb8;
        lVar6 = *local_2bb8;
        iVar85 = *(int *)((long)local_2bb8 + 0x2c);
        lVar7 = local_2bb8[2];
        local_30f8 = local_2bc8;
        for (local_3114 = 0; local_29ac = iVar137, local_3114 < local_2be4;
            local_3114 = local_3114 + 1) {
          iVar86 = *(int *)(local_2bd0 + (long)local_3114 * 4) << 3;
          local_2ac0 = (undefined8 *)
                       (lVar2 + (long)iVar138 * (long)iVar137 * lVar3 + (long)iVar86 * 4);
          local_2ae0 = (undefined8 *)
                       (lVar4 + (long)iVar1 * (long)local_29bc * lVar5 + (long)iVar86 * 4);
          local_2b00 = (undefined8 *)
                       (lVar6 + (long)iVar85 * (long)local_29cc * lVar7 + (long)iVar86 * 4);
          local_2684 = *local_30f8;
          auVar10 = vinsertps_avx(ZEXT416(local_2684),ZEXT416(local_2684),0x10);
          auVar10 = vinsertps_avx(auVar10,ZEXT416(local_2684),0x20);
          auVar10 = vinsertps_avx(auVar10,ZEXT416(local_2684),0x30);
          auVar11 = vinsertps_avx(ZEXT416(local_2684),ZEXT416(local_2684),0x10);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(local_2684),0x20);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(local_2684),0x30);
          auVar97._16_16_ = auVar10;
          auVar97._0_16_ = auVar11;
          local_c40._0_8_ = auVar11._0_8_;
          local_c40._8_8_ = auVar11._8_8_;
          local_c40._16_8_ = auVar10._0_8_;
          local_c40._24_8_ = auVar10._8_8_;
          local_2688 = local_30f8[1];
          auVar12 = vinsertps_avx(ZEXT416(local_2688),ZEXT416(local_2688),0x10);
          auVar12 = vinsertps_avx(auVar12,ZEXT416(local_2688),0x20);
          auVar12 = vinsertps_avx(auVar12,ZEXT416(local_2688),0x30);
          auVar13 = vinsertps_avx(ZEXT416(local_2688),ZEXT416(local_2688),0x10);
          auVar13 = vinsertps_avx(auVar13,ZEXT416(local_2688),0x20);
          auVar13 = vinsertps_avx(auVar13,ZEXT416(local_2688),0x30);
          auVar98._16_16_ = auVar12;
          auVar98._0_16_ = auVar13;
          local_c00._0_8_ = auVar13._0_8_;
          local_c00._8_8_ = auVar13._8_8_;
          local_c00._16_8_ = auVar12._0_8_;
          local_c00._24_8_ = auVar12._8_8_;
          local_268c = local_30f8[2];
          auVar14 = vinsertps_avx(ZEXT416(local_268c),ZEXT416(local_268c),0x10);
          auVar14 = vinsertps_avx(auVar14,ZEXT416(local_268c),0x20);
          auVar14 = vinsertps_avx(auVar14,ZEXT416(local_268c),0x30);
          auVar15 = vinsertps_avx(ZEXT416(local_268c),ZEXT416(local_268c),0x10);
          auVar15 = vinsertps_avx(auVar15,ZEXT416(local_268c),0x20);
          auVar15 = vinsertps_avx(auVar15,ZEXT416(local_268c),0x30);
          auVar99._16_16_ = auVar14;
          auVar99._0_16_ = auVar15;
          local_bc0._0_8_ = auVar15._0_8_;
          local_bc0._8_8_ = auVar15._8_8_;
          local_bc0._16_8_ = auVar14._0_8_;
          local_bc0._24_8_ = auVar14._8_8_;
          local_2690 = local_30f8[3];
          auVar16 = vinsertps_avx(ZEXT416(local_2690),ZEXT416(local_2690),0x10);
          auVar16 = vinsertps_avx(auVar16,ZEXT416(local_2690),0x20);
          auVar16 = vinsertps_avx(auVar16,ZEXT416(local_2690),0x30);
          auVar17 = vinsertps_avx(ZEXT416(local_2690),ZEXT416(local_2690),0x10);
          auVar17 = vinsertps_avx(auVar17,ZEXT416(local_2690),0x20);
          auVar17 = vinsertps_avx(auVar17,ZEXT416(local_2690),0x30);
          auVar100._16_16_ = auVar16;
          auVar100._0_16_ = auVar17;
          local_b80._0_8_ = auVar17._0_8_;
          local_b80._8_8_ = auVar17._8_8_;
          local_b80._16_8_ = auVar16._0_8_;
          local_b80._24_8_ = auVar16._8_8_;
          local_2ab8 = local_2ac0 + -4;
          uVar18 = *local_2ab8;
          uVar19 = local_2ac0[-3];
          uVar20 = local_2ac0[-2];
          uVar21 = local_2ac0[-1];
          uVar22 = *local_2ac0;
          uVar23 = local_2ac0[1];
          uVar24 = local_2ac0[2];
          uVar25 = local_2ac0[3];
          local_2ac8 = local_2ac0 + 4;
          uVar26 = *local_2ac8;
          uVar27 = local_2ac0[5];
          uVar28 = local_2ac0[6];
          uVar29 = local_2ac0[7];
          local_2ad0 = local_2ac0 + 8;
          uVar30 = *local_2ad0;
          uVar31 = local_2ac0[9];
          uVar32 = local_2ac0[10];
          uVar33 = local_2ac0[0xb];
          local_2ad8 = local_2ae0 + -4;
          uVar34 = *local_2ad8;
          uVar35 = local_2ae0[-3];
          uVar36 = local_2ae0[-2];
          uVar37 = local_2ae0[-1];
          uVar38 = *local_2ae0;
          uVar39 = local_2ae0[1];
          uVar40 = local_2ae0[2];
          uVar41 = local_2ae0[3];
          local_2ae8 = local_2ae0 + 4;
          uVar42 = *local_2ae8;
          uVar43 = local_2ae0[5];
          uVar44 = local_2ae0[6];
          uVar45 = local_2ae0[7];
          local_2af0 = local_2ae0 + 8;
          uVar46 = *local_2af0;
          uVar47 = local_2ae0[9];
          uVar48 = local_2ae0[10];
          uVar49 = local_2ae0[0xb];
          local_2af8 = local_2b00 + -4;
          uVar50 = *local_2af8;
          uVar51 = local_2b00[-3];
          uVar52 = local_2b00[-2];
          uVar53 = local_2b00[-1];
          uVar54 = *local_2b00;
          uVar55 = local_2b00[1];
          uVar56 = local_2b00[2];
          uVar57 = local_2b00[3];
          local_2b08 = local_2b00 + 4;
          uVar58 = *local_2b08;
          uVar59 = local_2b00[5];
          uVar60 = local_2b00[6];
          uVar61 = local_2b00[7];
          local_2b10 = local_2b00 + 8;
          uVar62 = *local_2b10;
          uVar63 = local_2b00[9];
          uVar64 = local_2b00[10];
          uVar65 = local_2b00[0xb];
          local_2480._0_4_ = (float)uVar18;
          local_2480._4_4_ = (float)((ulong)uVar18 >> 0x20);
          uStack_2478._0_4_ = (float)uVar19;
          uStack_2478._4_4_ = (float)((ulong)uVar19 >> 0x20);
          uStack_2470._0_4_ = (float)uVar20;
          uStack_2470._4_4_ = (float)((ulong)uVar20 >> 0x20);
          uStack_2468._0_4_ = (float)uVar21;
          uStack_2468._4_4_ = (float)((ulong)uVar21 >> 0x20);
          local_24a0._0_4_ = auVar11._0_4_;
          local_24a0._4_4_ = auVar11._4_4_;
          uStack_2498._0_4_ = auVar11._8_4_;
          uStack_2498._4_4_ = auVar11._12_4_;
          uStack_2490._0_4_ = auVar10._0_4_;
          uStack_2490._4_4_ = auVar10._4_4_;
          uStack_2488._0_4_ = auVar10._8_4_;
          local_3360 = CONCAT44(local_2480._4_4_ * local_24a0._4_4_,
                                (float)local_2480 * (float)local_24a0);
          uStack_3358 = CONCAT44(uStack_2478._4_4_ * uStack_2498._4_4_,
                                 (float)uStack_2478 * (float)uStack_2498);
          uStack_3350 = CONCAT44(uStack_2470._4_4_ * uStack_2490._4_4_,
                                 (float)uStack_2470 * (float)uStack_2490);
          uStack_3348 = CONCAT44(uStack_2468._4_4_,(float)uStack_2468 * (float)uStack_2488);
          local_24e0 = local_c40._0_8_;
          uStack_24d8 = local_c40._8_8_;
          uStack_24d0 = local_c40._16_8_;
          uStack_24c8 = local_c40._24_8_;
          local_24c0._0_4_ = (float)uVar34;
          local_24c0._4_4_ = (float)((ulong)uVar34 >> 0x20);
          uStack_24b8._0_4_ = (float)uVar35;
          uStack_24b8._4_4_ = (float)((ulong)uVar35 >> 0x20);
          uStack_24b0._0_4_ = (float)uVar36;
          uStack_24b0._4_4_ = (float)((ulong)uVar36 >> 0x20);
          uStack_24a8._0_4_ = (float)uVar37;
          uStack_24a8._4_4_ = (float)((ulong)uVar37 >> 0x20);
          local_3380 = CONCAT44(local_24c0._4_4_ * local_24a0._4_4_,
                                (float)local_24c0 * (float)local_24a0);
          uStack_3378 = CONCAT44(uStack_24b8._4_4_ * uStack_2498._4_4_,
                                 (float)uStack_24b8 * (float)uStack_2498);
          uStack_3370 = CONCAT44(uStack_24b0._4_4_ * uStack_2490._4_4_,
                                 (float)uStack_24b0 * (float)uStack_2490);
          uStack_3368 = CONCAT44(uStack_24a8._4_4_,(float)uStack_24a8 * (float)uStack_2488);
          local_2520 = local_c40._0_8_;
          uStack_2518 = local_c40._8_8_;
          uStack_2510 = local_c40._16_8_;
          uStack_2508 = local_c40._24_8_;
          local_2500._0_4_ = (float)uVar50;
          local_2500._4_4_ = (float)((ulong)uVar50 >> 0x20);
          uStack_24f8._0_4_ = (float)uVar51;
          uStack_24f8._4_4_ = (float)((ulong)uVar51 >> 0x20);
          uStack_24f0._0_4_ = (float)uVar52;
          uStack_24f0._4_4_ = (float)((ulong)uVar52 >> 0x20);
          uStack_24e8._0_4_ = (float)uVar53;
          uStack_24e8._4_4_ = (float)((ulong)uVar53 >> 0x20);
          local_33a0 = CONCAT44(local_2500._4_4_ * local_24a0._4_4_,
                                (float)local_2500 * (float)local_24a0);
          uStack_3398 = CONCAT44(uStack_24f8._4_4_ * uStack_2498._4_4_,
                                 (float)uStack_24f8 * (float)uStack_2498);
          uStack_3390 = CONCAT44(uStack_24f0._4_4_ * uStack_2490._4_4_,
                                 (float)uStack_24f0 * (float)uStack_2490);
          uStack_3388 = CONCAT44(uStack_24e8._4_4_,(float)uStack_24e8 * (float)uStack_2488);
          local_1520 = local_c00._0_8_;
          uStack_1518 = local_c00._8_8_;
          uStack_1510 = local_c00._16_8_;
          uStack_1508 = local_c00._24_8_;
          local_1540 = local_3360;
          uStack_1538 = uStack_3358;
          uStack_1530 = uStack_3350;
          uStack_1528 = uStack_3348;
          local_1500._0_4_ = (float)uVar22;
          local_14c0 = (float)local_1500;
          local_1500._4_4_ = (float)((ulong)uVar22 >> 0x20);
          fStack_14bc = local_1500._4_4_;
          uStack_14f8._0_4_ = (float)uVar23;
          fStack_14b8 = (float)uStack_14f8;
          uStack_14f8._4_4_ = (float)((ulong)uVar23 >> 0x20);
          fStack_14b4 = uStack_14f8._4_4_;
          uStack_14f0._0_4_ = (float)uVar24;
          fStack_14b0 = (float)uStack_14f0;
          uStack_14f0._4_4_ = (float)((ulong)uVar24 >> 0x20);
          fStack_14ac = uStack_14f0._4_4_;
          uStack_14e8._0_4_ = (float)uVar25;
          fStack_14a8 = (float)uStack_14e8;
          uStack_14e8._4_4_ = (float)((ulong)uVar25 >> 0x20);
          fStack_14a4 = uStack_14e8._4_4_;
          local_14e0._0_4_ = auVar13._0_4_;
          local_14e0._4_4_ = auVar13._4_4_;
          uStack_14d8._0_4_ = auVar13._8_4_;
          uStack_14d8._4_4_ = auVar13._12_4_;
          uStack_14d0._0_4_ = auVar12._0_4_;
          uStack_14d0._4_4_ = auVar12._4_4_;
          uStack_14c8._0_4_ = auVar12._8_4_;
          local_6e0 = (float)local_1500 * (float)local_14e0;
          fStack_6dc = local_1500._4_4_ * local_14e0._4_4_;
          fStack_6d8 = (float)uStack_14f8 * (float)uStack_14d8;
          fStack_6d4 = uStack_14f8._4_4_ * uStack_14d8._4_4_;
          fStack_6d0 = (float)uStack_14f0 * (float)uStack_14d0;
          fStack_6cc = uStack_14f0._4_4_ * uStack_14d0._4_4_;
          fStack_6c8 = (float)uStack_14e8 * (float)uStack_14c8;
          local_700 = local_3360;
          uStack_6f8 = uStack_3358;
          uStack_6f0 = uStack_3350;
          uStack_6e8 = uStack_3348;
          fVar88 = local_6e0 + (float)local_2480 * (float)local_24a0;
          fVar112 = fStack_6dc + local_2480._4_4_ * local_24a0._4_4_;
          fVar135 = fStack_6d8 + (float)uStack_2478 * (float)uStack_2498;
          fVar114 = fStack_6d4 + uStack_2478._4_4_ * uStack_2498._4_4_;
          fVar126 = fStack_6d0 + (float)uStack_2470 * (float)uStack_2490;
          fVar119 = fStack_6cc + uStack_2470._4_4_ * uStack_2490._4_4_;
          fVar128 = fStack_6c8 + (float)uStack_2468 * (float)uStack_2488;
          local_1720 = CONCAT44(fVar112,fVar88);
          uStack_1718 = CONCAT44(fVar114,fVar135);
          uStack_1710 = CONCAT44(fVar119,fVar126);
          uStack_1708 = CONCAT44(uStack_14e8._4_4_ + uStack_2468._4_4_,fVar128);
          local_15c0 = local_c00._0_8_;
          uStack_15b8 = local_c00._8_8_;
          uStack_15b0 = local_c00._16_8_;
          uStack_15a8 = local_c00._24_8_;
          local_15e0 = local_3380;
          uStack_15d8 = uStack_3378;
          uStack_15d0 = uStack_3370;
          uStack_15c8 = uStack_3368;
          local_15a0._0_4_ = (float)uVar38;
          local_1560 = (float)local_15a0;
          local_15a0._4_4_ = (float)((ulong)uVar38 >> 0x20);
          fStack_155c = local_15a0._4_4_;
          uStack_1598._0_4_ = (float)uVar39;
          fStack_1558 = (float)uStack_1598;
          uStack_1598._4_4_ = (float)((ulong)uVar39 >> 0x20);
          fStack_1554 = uStack_1598._4_4_;
          uStack_1590._0_4_ = (float)uVar40;
          fStack_1550 = (float)uStack_1590;
          uStack_1590._4_4_ = (float)((ulong)uVar40 >> 0x20);
          fStack_154c = uStack_1590._4_4_;
          uStack_1588._0_4_ = (float)uVar41;
          fStack_1548 = (float)uStack_1588;
          uStack_1588._4_4_ = (float)((ulong)uVar41 >> 0x20);
          fStack_1544 = uStack_1588._4_4_;
          local_1580 = local_c00._0_8_;
          uStack_1578 = local_c00._8_8_;
          uStack_1570 = local_c00._16_8_;
          uStack_1568 = local_c00._24_8_;
          local_6a0 = (float)local_15a0 * (float)local_14e0;
          fStack_69c = local_15a0._4_4_ * local_14e0._4_4_;
          fStack_698 = (float)uStack_1598 * (float)uStack_14d8;
          fStack_694 = uStack_1598._4_4_ * uStack_14d8._4_4_;
          fStack_690 = (float)uStack_1590 * (float)uStack_14d0;
          fStack_68c = uStack_1590._4_4_ * uStack_14d0._4_4_;
          fStack_688 = (float)uStack_1588 * (float)uStack_14c8;
          local_6c0 = local_3380;
          uStack_6b8 = uStack_3378;
          uStack_6b0 = uStack_3370;
          uStack_6a8 = uStack_3368;
          fVar109 = local_6a0 + (float)local_24c0 * (float)local_24a0;
          fVar116 = fStack_69c + local_24c0._4_4_ * local_24a0._4_4_;
          fVar111 = fStack_698 + (float)uStack_24b8 * (float)uStack_2498;
          fVar117 = fStack_694 + uStack_24b8._4_4_ * uStack_2498._4_4_;
          fVar127 = fStack_690 + (float)uStack_24b0 * (float)uStack_2490;
          fVar120 = fStack_68c + uStack_24b0._4_4_ * uStack_2490._4_4_;
          fVar129 = fStack_688 + (float)uStack_24a8 * (float)uStack_2488;
          local_17c0 = CONCAT44(fVar116,fVar109);
          uStack_17b8 = CONCAT44(fVar117,fVar111);
          uStack_17b0 = CONCAT44(fVar120,fVar127);
          uStack_17a8 = CONCAT44(uStack_1588._4_4_ + uStack_24a8._4_4_,fVar129);
          local_1660 = local_c00._0_8_;
          uStack_1658 = local_c00._8_8_;
          uStack_1650 = local_c00._16_8_;
          uStack_1648 = local_c00._24_8_;
          local_1680 = local_33a0;
          uStack_1678 = uStack_3398;
          uStack_1670 = uStack_3390;
          uStack_1668 = uStack_3388;
          local_1640._0_4_ = (float)uVar54;
          local_1600 = (float)local_1640;
          local_1640._4_4_ = (float)((ulong)uVar54 >> 0x20);
          fStack_15fc = local_1640._4_4_;
          uStack_1638._0_4_ = (float)uVar55;
          fStack_15f8 = (float)uStack_1638;
          uStack_1638._4_4_ = (float)((ulong)uVar55 >> 0x20);
          fStack_15f4 = uStack_1638._4_4_;
          uStack_1630._0_4_ = (float)uVar56;
          fStack_15f0 = (float)uStack_1630;
          uStack_1630._4_4_ = (float)((ulong)uVar56 >> 0x20);
          fStack_15ec = uStack_1630._4_4_;
          uStack_1628._0_4_ = (float)uVar57;
          fStack_15e8 = (float)uStack_1628;
          uStack_1628._4_4_ = (float)((ulong)uVar57 >> 0x20);
          fStack_15e4 = uStack_1628._4_4_;
          local_1620 = local_c00._0_8_;
          uStack_1618 = local_c00._8_8_;
          uStack_1610 = local_c00._16_8_;
          uStack_1608 = local_c00._24_8_;
          local_660 = (float)local_1640 * (float)local_14e0;
          fStack_65c = local_1640._4_4_ * local_14e0._4_4_;
          fStack_658 = (float)uStack_1638 * (float)uStack_14d8;
          fStack_654 = uStack_1638._4_4_ * uStack_14d8._4_4_;
          fStack_650 = (float)uStack_1630 * (float)uStack_14d0;
          fStack_64c = uStack_1630._4_4_ * uStack_14d0._4_4_;
          fStack_648 = (float)uStack_1628 * (float)uStack_14c8;
          local_680 = local_33a0;
          uStack_678 = uStack_3398;
          uStack_670 = uStack_3390;
          uStack_668 = uStack_3388;
          fVar110 = local_660 + (float)local_2500 * (float)local_24a0;
          fVar125 = fStack_65c + local_2500._4_4_ * local_24a0._4_4_;
          fVar113 = fStack_658 + (float)uStack_24f8 * (float)uStack_2498;
          fVar118 = fStack_654 + uStack_24f8._4_4_ * uStack_2498._4_4_;
          fVar115 = fStack_650 + (float)uStack_24f0 * (float)uStack_2490;
          fVar121 = fStack_64c + uStack_24f0._4_4_ * uStack_2490._4_4_;
          fVar130 = fStack_648 + (float)uStack_24e8 * (float)uStack_2488;
          local_1860 = CONCAT44(fVar125,fVar110);
          uStack_1858 = CONCAT44(fVar118,fVar113);
          uStack_1850 = CONCAT44(fVar121,fVar115);
          uStack_1848 = CONCAT44(uStack_1628._4_4_ + uStack_24e8._4_4_,fVar130);
          local_1700 = local_bc0._0_8_;
          uStack_16f8 = local_bc0._8_8_;
          uStack_16f0 = local_bc0._16_8_;
          uStack_16e8 = local_bc0._24_8_;
          local_16e0._0_4_ = (float)uVar26;
          local_16a0 = (float)local_16e0;
          local_16e0._4_4_ = (float)((ulong)uVar26 >> 0x20);
          fStack_169c = local_16e0._4_4_;
          uStack_16d8._0_4_ = (float)uVar27;
          fStack_1698 = (float)uStack_16d8;
          uStack_16d8._4_4_ = (float)((ulong)uVar27 >> 0x20);
          fStack_1694 = uStack_16d8._4_4_;
          uStack_16d0._0_4_ = (float)uVar28;
          fStack_1690 = (float)uStack_16d0;
          uStack_16d0._4_4_ = (float)((ulong)uVar28 >> 0x20);
          fStack_168c = uStack_16d0._4_4_;
          uStack_16c8._0_4_ = (float)uVar29;
          fStack_1688 = (float)uStack_16c8;
          uStack_16c8._4_4_ = (float)((ulong)uVar29 >> 0x20);
          fStack_1684 = uStack_16c8._4_4_;
          local_16c0._0_4_ = auVar15._0_4_;
          local_16c0._4_4_ = auVar15._4_4_;
          uStack_16b8._0_4_ = auVar15._8_4_;
          uStack_16b8._4_4_ = auVar15._12_4_;
          uStack_16b0._0_4_ = auVar14._0_4_;
          uStack_16b0._4_4_ = auVar14._4_4_;
          uStack_16a8._0_4_ = auVar14._8_4_;
          local_620 = (float)local_16e0 * (float)local_16c0;
          fStack_61c = local_16e0._4_4_ * local_16c0._4_4_;
          fStack_618 = (float)uStack_16d8 * (float)uStack_16b8;
          fStack_614 = uStack_16d8._4_4_ * uStack_16b8._4_4_;
          fStack_610 = (float)uStack_16d0 * (float)uStack_16b0;
          fStack_60c = uStack_16d0._4_4_ * uStack_16b0._4_4_;
          fStack_608 = (float)uStack_16c8 * (float)uStack_16a8;
          fVar88 = local_620 + fVar88;
          fVar112 = fStack_61c + fVar112;
          fVar135 = fStack_618 + fVar135;
          fVar114 = fStack_614 + fVar114;
          fVar126 = fStack_610 + fVar126;
          fVar119 = fStack_60c + fVar119;
          fVar128 = fStack_608 + fVar128;
          uStack_16c8._4_4_ = uStack_16c8._4_4_ + uStack_14e8._4_4_ + uStack_2468._4_4_;
          local_1900 = CONCAT44(fVar112,fVar88);
          uStack_18f8 = CONCAT44(fVar114,fVar135);
          uStack_18f0 = CONCAT44(fVar119,fVar126);
          uStack_18e8 = CONCAT44(uStack_16c8._4_4_,fVar128);
          local_17a0 = local_bc0._0_8_;
          uStack_1798 = local_bc0._8_8_;
          uStack_1790 = local_bc0._16_8_;
          uStack_1788 = local_bc0._24_8_;
          local_1780._0_4_ = (float)uVar42;
          local_1740 = (float)local_1780;
          local_1780._4_4_ = (float)((ulong)uVar42 >> 0x20);
          fStack_173c = local_1780._4_4_;
          uStack_1778._0_4_ = (float)uVar43;
          fStack_1738 = (float)uStack_1778;
          uStack_1778._4_4_ = (float)((ulong)uVar43 >> 0x20);
          fStack_1734 = uStack_1778._4_4_;
          uStack_1770._0_4_ = (float)uVar44;
          fStack_1730 = (float)uStack_1770;
          uStack_1770._4_4_ = (float)((ulong)uVar44 >> 0x20);
          fStack_172c = uStack_1770._4_4_;
          uStack_1768._0_4_ = (float)uVar45;
          fStack_1728 = (float)uStack_1768;
          uStack_1768._4_4_ = (float)((ulong)uVar45 >> 0x20);
          fStack_1724 = uStack_1768._4_4_;
          local_1760 = local_bc0._0_8_;
          uStack_1758 = local_bc0._8_8_;
          uStack_1750 = local_bc0._16_8_;
          uStack_1748 = local_bc0._24_8_;
          local_5e0 = (float)local_1780 * (float)local_16c0;
          fStack_5dc = local_1780._4_4_ * local_16c0._4_4_;
          fStack_5d8 = (float)uStack_1778 * (float)uStack_16b8;
          fStack_5d4 = uStack_1778._4_4_ * uStack_16b8._4_4_;
          fStack_5d0 = (float)uStack_1770 * (float)uStack_16b0;
          fStack_5cc = uStack_1770._4_4_ * uStack_16b0._4_4_;
          fStack_5c8 = (float)uStack_1768 * (float)uStack_16a8;
          fVar109 = local_5e0 + fVar109;
          fVar116 = fStack_5dc + fVar116;
          fVar111 = fStack_5d8 + fVar111;
          fVar117 = fStack_5d4 + fVar117;
          fVar127 = fStack_5d0 + fVar127;
          fVar120 = fStack_5cc + fVar120;
          fVar129 = fStack_5c8 + fVar129;
          uStack_1768._4_4_ = uStack_1768._4_4_ + uStack_1588._4_4_ + uStack_24a8._4_4_;
          local_19a0 = CONCAT44(fVar116,fVar109);
          uStack_1998 = CONCAT44(fVar117,fVar111);
          uStack_1990 = CONCAT44(fVar120,fVar127);
          uStack_1988 = CONCAT44(uStack_1768._4_4_,fVar129);
          local_1840 = local_bc0._0_8_;
          uStack_1838 = local_bc0._8_8_;
          uStack_1830 = local_bc0._16_8_;
          uStack_1828 = local_bc0._24_8_;
          local_1820._0_4_ = (float)uVar58;
          local_17e0 = (float)local_1820;
          local_1820._4_4_ = (float)((ulong)uVar58 >> 0x20);
          fStack_17dc = local_1820._4_4_;
          uStack_1818._0_4_ = (float)uVar59;
          fStack_17d8 = (float)uStack_1818;
          uStack_1818._4_4_ = (float)((ulong)uVar59 >> 0x20);
          fStack_17d4 = uStack_1818._4_4_;
          uStack_1810._0_4_ = (float)uVar60;
          fStack_17d0 = (float)uStack_1810;
          uStack_1810._4_4_ = (float)((ulong)uVar60 >> 0x20);
          fStack_17cc = uStack_1810._4_4_;
          uStack_1808._0_4_ = (float)uVar61;
          fStack_17c8 = (float)uStack_1808;
          uStack_1808._4_4_ = (float)((ulong)uVar61 >> 0x20);
          fStack_17c4 = uStack_1808._4_4_;
          local_1800 = local_bc0._0_8_;
          uStack_17f8 = local_bc0._8_8_;
          uStack_17f0 = local_bc0._16_8_;
          uStack_17e8 = local_bc0._24_8_;
          local_5a0 = (float)local_1820 * (float)local_16c0;
          fStack_59c = local_1820._4_4_ * local_16c0._4_4_;
          fStack_598 = (float)uStack_1818 * (float)uStack_16b8;
          fStack_594 = uStack_1818._4_4_ * uStack_16b8._4_4_;
          fStack_590 = (float)uStack_1810 * (float)uStack_16b0;
          fStack_58c = uStack_1810._4_4_ * uStack_16b0._4_4_;
          fStack_588 = (float)uStack_1808 * (float)uStack_16a8;
          fVar110 = local_5a0 + fVar110;
          fVar125 = fStack_59c + fVar125;
          fVar113 = fStack_598 + fVar113;
          fVar118 = fStack_594 + fVar118;
          fVar115 = fStack_590 + fVar115;
          fVar121 = fStack_58c + fVar121;
          fVar130 = fStack_588 + fVar130;
          uStack_1808._4_4_ = uStack_1808._4_4_ + uStack_1628._4_4_ + uStack_24e8._4_4_;
          local_1a40 = CONCAT44(fVar125,fVar110);
          uStack_1a38 = CONCAT44(fVar118,fVar113);
          uStack_1a30 = CONCAT44(fVar121,fVar115);
          uStack_1a28 = CONCAT44(uStack_1808._4_4_,fVar130);
          local_18e0 = local_b80._0_8_;
          uStack_18d8 = local_b80._8_8_;
          uStack_18d0 = local_b80._16_8_;
          uStack_18c8 = local_b80._24_8_;
          local_18c0._0_4_ = (float)uVar30;
          local_1880 = (float)local_18c0;
          local_18c0._4_4_ = (float)((ulong)uVar30 >> 0x20);
          fStack_187c = local_18c0._4_4_;
          uStack_18b8._0_4_ = (float)uVar31;
          fStack_1878 = (float)uStack_18b8;
          uStack_18b8._4_4_ = (float)((ulong)uVar31 >> 0x20);
          fStack_1874 = uStack_18b8._4_4_;
          uStack_18b0._0_4_ = (float)uVar32;
          fStack_1870 = (float)uStack_18b0;
          uStack_18b0._4_4_ = (float)((ulong)uVar32 >> 0x20);
          fStack_186c = uStack_18b0._4_4_;
          uStack_18a8._0_4_ = (float)uVar33;
          fStack_1868 = (float)uStack_18a8;
          uStack_18a8._4_4_ = (float)((ulong)uVar33 >> 0x20);
          fStack_1864 = uStack_18a8._4_4_;
          local_18a0._0_4_ = auVar17._0_4_;
          local_18a0._4_4_ = auVar17._4_4_;
          uStack_1898._0_4_ = auVar17._8_4_;
          uStack_1898._4_4_ = auVar17._12_4_;
          uStack_1890._0_4_ = auVar16._0_4_;
          uStack_1890._4_4_ = auVar16._4_4_;
          uStack_1888._0_4_ = auVar16._8_4_;
          local_560 = (float)local_18c0 * (float)local_18a0;
          fStack_55c = local_18c0._4_4_ * local_18a0._4_4_;
          fStack_558 = (float)uStack_18b8 * (float)uStack_1898;
          fStack_554 = uStack_18b8._4_4_ * uStack_1898._4_4_;
          fStack_550 = (float)uStack_18b0 * (float)uStack_1890;
          fStack_54c = uStack_18b0._4_4_ * uStack_1890._4_4_;
          fStack_548 = (float)uStack_18a8 * (float)uStack_1888;
          local_27a0 = CONCAT44(fStack_55c + fVar112,local_560 + fVar88);
          uStack_2798 = CONCAT44(fStack_554 + fVar114,fStack_558 + fVar135);
          uStack_2790 = CONCAT44(fStack_54c + fVar119,fStack_550 + fVar126);
          uStack_2788 = CONCAT44(uStack_18a8._4_4_ + uStack_16c8._4_4_,fStack_548 + fVar128);
          local_1980 = local_b80._0_8_;
          uStack_1978 = local_b80._8_8_;
          uStack_1970 = local_b80._16_8_;
          uStack_1968 = local_b80._24_8_;
          local_1960._0_4_ = (float)uVar46;
          local_1920 = (float)local_1960;
          local_1960._4_4_ = (float)((ulong)uVar46 >> 0x20);
          fStack_191c = local_1960._4_4_;
          uStack_1958._0_4_ = (float)uVar47;
          fStack_1918 = (float)uStack_1958;
          uStack_1958._4_4_ = (float)((ulong)uVar47 >> 0x20);
          fStack_1914 = uStack_1958._4_4_;
          uStack_1950._0_4_ = (float)uVar48;
          fStack_1910 = (float)uStack_1950;
          uStack_1950._4_4_ = (float)((ulong)uVar48 >> 0x20);
          fStack_190c = uStack_1950._4_4_;
          uStack_1948._0_4_ = (float)uVar49;
          fStack_1908 = (float)uStack_1948;
          uStack_1948._4_4_ = (float)((ulong)uVar49 >> 0x20);
          fStack_1904 = uStack_1948._4_4_;
          local_1940 = local_b80._0_8_;
          uStack_1938 = local_b80._8_8_;
          uStack_1930 = local_b80._16_8_;
          uStack_1928 = local_b80._24_8_;
          local_520 = (float)local_1960 * (float)local_18a0;
          fStack_51c = local_1960._4_4_ * local_18a0._4_4_;
          fStack_518 = (float)uStack_1958 * (float)uStack_1898;
          fStack_514 = uStack_1958._4_4_ * uStack_1898._4_4_;
          fStack_510 = (float)uStack_1950 * (float)uStack_1890;
          fStack_50c = uStack_1950._4_4_ * uStack_1890._4_4_;
          fStack_508 = (float)uStack_1948 * (float)uStack_1888;
          local_27e0 = CONCAT44(fStack_51c + fVar116,local_520 + fVar109);
          uStack_27d8 = CONCAT44(fStack_514 + fVar117,fStack_518 + fVar111);
          uStack_27d0 = CONCAT44(fStack_50c + fVar120,fStack_510 + fVar127);
          uStack_27c8 = CONCAT44(uStack_1948._4_4_ + uStack_1768._4_4_,fStack_508 + fVar129);
          local_1a20 = local_b80._0_8_;
          uStack_1a18 = local_b80._8_8_;
          uStack_1a10 = local_b80._16_8_;
          uStack_1a08 = local_b80._24_8_;
          local_1a00._0_4_ = (float)uVar62;
          local_19c0 = (float)local_1a00;
          local_1a00._4_4_ = (float)((ulong)uVar62 >> 0x20);
          fStack_19bc = local_1a00._4_4_;
          uStack_19f8._0_4_ = (float)uVar63;
          fStack_19b8 = (float)uStack_19f8;
          uStack_19f8._4_4_ = (float)((ulong)uVar63 >> 0x20);
          fStack_19b4 = uStack_19f8._4_4_;
          uStack_19f0._0_4_ = (float)uVar64;
          fStack_19b0 = (float)uStack_19f0;
          uStack_19f0._4_4_ = (float)((ulong)uVar64 >> 0x20);
          fStack_19ac = uStack_19f0._4_4_;
          uStack_19e8._0_4_ = (float)uVar65;
          fStack_19a8 = (float)uStack_19e8;
          uStack_19e8._4_4_ = (float)((ulong)uVar65 >> 0x20);
          fStack_19a4 = uStack_19e8._4_4_;
          local_19e0 = local_b80._0_8_;
          uStack_19d8 = local_b80._8_8_;
          uStack_19d0 = local_b80._16_8_;
          uStack_19c8 = local_b80._24_8_;
          local_4e0 = (float)local_1a00 * (float)local_18a0;
          fStack_4dc = local_1a00._4_4_ * local_18a0._4_4_;
          fStack_4d8 = (float)uStack_19f8 * (float)uStack_1898;
          fStack_4d4 = uStack_19f8._4_4_ * uStack_1898._4_4_;
          fStack_4d0 = (float)uStack_19f0 * (float)uStack_1890;
          fStack_4cc = uStack_19f0._4_4_ * uStack_1890._4_4_;
          fStack_4c8 = (float)uStack_19e8 * (float)uStack_1888;
          local_2820 = CONCAT44(fStack_4dc + fVar125,local_4e0 + fVar110);
          uStack_2818 = CONCAT44(fStack_4d4 + fVar118,fStack_4d8 + fVar113);
          uStack_2810 = CONCAT44(fStack_4cc + fVar121,fStack_4d0 + fVar115);
          uStack_2808 = CONCAT44(uStack_19e8._4_4_ + uStack_1808._4_4_,fStack_4c8 + fVar130);
          local_2768 = (undefined8 *)((long)puVar84 + (long)(local_3114 << 3) * 4);
          *local_2768 = local_27a0;
          local_2768[1] = uStack_2798;
          local_2768[2] = uStack_2790;
          local_2768[3] = uStack_2788;
          local_27a8 = (undefined8 *)((long)puVar83 + (long)(local_3114 << 3) * 4);
          *local_27a8 = local_27e0;
          local_27a8[1] = uStack_27d8;
          local_27a8[2] = uStack_27d0;
          local_27a8[3] = uStack_27c8;
          local_27e8 = (undefined8 *)((long)puVar82 + (long)(local_3114 << 3) * 4);
          *local_27e8 = local_2820;
          local_27e8[1] = uStack_2818;
          local_27e8[2] = uStack_2810;
          local_27e8[3] = uStack_2808;
          local_30f8 = local_30f8 + 4;
          local_2500 = uVar50;
          uStack_24f8 = uVar51;
          uStack_24f0 = uVar52;
          uStack_24e8 = uVar53;
          local_24c0 = uVar34;
          uStack_24b8 = uVar35;
          uStack_24b0 = uVar36;
          uStack_24a8 = uVar37;
          local_24a0 = local_c40._0_8_;
          uStack_2498 = local_c40._8_8_;
          uStack_2490 = local_c40._16_8_;
          uStack_2488 = local_c40._24_8_;
          local_2480 = uVar18;
          uStack_2478 = uVar19;
          uStack_2470 = uVar20;
          uStack_2468 = uVar21;
          local_1a00 = uVar62;
          uStack_19f8 = uVar63;
          uStack_19f0 = uVar64;
          uStack_19e8 = uVar65;
          local_1960 = uVar46;
          uStack_1958 = uVar47;
          uStack_1950 = uVar48;
          uStack_1948 = uVar49;
          local_18c0 = uVar30;
          uStack_18b8 = uVar31;
          uStack_18b0 = uVar32;
          uStack_18a8 = uVar33;
          local_18a0 = local_b80._0_8_;
          uStack_1898 = local_b80._8_8_;
          uStack_1890 = local_b80._16_8_;
          uStack_1888 = local_b80._24_8_;
          local_1820 = uVar58;
          uStack_1818 = uVar59;
          uStack_1810 = uVar60;
          uStack_1808 = uVar61;
          local_1780 = uVar42;
          uStack_1778 = uVar43;
          uStack_1770 = uVar44;
          uStack_1768 = uVar45;
          local_16e0 = uVar26;
          uStack_16d8 = uVar27;
          uStack_16d0 = uVar28;
          uStack_16c8 = uVar29;
          local_16c0 = local_bc0._0_8_;
          uStack_16b8 = local_bc0._8_8_;
          uStack_16b0 = local_bc0._16_8_;
          uStack_16a8 = local_bc0._24_8_;
          local_1640 = uVar54;
          uStack_1638 = uVar55;
          uStack_1630 = uVar56;
          uStack_1628 = uVar57;
          local_15a0 = uVar38;
          uStack_1598 = uVar39;
          uStack_1590 = uVar40;
          uStack_1588 = uVar41;
          local_1500 = uVar22;
          uStack_14f8 = uVar23;
          uStack_14f0 = uVar24;
          uStack_14e8 = uVar25;
          local_14e0 = local_c00._0_8_;
          uStack_14d8 = local_c00._8_8_;
          uStack_14d0 = local_c00._16_8_;
          uStack_14c8 = local_c00._24_8_;
          local_c40 = auVar97;
          local_c20 = local_2684;
          local_c1c = local_2684;
          local_c18 = local_2684;
          local_c14 = local_2684;
          local_c10 = local_2684;
          local_c0c = local_2684;
          local_c08 = local_2684;
          local_c04 = local_2684;
          local_c00 = auVar98;
          local_be0 = local_2688;
          local_bdc = local_2688;
          local_bd8 = local_2688;
          local_bd4 = local_2688;
          local_bd0 = local_2688;
          local_bcc = local_2688;
          local_bc8 = local_2688;
          local_bc4 = local_2688;
          local_bc0 = auVar99;
          local_ba0 = local_268c;
          local_b9c = local_268c;
          local_b98 = local_268c;
          local_b94 = local_268c;
          local_b90 = local_268c;
          local_b8c = local_268c;
          local_b88 = local_268c;
          local_b84 = local_268c;
          local_b80 = auVar100;
          local_b60 = local_2690;
          local_b5c = local_2690;
          local_b58 = local_2690;
          local_b54 = local_2690;
          local_b50 = local_2690;
          local_b4c = local_2690;
          local_b48 = local_2690;
          local_b44 = local_2690;
          fStack_6c4 = fStack_14a4;
          fStack_684 = fStack_1544;
          fStack_644 = fStack_15e4;
          local_640 = local_1720;
          uStack_638 = uStack_1718;
          uStack_630 = uStack_1710;
          uStack_628 = uStack_1708;
          fStack_604 = fStack_1684;
          local_600 = local_17c0;
          uStack_5f8 = uStack_17b8;
          uStack_5f0 = uStack_17b0;
          uStack_5e8 = uStack_17a8;
          fStack_5c4 = fStack_1724;
          local_5c0 = local_1860;
          uStack_5b8 = uStack_1858;
          uStack_5b0 = uStack_1850;
          uStack_5a8 = uStack_1848;
          fStack_584 = fStack_17c4;
          local_580 = local_1900;
          uStack_578 = uStack_18f8;
          uStack_570 = uStack_18f0;
          uStack_568 = uStack_18e8;
          fStack_544 = fStack_1864;
          local_540 = local_19a0;
          uStack_538 = uStack_1998;
          uStack_530 = uStack_1990;
          uStack_528 = uStack_1988;
          fStack_504 = fStack_1904;
          local_500 = local_1a40;
          uStack_4f8 = uStack_1a38;
          uStack_4f0 = uStack_1a30;
          uStack_4e8 = uStack_1a28;
          fStack_4c4 = fStack_19a4;
        }
      }
      else {
        local_29dc = iVar137 + -1;
        local_29d8 = local_2bb8;
        lVar2 = *local_2bb8;
        iVar138 = *(int *)((long)local_2bb8 + 0x2c);
        lVar3 = local_2bb8[2];
        local_29e8 = local_2bb8;
        lVar4 = *local_2bb8;
        iVar1 = *(int *)((long)local_2bb8 + 0x2c);
        lVar5 = local_2bb8[2];
        local_29fc = iVar137 + 1;
        local_29f8 = local_2bb8;
        lVar6 = *local_2bb8;
        iVar85 = *(int *)((long)local_2bb8 + 0x2c);
        lVar7 = local_2bb8[2];
        local_2a0c = iVar137 + 2;
        local_2a08 = local_2bb8;
        lVar8 = *local_2bb8;
        iVar86 = *(int *)((long)local_2bb8 + 0x2c);
        lVar9 = local_2bb8[2];
        local_33c8 = local_2bc8;
        for (local_33ec = 0; local_29ec = iVar137, local_33ec < local_2be4;
            local_33ec = local_33ec + 1) {
          iVar87 = *(int *)(local_2bd0 + (long)local_33ec * 4) << 3;
          local_2b20 = (undefined8 *)
                       (lVar2 + (long)iVar138 * (long)local_29dc * lVar3 + (long)iVar87 * 4);
          local_2b40 = (undefined8 *)
                       (lVar4 + (long)iVar1 * (long)iVar137 * lVar5 + (long)iVar87 * 4);
          local_2b60 = (undefined8 *)
                       (lVar6 + (long)iVar85 * (long)local_29fc * lVar7 + (long)iVar87 * 4);
          local_2b80 = (undefined8 *)
                       (lVar8 + (long)iVar86 * (long)local_2a0c * lVar9 + (long)iVar87 * 4);
          local_2694 = *local_33c8;
          auVar10 = vinsertps_avx(ZEXT416(local_2694),ZEXT416(local_2694),0x10);
          auVar10 = vinsertps_avx(auVar10,ZEXT416(local_2694),0x20);
          auVar10 = vinsertps_avx(auVar10,ZEXT416(local_2694),0x30);
          auVar11 = vinsertps_avx(ZEXT416(local_2694),ZEXT416(local_2694),0x10);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(local_2694),0x20);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(local_2694),0x30);
          auVar101._16_16_ = auVar10;
          auVar101._0_16_ = auVar11;
          local_b40._0_8_ = auVar11._0_8_;
          local_b40._8_8_ = auVar11._8_8_;
          local_b40._16_8_ = auVar10._0_8_;
          local_b40._24_8_ = auVar10._8_8_;
          local_2698 = local_33c8[1];
          auVar12 = vinsertps_avx(ZEXT416(local_2698),ZEXT416(local_2698),0x10);
          auVar12 = vinsertps_avx(auVar12,ZEXT416(local_2698),0x20);
          auVar12 = vinsertps_avx(auVar12,ZEXT416(local_2698),0x30);
          auVar13 = vinsertps_avx(ZEXT416(local_2698),ZEXT416(local_2698),0x10);
          auVar13 = vinsertps_avx(auVar13,ZEXT416(local_2698),0x20);
          auVar13 = vinsertps_avx(auVar13,ZEXT416(local_2698),0x30);
          auVar102._16_16_ = auVar12;
          auVar102._0_16_ = auVar13;
          local_b00._0_8_ = auVar13._0_8_;
          local_b00._8_8_ = auVar13._8_8_;
          local_b00._16_8_ = auVar12._0_8_;
          local_b00._24_8_ = auVar12._8_8_;
          local_269c = local_33c8[2];
          auVar14 = vinsertps_avx(ZEXT416(local_269c),ZEXT416(local_269c),0x10);
          auVar14 = vinsertps_avx(auVar14,ZEXT416(local_269c),0x20);
          auVar14 = vinsertps_avx(auVar14,ZEXT416(local_269c),0x30);
          auVar15 = vinsertps_avx(ZEXT416(local_269c),ZEXT416(local_269c),0x10);
          auVar15 = vinsertps_avx(auVar15,ZEXT416(local_269c),0x20);
          auVar15 = vinsertps_avx(auVar15,ZEXT416(local_269c),0x30);
          auVar103._16_16_ = auVar14;
          auVar103._0_16_ = auVar15;
          local_ac0._0_8_ = auVar15._0_8_;
          local_ac0._8_8_ = auVar15._8_8_;
          local_ac0._16_8_ = auVar14._0_8_;
          local_ac0._24_8_ = auVar14._8_8_;
          local_26a0 = local_33c8[3];
          auVar16 = vinsertps_avx(ZEXT416(local_26a0),ZEXT416(local_26a0),0x10);
          auVar16 = vinsertps_avx(auVar16,ZEXT416(local_26a0),0x20);
          auVar16 = vinsertps_avx(auVar16,ZEXT416(local_26a0),0x30);
          auVar17 = vinsertps_avx(ZEXT416(local_26a0),ZEXT416(local_26a0),0x10);
          auVar17 = vinsertps_avx(auVar17,ZEXT416(local_26a0),0x20);
          auVar17 = vinsertps_avx(auVar17,ZEXT416(local_26a0),0x30);
          auVar104._16_16_ = auVar16;
          auVar104._0_16_ = auVar17;
          local_a80._0_8_ = auVar17._0_8_;
          local_a80._8_8_ = auVar17._8_8_;
          local_a80._16_8_ = auVar16._0_8_;
          local_a80._24_8_ = auVar16._8_8_;
          local_2b18 = local_2b20 + -4;
          uVar18 = *local_2b18;
          uVar19 = local_2b20[-3];
          uVar20 = local_2b20[-2];
          uVar21 = local_2b20[-1];
          uVar22 = *local_2b20;
          uVar23 = local_2b20[1];
          uVar24 = local_2b20[2];
          uVar25 = local_2b20[3];
          local_2b28 = local_2b20 + 4;
          uVar26 = *local_2b28;
          uVar27 = local_2b20[5];
          uVar28 = local_2b20[6];
          uVar29 = local_2b20[7];
          local_2b30 = local_2b20 + 8;
          uVar30 = *local_2b30;
          uVar31 = local_2b20[9];
          uVar32 = local_2b20[10];
          uVar33 = local_2b20[0xb];
          local_2b38 = local_2b40 + -4;
          uVar34 = *local_2b38;
          uVar35 = local_2b40[-3];
          uVar36 = local_2b40[-2];
          uVar37 = local_2b40[-1];
          uVar38 = *local_2b40;
          uVar39 = local_2b40[1];
          uVar40 = local_2b40[2];
          uVar41 = local_2b40[3];
          local_2b48 = local_2b40 + 4;
          uVar42 = *local_2b48;
          uVar43 = local_2b40[5];
          uVar44 = local_2b40[6];
          uVar45 = local_2b40[7];
          local_2b50 = local_2b40 + 8;
          uVar46 = *local_2b50;
          uVar47 = local_2b40[9];
          uVar48 = local_2b40[10];
          uVar49 = local_2b40[0xb];
          local_2b58 = local_2b60 + -4;
          uVar50 = *local_2b58;
          uVar51 = local_2b60[-3];
          uVar52 = local_2b60[-2];
          uVar53 = local_2b60[-1];
          uVar54 = *local_2b60;
          uVar55 = local_2b60[1];
          uVar56 = local_2b60[2];
          uVar57 = local_2b60[3];
          local_2b68 = local_2b60 + 4;
          uVar58 = *local_2b68;
          uVar59 = local_2b60[5];
          uVar60 = local_2b60[6];
          uVar61 = local_2b60[7];
          local_2b70 = local_2b60 + 8;
          uVar62 = *local_2b70;
          uVar63 = local_2b60[9];
          uVar64 = local_2b60[10];
          uVar65 = local_2b60[0xb];
          local_2b78 = local_2b80 + -4;
          uVar66 = *local_2b78;
          uVar67 = local_2b80[-3];
          uVar68 = local_2b80[-2];
          uVar69 = local_2b80[-1];
          uVar70 = *local_2b80;
          uVar71 = local_2b80[1];
          uVar72 = local_2b80[2];
          uVar73 = local_2b80[3];
          local_2b88 = local_2b80 + 4;
          uVar74 = *local_2b88;
          uVar75 = local_2b80[5];
          uVar76 = local_2b80[6];
          uVar77 = local_2b80[7];
          local_2b90 = local_2b80 + 8;
          uVar78 = *local_2b90;
          uVar79 = local_2b80[9];
          uVar80 = local_2b80[10];
          uVar81 = local_2b80[0xb];
          local_2540._0_4_ = (float)uVar18;
          local_2540._4_4_ = (float)((ulong)uVar18 >> 0x20);
          uStack_2538._0_4_ = (float)uVar19;
          uStack_2538._4_4_ = (float)((ulong)uVar19 >> 0x20);
          uStack_2530._0_4_ = (float)uVar20;
          uStack_2530._4_4_ = (float)((ulong)uVar20 >> 0x20);
          uStack_2528._0_4_ = (float)uVar21;
          uStack_2528._4_4_ = (float)((ulong)uVar21 >> 0x20);
          local_2560._0_4_ = auVar11._0_4_;
          local_2560._4_4_ = auVar11._4_4_;
          uStack_2558._0_4_ = auVar11._8_4_;
          uStack_2558._4_4_ = auVar11._12_4_;
          uStack_2550._0_4_ = auVar10._0_4_;
          uStack_2550._4_4_ = auVar10._4_4_;
          uStack_2548._0_4_ = auVar10._8_4_;
          local_36c0 = CONCAT44(local_2540._4_4_ * local_2560._4_4_,
                                (float)local_2540 * (float)local_2560);
          uStack_36b8 = CONCAT44(uStack_2538._4_4_ * uStack_2558._4_4_,
                                 (float)uStack_2538 * (float)uStack_2558);
          uStack_36b0 = CONCAT44(uStack_2530._4_4_ * uStack_2550._4_4_,
                                 (float)uStack_2530 * (float)uStack_2550);
          uStack_36a8 = CONCAT44(uStack_2528._4_4_,(float)uStack_2528 * (float)uStack_2548);
          local_25a0 = local_b40._0_8_;
          uStack_2598 = local_b40._8_8_;
          uStack_2590 = local_b40._16_8_;
          uStack_2588 = local_b40._24_8_;
          local_2580._0_4_ = (float)uVar34;
          local_2580._4_4_ = (float)((ulong)uVar34 >> 0x20);
          uStack_2578._0_4_ = (float)uVar35;
          uStack_2578._4_4_ = (float)((ulong)uVar35 >> 0x20);
          uStack_2570._0_4_ = (float)uVar36;
          uStack_2570._4_4_ = (float)((ulong)uVar36 >> 0x20);
          uStack_2568._0_4_ = (float)uVar37;
          uStack_2568._4_4_ = (float)((ulong)uVar37 >> 0x20);
          local_36e0 = CONCAT44(local_2580._4_4_ * local_2560._4_4_,
                                (float)local_2580 * (float)local_2560);
          uStack_36d8 = CONCAT44(uStack_2578._4_4_ * uStack_2558._4_4_,
                                 (float)uStack_2578 * (float)uStack_2558);
          uStack_36d0 = CONCAT44(uStack_2570._4_4_ * uStack_2550._4_4_,
                                 (float)uStack_2570 * (float)uStack_2550);
          uStack_36c8 = CONCAT44(uStack_2568._4_4_,(float)uStack_2568 * (float)uStack_2548);
          local_25e0 = local_b40._0_8_;
          uStack_25d8 = local_b40._8_8_;
          uStack_25d0 = local_b40._16_8_;
          uStack_25c8 = local_b40._24_8_;
          local_25c0._0_4_ = (float)uVar50;
          local_25c0._4_4_ = (float)((ulong)uVar50 >> 0x20);
          uStack_25b8._0_4_ = (float)uVar51;
          uStack_25b8._4_4_ = (float)((ulong)uVar51 >> 0x20);
          uStack_25b0._0_4_ = (float)uVar52;
          uStack_25b0._4_4_ = (float)((ulong)uVar52 >> 0x20);
          uStack_25a8._0_4_ = (float)uVar53;
          uStack_25a8._4_4_ = (float)((ulong)uVar53 >> 0x20);
          local_3700 = CONCAT44(local_25c0._4_4_ * local_2560._4_4_,
                                (float)local_25c0 * (float)local_2560);
          uStack_36f8 = CONCAT44(uStack_25b8._4_4_ * uStack_2558._4_4_,
                                 (float)uStack_25b8 * (float)uStack_2558);
          uStack_36f0 = CONCAT44(uStack_25b0._4_4_ * uStack_2550._4_4_,
                                 (float)uStack_25b0 * (float)uStack_2550);
          uStack_36e8 = CONCAT44(uStack_25a8._4_4_,(float)uStack_25a8 * (float)uStack_2548);
          local_2620 = local_b40._0_8_;
          uStack_2618 = local_b40._8_8_;
          uStack_2610 = local_b40._16_8_;
          uStack_2608 = local_b40._24_8_;
          local_2600._0_4_ = (float)uVar66;
          local_2600._4_4_ = (float)((ulong)uVar66 >> 0x20);
          uStack_25f8._0_4_ = (float)uVar67;
          uStack_25f8._4_4_ = (float)((ulong)uVar67 >> 0x20);
          uStack_25f0._0_4_ = (float)uVar68;
          uStack_25f0._4_4_ = (float)((ulong)uVar68 >> 0x20);
          uStack_25e8._0_4_ = (float)uVar69;
          uStack_25e8._4_4_ = (float)((ulong)uVar69 >> 0x20);
          local_3720 = CONCAT44(local_2600._4_4_ * local_2560._4_4_,
                                (float)local_2600 * (float)local_2560);
          uStack_3718 = CONCAT44(uStack_25f8._4_4_ * uStack_2558._4_4_,
                                 (float)uStack_25f8 * (float)uStack_2558);
          uStack_3710 = CONCAT44(uStack_25f0._4_4_ * uStack_2550._4_4_,
                                 (float)uStack_25f0 * (float)uStack_2550);
          uStack_3708 = CONCAT44(uStack_25e8._4_4_,(float)uStack_25e8 * (float)uStack_2548);
          local_1ac0 = local_b00._0_8_;
          uStack_1ab8 = local_b00._8_8_;
          uStack_1ab0 = local_b00._16_8_;
          uStack_1aa8 = local_b00._24_8_;
          local_1ae0 = local_36c0;
          uStack_1ad8 = uStack_36b8;
          uStack_1ad0 = uStack_36b0;
          uStack_1ac8 = uStack_36a8;
          local_1aa0._0_4_ = (float)uVar22;
          local_1a60 = (float)local_1aa0;
          local_1aa0._4_4_ = (float)((ulong)uVar22 >> 0x20);
          fStack_1a5c = local_1aa0._4_4_;
          uStack_1a98._0_4_ = (float)uVar23;
          fStack_1a58 = (float)uStack_1a98;
          uStack_1a98._4_4_ = (float)((ulong)uVar23 >> 0x20);
          fStack_1a54 = uStack_1a98._4_4_;
          uStack_1a90._0_4_ = (float)uVar24;
          fStack_1a50 = (float)uStack_1a90;
          uStack_1a90._4_4_ = (float)((ulong)uVar24 >> 0x20);
          fStack_1a4c = uStack_1a90._4_4_;
          uStack_1a88._0_4_ = (float)uVar25;
          fStack_1a48 = (float)uStack_1a88;
          uStack_1a88._4_4_ = (float)((ulong)uVar25 >> 0x20);
          fStack_1a44 = uStack_1a88._4_4_;
          local_1a80._0_4_ = auVar13._0_4_;
          local_1a80._4_4_ = auVar13._4_4_;
          uStack_1a78._0_4_ = auVar13._8_4_;
          uStack_1a78._4_4_ = auVar13._12_4_;
          uStack_1a70._0_4_ = auVar12._0_4_;
          uStack_1a70._4_4_ = auVar12._4_4_;
          uStack_1a68._0_4_ = auVar12._8_4_;
          local_4a0 = (float)local_1aa0 * (float)local_1a80;
          fStack_49c = local_1aa0._4_4_ * local_1a80._4_4_;
          fStack_498 = (float)uStack_1a98 * (float)uStack_1a78;
          fStack_494 = uStack_1a98._4_4_ * uStack_1a78._4_4_;
          fStack_490 = (float)uStack_1a90 * (float)uStack_1a70;
          fStack_48c = uStack_1a90._4_4_ * uStack_1a70._4_4_;
          fStack_488 = (float)uStack_1a88 * (float)uStack_1a68;
          local_4c0 = local_36c0;
          uStack_4b8 = uStack_36b8;
          uStack_4b0 = uStack_36b0;
          uStack_4a8 = uStack_36a8;
          fVar88 = local_4a0 + (float)local_2540 * (float)local_2560;
          fVar116 = fStack_49c + local_2540._4_4_ * local_2560._4_4_;
          fVar113 = fStack_498 + (float)uStack_2538 * (float)uStack_2558;
          fVar126 = fStack_494 + uStack_2538._4_4_ * uStack_2558._4_4_;
          fVar120 = fStack_490 + (float)uStack_2530 * (float)uStack_2550;
          fVar130 = fStack_48c + uStack_2530._4_4_ * uStack_2550._4_4_;
          fVar131 = fStack_488 + (float)uStack_2528 * (float)uStack_2548;
          local_1d60 = CONCAT44(fVar116,fVar88);
          uStack_1d58 = CONCAT44(fVar126,fVar113);
          uStack_1d50 = CONCAT44(fVar130,fVar120);
          uStack_1d48 = CONCAT44(uStack_1a88._4_4_ + uStack_2528._4_4_,fVar131);
          local_1b60 = local_b00._0_8_;
          uStack_1b58 = local_b00._8_8_;
          uStack_1b50 = local_b00._16_8_;
          uStack_1b48 = local_b00._24_8_;
          local_1b80 = local_36e0;
          uStack_1b78 = uStack_36d8;
          uStack_1b70 = uStack_36d0;
          uStack_1b68 = uStack_36c8;
          local_1b40._0_4_ = (float)uVar38;
          local_1b00 = (float)local_1b40;
          local_1b40._4_4_ = (float)((ulong)uVar38 >> 0x20);
          fStack_1afc = local_1b40._4_4_;
          uStack_1b38._0_4_ = (float)uVar39;
          fStack_1af8 = (float)uStack_1b38;
          uStack_1b38._4_4_ = (float)((ulong)uVar39 >> 0x20);
          fStack_1af4 = uStack_1b38._4_4_;
          uStack_1b30._0_4_ = (float)uVar40;
          fStack_1af0 = (float)uStack_1b30;
          uStack_1b30._4_4_ = (float)((ulong)uVar40 >> 0x20);
          fStack_1aec = uStack_1b30._4_4_;
          uStack_1b28._0_4_ = (float)uVar41;
          fStack_1ae8 = (float)uStack_1b28;
          uStack_1b28._4_4_ = (float)((ulong)uVar41 >> 0x20);
          fStack_1ae4 = uStack_1b28._4_4_;
          local_1b20 = local_b00._0_8_;
          uStack_1b18 = local_b00._8_8_;
          uStack_1b10 = local_b00._16_8_;
          uStack_1b08 = local_b00._24_8_;
          local_460 = (float)local_1b40 * (float)local_1a80;
          fStack_45c = local_1b40._4_4_ * local_1a80._4_4_;
          fStack_458 = (float)uStack_1b38 * (float)uStack_1a78;
          fStack_454 = uStack_1b38._4_4_ * uStack_1a78._4_4_;
          fStack_450 = (float)uStack_1b30 * (float)uStack_1a70;
          fStack_44c = uStack_1b30._4_4_ * uStack_1a70._4_4_;
          fStack_448 = (float)uStack_1b28 * (float)uStack_1a68;
          local_480 = local_36e0;
          uStack_478 = uStack_36d8;
          uStack_470 = uStack_36d0;
          uStack_468 = uStack_36c8;
          fVar109 = local_460 + (float)local_2580 * (float)local_2560;
          fVar125 = fStack_45c + local_2580._4_4_ * local_2560._4_4_;
          fVar114 = fStack_458 + (float)uStack_2578 * (float)uStack_2558;
          fVar127 = fStack_454 + uStack_2578._4_4_ * uStack_2558._4_4_;
          fVar121 = fStack_450 + (float)uStack_2570 * (float)uStack_2550;
          fVar122 = fStack_44c + uStack_2570._4_4_ * uStack_2550._4_4_;
          fVar132 = fStack_448 + (float)uStack_2568 * (float)uStack_2548;
          local_1e00 = CONCAT44(fVar125,fVar109);
          uStack_1df8 = CONCAT44(fVar127,fVar114);
          uStack_1df0 = CONCAT44(fVar122,fVar121);
          uStack_1de8 = CONCAT44(uStack_1b28._4_4_ + uStack_2568._4_4_,fVar132);
          local_1c00 = local_b00._0_8_;
          uStack_1bf8 = local_b00._8_8_;
          uStack_1bf0 = local_b00._16_8_;
          uStack_1be8 = local_b00._24_8_;
          local_1c20 = local_3700;
          uStack_1c18 = uStack_36f8;
          uStack_1c10 = uStack_36f0;
          uStack_1c08 = uStack_36e8;
          local_1be0._0_4_ = (float)uVar54;
          local_1ba0 = (float)local_1be0;
          local_1be0._4_4_ = (float)((ulong)uVar54 >> 0x20);
          fStack_1b9c = local_1be0._4_4_;
          uStack_1bd8._0_4_ = (float)uVar55;
          fStack_1b98 = (float)uStack_1bd8;
          uStack_1bd8._4_4_ = (float)((ulong)uVar55 >> 0x20);
          fStack_1b94 = uStack_1bd8._4_4_;
          uStack_1bd0._0_4_ = (float)uVar56;
          fStack_1b90 = (float)uStack_1bd0;
          uStack_1bd0._4_4_ = (float)((ulong)uVar56 >> 0x20);
          fStack_1b8c = uStack_1bd0._4_4_;
          uStack_1bc8._0_4_ = (float)uVar57;
          fStack_1b88 = (float)uStack_1bc8;
          uStack_1bc8._4_4_ = (float)((ulong)uVar57 >> 0x20);
          fStack_1b84 = uStack_1bc8._4_4_;
          local_1bc0 = local_b00._0_8_;
          uStack_1bb8 = local_b00._8_8_;
          uStack_1bb0 = local_b00._16_8_;
          uStack_1ba8 = local_b00._24_8_;
          local_420 = (float)local_1be0 * (float)local_1a80;
          fStack_41c = local_1be0._4_4_ * local_1a80._4_4_;
          fStack_418 = (float)uStack_1bd8 * (float)uStack_1a78;
          fStack_414 = uStack_1bd8._4_4_ * uStack_1a78._4_4_;
          fStack_410 = (float)uStack_1bd0 * (float)uStack_1a70;
          fStack_40c = uStack_1bd0._4_4_ * uStack_1a70._4_4_;
          fStack_408 = (float)uStack_1bc8 * (float)uStack_1a68;
          local_440 = local_3700;
          uStack_438 = uStack_36f8;
          uStack_430 = uStack_36f0;
          uStack_428 = uStack_36e8;
          fVar110 = local_420 + (float)local_25c0 * (float)local_2560;
          fVar135 = fStack_41c + local_25c0._4_4_ * local_2560._4_4_;
          fVar117 = fStack_418 + (float)uStack_25b8 * (float)uStack_2558;
          fVar115 = fStack_414 + uStack_25b8._4_4_ * uStack_2558._4_4_;
          fVar128 = fStack_410 + (float)uStack_25b0 * (float)uStack_2550;
          fVar123 = fStack_40c + uStack_25b0._4_4_ * uStack_2550._4_4_;
          fVar133 = fStack_408 + (float)uStack_25a8 * (float)uStack_2548;
          local_1ea0 = CONCAT44(fVar135,fVar110);
          uStack_1e98 = CONCAT44(fVar115,fVar117);
          uStack_1e90 = CONCAT44(fVar123,fVar128);
          uStack_1e88 = CONCAT44(uStack_1bc8._4_4_ + uStack_25a8._4_4_,fVar133);
          local_1ca0 = local_b00._0_8_;
          uStack_1c98 = local_b00._8_8_;
          uStack_1c90 = local_b00._16_8_;
          uStack_1c88 = local_b00._24_8_;
          local_1cc0 = local_3720;
          uStack_1cb8 = uStack_3718;
          uStack_1cb0 = uStack_3710;
          uStack_1ca8 = uStack_3708;
          local_1c80._0_4_ = (float)uVar70;
          local_1c40 = (float)local_1c80;
          local_1c80._4_4_ = (float)((ulong)uVar70 >> 0x20);
          fStack_1c3c = local_1c80._4_4_;
          uStack_1c78._0_4_ = (float)uVar71;
          fStack_1c38 = (float)uStack_1c78;
          uStack_1c78._4_4_ = (float)((ulong)uVar71 >> 0x20);
          fStack_1c34 = uStack_1c78._4_4_;
          uStack_1c70._0_4_ = (float)uVar72;
          fStack_1c30 = (float)uStack_1c70;
          uStack_1c70._4_4_ = (float)((ulong)uVar72 >> 0x20);
          fStack_1c2c = uStack_1c70._4_4_;
          uStack_1c68._0_4_ = (float)uVar73;
          fStack_1c28 = (float)uStack_1c68;
          uStack_1c68._4_4_ = (float)((ulong)uVar73 >> 0x20);
          fStack_1c24 = uStack_1c68._4_4_;
          local_1c60 = local_b00._0_8_;
          uStack_1c58 = local_b00._8_8_;
          uStack_1c50 = local_b00._16_8_;
          uStack_1c48 = local_b00._24_8_;
          local_3e0 = (float)local_1c80 * (float)local_1a80;
          fStack_3dc = local_1c80._4_4_ * local_1a80._4_4_;
          fStack_3d8 = (float)uStack_1c78 * (float)uStack_1a78;
          fStack_3d4 = uStack_1c78._4_4_ * uStack_1a78._4_4_;
          fStack_3d0 = (float)uStack_1c70 * (float)uStack_1a70;
          fStack_3cc = uStack_1c70._4_4_ * uStack_1a70._4_4_;
          fStack_3c8 = (float)uStack_1c68 * (float)uStack_1a68;
          local_400 = local_3720;
          uStack_3f8 = uStack_3718;
          uStack_3f0 = uStack_3710;
          uStack_3e8 = uStack_3708;
          fVar112 = local_3e0 + (float)local_2600 * (float)local_2560;
          fVar111 = fStack_3dc + local_2600._4_4_ * local_2560._4_4_;
          fVar118 = fStack_3d8 + (float)uStack_25f8 * (float)uStack_2558;
          fVar119 = fStack_3d4 + uStack_25f8._4_4_ * uStack_2558._4_4_;
          fVar129 = fStack_3d0 + (float)uStack_25f0 * (float)uStack_2550;
          fVar124 = fStack_3cc + uStack_25f0._4_4_ * uStack_2550._4_4_;
          fVar134 = fStack_3c8 + (float)uStack_25e8 * (float)uStack_2548;
          local_1f40 = CONCAT44(fVar111,fVar112);
          uStack_1f38 = CONCAT44(fVar119,fVar118);
          uStack_1f30 = CONCAT44(fVar124,fVar129);
          uStack_1f28 = CONCAT44(uStack_1c68._4_4_ + uStack_25e8._4_4_,fVar134);
          local_1d40 = local_ac0._0_8_;
          uStack_1d38 = local_ac0._8_8_;
          uStack_1d30 = local_ac0._16_8_;
          uStack_1d28 = local_ac0._24_8_;
          local_1d20._0_4_ = (float)uVar26;
          local_1ce0 = (float)local_1d20;
          local_1d20._4_4_ = (float)((ulong)uVar26 >> 0x20);
          fStack_1cdc = local_1d20._4_4_;
          uStack_1d18._0_4_ = (float)uVar27;
          fStack_1cd8 = (float)uStack_1d18;
          uStack_1d18._4_4_ = (float)((ulong)uVar27 >> 0x20);
          fStack_1cd4 = uStack_1d18._4_4_;
          uStack_1d10._0_4_ = (float)uVar28;
          fStack_1cd0 = (float)uStack_1d10;
          uStack_1d10._4_4_ = (float)((ulong)uVar28 >> 0x20);
          fStack_1ccc = uStack_1d10._4_4_;
          uStack_1d08._0_4_ = (float)uVar29;
          fStack_1cc8 = (float)uStack_1d08;
          uStack_1d08._4_4_ = (float)((ulong)uVar29 >> 0x20);
          fStack_1cc4 = uStack_1d08._4_4_;
          local_1d00._0_4_ = auVar15._0_4_;
          local_1d00._4_4_ = auVar15._4_4_;
          uStack_1cf8._0_4_ = auVar15._8_4_;
          uStack_1cf8._4_4_ = auVar15._12_4_;
          uStack_1cf0._0_4_ = auVar14._0_4_;
          uStack_1cf0._4_4_ = auVar14._4_4_;
          uStack_1ce8._0_4_ = auVar14._8_4_;
          local_3a0 = (float)local_1d20 * (float)local_1d00;
          fStack_39c = local_1d20._4_4_ * local_1d00._4_4_;
          fStack_398 = (float)uStack_1d18 * (float)uStack_1cf8;
          fStack_394 = uStack_1d18._4_4_ * uStack_1cf8._4_4_;
          fStack_390 = (float)uStack_1d10 * (float)uStack_1cf0;
          fStack_38c = uStack_1d10._4_4_ * uStack_1cf0._4_4_;
          fStack_388 = (float)uStack_1d08 * (float)uStack_1ce8;
          fVar88 = local_3a0 + fVar88;
          fVar116 = fStack_39c + fVar116;
          fVar113 = fStack_398 + fVar113;
          fVar126 = fStack_394 + fVar126;
          fVar120 = fStack_390 + fVar120;
          fVar130 = fStack_38c + fVar130;
          fVar131 = fStack_388 + fVar131;
          uStack_1d08._4_4_ = uStack_1d08._4_4_ + uStack_1a88._4_4_ + uStack_2528._4_4_;
          local_1fe0 = CONCAT44(fVar116,fVar88);
          uStack_1fd8 = CONCAT44(fVar126,fVar113);
          uStack_1fd0 = CONCAT44(fVar130,fVar120);
          uStack_1fc8 = CONCAT44(uStack_1d08._4_4_,fVar131);
          local_1de0 = local_ac0._0_8_;
          uStack_1dd8 = local_ac0._8_8_;
          uStack_1dd0 = local_ac0._16_8_;
          uStack_1dc8 = local_ac0._24_8_;
          local_1dc0._0_4_ = (float)uVar42;
          local_1d80 = (float)local_1dc0;
          local_1dc0._4_4_ = (float)((ulong)uVar42 >> 0x20);
          fStack_1d7c = local_1dc0._4_4_;
          uStack_1db8._0_4_ = (float)uVar43;
          fStack_1d78 = (float)uStack_1db8;
          uStack_1db8._4_4_ = (float)((ulong)uVar43 >> 0x20);
          fStack_1d74 = uStack_1db8._4_4_;
          uStack_1db0._0_4_ = (float)uVar44;
          fStack_1d70 = (float)uStack_1db0;
          uStack_1db0._4_4_ = (float)((ulong)uVar44 >> 0x20);
          fStack_1d6c = uStack_1db0._4_4_;
          uStack_1da8._0_4_ = (float)uVar45;
          fStack_1d68 = (float)uStack_1da8;
          uStack_1da8._4_4_ = (float)((ulong)uVar45 >> 0x20);
          fStack_1d64 = uStack_1da8._4_4_;
          local_1da0 = local_ac0._0_8_;
          uStack_1d98 = local_ac0._8_8_;
          uStack_1d90 = local_ac0._16_8_;
          uStack_1d88 = local_ac0._24_8_;
          local_360 = (float)local_1dc0 * (float)local_1d00;
          fStack_35c = local_1dc0._4_4_ * local_1d00._4_4_;
          fStack_358 = (float)uStack_1db8 * (float)uStack_1cf8;
          fStack_354 = uStack_1db8._4_4_ * uStack_1cf8._4_4_;
          fStack_350 = (float)uStack_1db0 * (float)uStack_1cf0;
          fStack_34c = uStack_1db0._4_4_ * uStack_1cf0._4_4_;
          fStack_348 = (float)uStack_1da8 * (float)uStack_1ce8;
          fVar109 = local_360 + fVar109;
          fVar125 = fStack_35c + fVar125;
          fVar114 = fStack_358 + fVar114;
          fVar127 = fStack_354 + fVar127;
          fVar121 = fStack_350 + fVar121;
          fVar122 = fStack_34c + fVar122;
          fVar132 = fStack_348 + fVar132;
          uStack_1da8._4_4_ = uStack_1da8._4_4_ + uStack_1b28._4_4_ + uStack_2568._4_4_;
          local_2080 = CONCAT44(fVar125,fVar109);
          uStack_2078 = CONCAT44(fVar127,fVar114);
          uStack_2070 = CONCAT44(fVar122,fVar121);
          uStack_2068 = CONCAT44(uStack_1da8._4_4_,fVar132);
          local_1e80 = local_ac0._0_8_;
          uStack_1e78 = local_ac0._8_8_;
          uStack_1e70 = local_ac0._16_8_;
          uStack_1e68 = local_ac0._24_8_;
          local_1e60._0_4_ = (float)uVar58;
          local_1e20 = (float)local_1e60;
          local_1e60._4_4_ = (float)((ulong)uVar58 >> 0x20);
          fStack_1e1c = local_1e60._4_4_;
          uStack_1e58._0_4_ = (float)uVar59;
          fStack_1e18 = (float)uStack_1e58;
          uStack_1e58._4_4_ = (float)((ulong)uVar59 >> 0x20);
          fStack_1e14 = uStack_1e58._4_4_;
          uStack_1e50._0_4_ = (float)uVar60;
          fStack_1e10 = (float)uStack_1e50;
          uStack_1e50._4_4_ = (float)((ulong)uVar60 >> 0x20);
          fStack_1e0c = uStack_1e50._4_4_;
          uStack_1e48._0_4_ = (float)uVar61;
          fStack_1e08 = (float)uStack_1e48;
          uStack_1e48._4_4_ = (float)((ulong)uVar61 >> 0x20);
          fStack_1e04 = uStack_1e48._4_4_;
          local_1e40 = local_ac0._0_8_;
          uStack_1e38 = local_ac0._8_8_;
          uStack_1e30 = local_ac0._16_8_;
          uStack_1e28 = local_ac0._24_8_;
          local_320 = (float)local_1e60 * (float)local_1d00;
          fStack_31c = local_1e60._4_4_ * local_1d00._4_4_;
          fStack_318 = (float)uStack_1e58 * (float)uStack_1cf8;
          fStack_314 = uStack_1e58._4_4_ * uStack_1cf8._4_4_;
          fStack_310 = (float)uStack_1e50 * (float)uStack_1cf0;
          fStack_30c = uStack_1e50._4_4_ * uStack_1cf0._4_4_;
          fStack_308 = (float)uStack_1e48 * (float)uStack_1ce8;
          fVar110 = local_320 + fVar110;
          fVar135 = fStack_31c + fVar135;
          fVar117 = fStack_318 + fVar117;
          fVar115 = fStack_314 + fVar115;
          fVar128 = fStack_310 + fVar128;
          fVar123 = fStack_30c + fVar123;
          fVar133 = fStack_308 + fVar133;
          uStack_1e48._4_4_ = uStack_1e48._4_4_ + uStack_1bc8._4_4_ + uStack_25a8._4_4_;
          local_2120 = CONCAT44(fVar135,fVar110);
          uStack_2118 = CONCAT44(fVar115,fVar117);
          uStack_2110 = CONCAT44(fVar123,fVar128);
          uStack_2108 = CONCAT44(uStack_1e48._4_4_,fVar133);
          local_1f20 = local_ac0._0_8_;
          uStack_1f18 = local_ac0._8_8_;
          uStack_1f10 = local_ac0._16_8_;
          uStack_1f08 = local_ac0._24_8_;
          local_1f00._0_4_ = (float)uVar74;
          local_1ec0 = (float)local_1f00;
          local_1f00._4_4_ = (float)((ulong)uVar74 >> 0x20);
          fStack_1ebc = local_1f00._4_4_;
          uStack_1ef8._0_4_ = (float)uVar75;
          fStack_1eb8 = (float)uStack_1ef8;
          uStack_1ef8._4_4_ = (float)((ulong)uVar75 >> 0x20);
          fStack_1eb4 = uStack_1ef8._4_4_;
          uStack_1ef0._0_4_ = (float)uVar76;
          fStack_1eb0 = (float)uStack_1ef0;
          uStack_1ef0._4_4_ = (float)((ulong)uVar76 >> 0x20);
          fStack_1eac = uStack_1ef0._4_4_;
          uStack_1ee8._0_4_ = (float)uVar77;
          fStack_1ea8 = (float)uStack_1ee8;
          uStack_1ee8._4_4_ = (float)((ulong)uVar77 >> 0x20);
          fStack_1ea4 = uStack_1ee8._4_4_;
          local_1ee0 = local_ac0._0_8_;
          uStack_1ed8 = local_ac0._8_8_;
          uStack_1ed0 = local_ac0._16_8_;
          uStack_1ec8 = local_ac0._24_8_;
          local_2e0 = (float)local_1f00 * (float)local_1d00;
          fStack_2dc = local_1f00._4_4_ * local_1d00._4_4_;
          fStack_2d8 = (float)uStack_1ef8 * (float)uStack_1cf8;
          fStack_2d4 = uStack_1ef8._4_4_ * uStack_1cf8._4_4_;
          fStack_2d0 = (float)uStack_1ef0 * (float)uStack_1cf0;
          fStack_2cc = uStack_1ef0._4_4_ * uStack_1cf0._4_4_;
          fStack_2c8 = (float)uStack_1ee8 * (float)uStack_1ce8;
          fVar112 = local_2e0 + fVar112;
          fVar111 = fStack_2dc + fVar111;
          fVar118 = fStack_2d8 + fVar118;
          fVar119 = fStack_2d4 + fVar119;
          fVar129 = fStack_2d0 + fVar129;
          fVar124 = fStack_2cc + fVar124;
          fVar134 = fStack_2c8 + fVar134;
          uStack_1ee8._4_4_ = uStack_1ee8._4_4_ + uStack_1c68._4_4_ + uStack_25e8._4_4_;
          local_21c0 = CONCAT44(fVar111,fVar112);
          uStack_21b8 = CONCAT44(fVar119,fVar118);
          uStack_21b0 = CONCAT44(fVar124,fVar129);
          uStack_21a8 = CONCAT44(uStack_1ee8._4_4_,fVar134);
          local_1fc0 = local_a80._0_8_;
          uStack_1fb8 = local_a80._8_8_;
          uStack_1fb0 = local_a80._16_8_;
          uStack_1fa8 = local_a80._24_8_;
          local_1fa0._0_4_ = (float)uVar30;
          local_1f60 = (float)local_1fa0;
          local_1fa0._4_4_ = (float)((ulong)uVar30 >> 0x20);
          fStack_1f5c = local_1fa0._4_4_;
          uStack_1f98._0_4_ = (float)uVar31;
          fStack_1f58 = (float)uStack_1f98;
          uStack_1f98._4_4_ = (float)((ulong)uVar31 >> 0x20);
          fStack_1f54 = uStack_1f98._4_4_;
          uStack_1f90._0_4_ = (float)uVar32;
          fStack_1f50 = (float)uStack_1f90;
          uStack_1f90._4_4_ = (float)((ulong)uVar32 >> 0x20);
          fStack_1f4c = uStack_1f90._4_4_;
          uStack_1f88._0_4_ = (float)uVar33;
          fStack_1f48 = (float)uStack_1f88;
          uStack_1f88._4_4_ = (float)((ulong)uVar33 >> 0x20);
          fStack_1f44 = uStack_1f88._4_4_;
          local_1f80._0_4_ = auVar17._0_4_;
          local_1f80._4_4_ = auVar17._4_4_;
          uStack_1f78._0_4_ = auVar17._8_4_;
          uStack_1f78._4_4_ = auVar17._12_4_;
          uStack_1f70._0_4_ = auVar16._0_4_;
          uStack_1f70._4_4_ = auVar16._4_4_;
          uStack_1f68._0_4_ = auVar16._8_4_;
          local_2a0 = (float)local_1fa0 * (float)local_1f80;
          fStack_29c = local_1fa0._4_4_ * local_1f80._4_4_;
          fStack_298 = (float)uStack_1f98 * (float)uStack_1f78;
          fStack_294 = uStack_1f98._4_4_ * uStack_1f78._4_4_;
          fStack_290 = (float)uStack_1f90 * (float)uStack_1f70;
          fStack_28c = uStack_1f90._4_4_ * uStack_1f70._4_4_;
          fStack_288 = (float)uStack_1f88 * (float)uStack_1f68;
          local_2860 = CONCAT44(fStack_29c + fVar116,local_2a0 + fVar88);
          uStack_2858 = CONCAT44(fStack_294 + fVar126,fStack_298 + fVar113);
          uStack_2850 = CONCAT44(fStack_28c + fVar130,fStack_290 + fVar120);
          uStack_2848 = CONCAT44(uStack_1f88._4_4_ + uStack_1d08._4_4_,fStack_288 + fVar131);
          local_2060 = local_a80._0_8_;
          uStack_2058 = local_a80._8_8_;
          uStack_2050 = local_a80._16_8_;
          uStack_2048 = local_a80._24_8_;
          local_2040._0_4_ = (float)uVar46;
          local_2000 = (float)local_2040;
          local_2040._4_4_ = (float)((ulong)uVar46 >> 0x20);
          fStack_1ffc = local_2040._4_4_;
          uStack_2038._0_4_ = (float)uVar47;
          fStack_1ff8 = (float)uStack_2038;
          uStack_2038._4_4_ = (float)((ulong)uVar47 >> 0x20);
          fStack_1ff4 = uStack_2038._4_4_;
          uStack_2030._0_4_ = (float)uVar48;
          fStack_1ff0 = (float)uStack_2030;
          uStack_2030._4_4_ = (float)((ulong)uVar48 >> 0x20);
          fStack_1fec = uStack_2030._4_4_;
          uStack_2028._0_4_ = (float)uVar49;
          fStack_1fe8 = (float)uStack_2028;
          uStack_2028._4_4_ = (float)((ulong)uVar49 >> 0x20);
          fStack_1fe4 = uStack_2028._4_4_;
          local_2020 = local_a80._0_8_;
          uStack_2018 = local_a80._8_8_;
          uStack_2010 = local_a80._16_8_;
          uStack_2008 = local_a80._24_8_;
          local_260 = (float)local_2040 * (float)local_1f80;
          fStack_25c = local_2040._4_4_ * local_1f80._4_4_;
          fStack_258 = (float)uStack_2038 * (float)uStack_1f78;
          fStack_254 = uStack_2038._4_4_ * uStack_1f78._4_4_;
          fStack_250 = (float)uStack_2030 * (float)uStack_1f70;
          fStack_24c = uStack_2030._4_4_ * uStack_1f70._4_4_;
          fStack_248 = (float)uStack_2028 * (float)uStack_1f68;
          local_28a0 = CONCAT44(fStack_25c + fVar125,local_260 + fVar109);
          uStack_2898 = CONCAT44(fStack_254 + fVar127,fStack_258 + fVar114);
          uStack_2890 = CONCAT44(fStack_24c + fVar122,fStack_250 + fVar121);
          uStack_2888 = CONCAT44(uStack_2028._4_4_ + uStack_1da8._4_4_,fStack_248 + fVar132);
          local_2100 = local_a80._0_8_;
          uStack_20f8 = local_a80._8_8_;
          uStack_20f0 = local_a80._16_8_;
          uStack_20e8 = local_a80._24_8_;
          local_20e0._0_4_ = (float)uVar62;
          local_20a0 = (float)local_20e0;
          local_20e0._4_4_ = (float)((ulong)uVar62 >> 0x20);
          fStack_209c = local_20e0._4_4_;
          uStack_20d8._0_4_ = (float)uVar63;
          fStack_2098 = (float)uStack_20d8;
          uStack_20d8._4_4_ = (float)((ulong)uVar63 >> 0x20);
          fStack_2094 = uStack_20d8._4_4_;
          uStack_20d0._0_4_ = (float)uVar64;
          fStack_2090 = (float)uStack_20d0;
          uStack_20d0._4_4_ = (float)((ulong)uVar64 >> 0x20);
          fStack_208c = uStack_20d0._4_4_;
          uStack_20c8._0_4_ = (float)uVar65;
          fStack_2088 = (float)uStack_20c8;
          uStack_20c8._4_4_ = (float)((ulong)uVar65 >> 0x20);
          fStack_2084 = uStack_20c8._4_4_;
          local_20c0 = local_a80._0_8_;
          uStack_20b8 = local_a80._8_8_;
          uStack_20b0 = local_a80._16_8_;
          uStack_20a8 = local_a80._24_8_;
          local_220 = (float)local_20e0 * (float)local_1f80;
          fStack_21c = local_20e0._4_4_ * local_1f80._4_4_;
          fStack_218 = (float)uStack_20d8 * (float)uStack_1f78;
          fStack_214 = uStack_20d8._4_4_ * uStack_1f78._4_4_;
          fStack_210 = (float)uStack_20d0 * (float)uStack_1f70;
          fStack_20c = uStack_20d0._4_4_ * uStack_1f70._4_4_;
          fStack_208 = (float)uStack_20c8 * (float)uStack_1f68;
          local_28e0 = CONCAT44(fStack_21c + fVar135,local_220 + fVar110);
          uStack_28d8 = CONCAT44(fStack_214 + fVar115,fStack_218 + fVar117);
          uStack_28d0 = CONCAT44(fStack_20c + fVar123,fStack_210 + fVar128);
          uStack_28c8 = CONCAT44(uStack_20c8._4_4_ + uStack_1e48._4_4_,fStack_208 + fVar133);
          local_21a0 = local_a80._0_8_;
          uStack_2198 = local_a80._8_8_;
          uStack_2190 = local_a80._16_8_;
          uStack_2188 = local_a80._24_8_;
          local_2180._0_4_ = (float)uVar78;
          local_2140 = (float)local_2180;
          local_2180._4_4_ = (float)((ulong)uVar78 >> 0x20);
          fStack_213c = local_2180._4_4_;
          uStack_2178._0_4_ = (float)uVar79;
          fStack_2138 = (float)uStack_2178;
          uStack_2178._4_4_ = (float)((ulong)uVar79 >> 0x20);
          fStack_2134 = uStack_2178._4_4_;
          uStack_2170._0_4_ = (float)uVar80;
          fStack_2130 = (float)uStack_2170;
          uStack_2170._4_4_ = (float)((ulong)uVar80 >> 0x20);
          fStack_212c = uStack_2170._4_4_;
          uStack_2168._0_4_ = (float)uVar81;
          fStack_2128 = (float)uStack_2168;
          uStack_2168._4_4_ = (float)((ulong)uVar81 >> 0x20);
          fStack_2124 = uStack_2168._4_4_;
          local_2160 = local_a80._0_8_;
          uStack_2158 = local_a80._8_8_;
          uStack_2150 = local_a80._16_8_;
          uStack_2148 = local_a80._24_8_;
          local_1e0 = (float)local_2180 * (float)local_1f80;
          fStack_1dc = local_2180._4_4_ * local_1f80._4_4_;
          fStack_1d8 = (float)uStack_2178 * (float)uStack_1f78;
          fStack_1d4 = uStack_2178._4_4_ * uStack_1f78._4_4_;
          fStack_1d0 = (float)uStack_2170 * (float)uStack_1f70;
          fStack_1cc = uStack_2170._4_4_ * uStack_1f70._4_4_;
          fStack_1c8 = (float)uStack_2168 * (float)uStack_1f68;
          local_2920 = CONCAT44(fStack_1dc + fVar111,local_1e0 + fVar112);
          uStack_2918 = CONCAT44(fStack_1d4 + fVar119,fStack_1d8 + fVar118);
          uStack_2910 = CONCAT44(fStack_1cc + fVar124,fStack_1d0 + fVar129);
          uStack_2908 = CONCAT44(uStack_2168._4_4_ + uStack_1ee8._4_4_,fStack_1c8 + fVar134);
          local_2828 = (undefined8 *)((long)local_2d20 + (long)(local_33ec << 3) * 4);
          *local_2828 = local_2860;
          local_2828[1] = uStack_2858;
          local_2828[2] = uStack_2850;
          local_2828[3] = uStack_2848;
          local_2868 = (undefined8 *)((long)local_2d28 + (long)(local_33ec << 3) * 4);
          *local_2868 = local_28a0;
          local_2868[1] = uStack_2898;
          local_2868[2] = uStack_2890;
          local_2868[3] = uStack_2888;
          local_28a8 = (undefined8 *)((long)local_2d30 + (long)(local_33ec << 3) * 4);
          *local_28a8 = local_28e0;
          local_28a8[1] = uStack_28d8;
          local_28a8[2] = uStack_28d0;
          local_28a8[3] = uStack_28c8;
          local_28e8 = (undefined8 *)((long)local_2d38 + (long)(local_33ec << 3) * 4);
          *local_28e8 = local_2920;
          local_28e8[1] = uStack_2918;
          local_28e8[2] = uStack_2910;
          local_28e8[3] = uStack_2908;
          local_33c8 = local_33c8 + 4;
          local_2600 = uVar66;
          uStack_25f8 = uVar67;
          uStack_25f0 = uVar68;
          uStack_25e8 = uVar69;
          local_25c0 = uVar50;
          uStack_25b8 = uVar51;
          uStack_25b0 = uVar52;
          uStack_25a8 = uVar53;
          local_2580 = uVar34;
          uStack_2578 = uVar35;
          uStack_2570 = uVar36;
          uStack_2568 = uVar37;
          local_2560 = local_b40._0_8_;
          uStack_2558 = local_b40._8_8_;
          uStack_2550 = local_b40._16_8_;
          uStack_2548 = local_b40._24_8_;
          local_2540 = uVar18;
          uStack_2538 = uVar19;
          uStack_2530 = uVar20;
          uStack_2528 = uVar21;
          local_2180 = uVar78;
          uStack_2178 = uVar79;
          uStack_2170 = uVar80;
          uStack_2168 = uVar81;
          local_20e0 = uVar62;
          uStack_20d8 = uVar63;
          uStack_20d0 = uVar64;
          uStack_20c8 = uVar65;
          local_2040 = uVar46;
          uStack_2038 = uVar47;
          uStack_2030 = uVar48;
          uStack_2028 = uVar49;
          local_1fa0 = uVar30;
          uStack_1f98 = uVar31;
          uStack_1f90 = uVar32;
          uStack_1f88 = uVar33;
          local_1f80 = local_a80._0_8_;
          uStack_1f78 = local_a80._8_8_;
          uStack_1f70 = local_a80._16_8_;
          uStack_1f68 = local_a80._24_8_;
          local_1f00 = uVar74;
          uStack_1ef8 = uVar75;
          uStack_1ef0 = uVar76;
          uStack_1ee8 = uVar77;
          local_1e60 = uVar58;
          uStack_1e58 = uVar59;
          uStack_1e50 = uVar60;
          uStack_1e48 = uVar61;
          local_1dc0 = uVar42;
          uStack_1db8 = uVar43;
          uStack_1db0 = uVar44;
          uStack_1da8 = uVar45;
          local_1d20 = uVar26;
          uStack_1d18 = uVar27;
          uStack_1d10 = uVar28;
          uStack_1d08 = uVar29;
          local_1d00 = local_ac0._0_8_;
          uStack_1cf8 = local_ac0._8_8_;
          uStack_1cf0 = local_ac0._16_8_;
          uStack_1ce8 = local_ac0._24_8_;
          local_1c80 = uVar70;
          uStack_1c78 = uVar71;
          uStack_1c70 = uVar72;
          uStack_1c68 = uVar73;
          local_1be0 = uVar54;
          uStack_1bd8 = uVar55;
          uStack_1bd0 = uVar56;
          uStack_1bc8 = uVar57;
          local_1b40 = uVar38;
          uStack_1b38 = uVar39;
          uStack_1b30 = uVar40;
          uStack_1b28 = uVar41;
          local_1aa0 = uVar22;
          uStack_1a98 = uVar23;
          uStack_1a90 = uVar24;
          uStack_1a88 = uVar25;
          local_1a80 = local_b00._0_8_;
          uStack_1a78 = local_b00._8_8_;
          uStack_1a70 = local_b00._16_8_;
          uStack_1a68 = local_b00._24_8_;
          local_b40 = auVar101;
          local_b20 = local_2694;
          local_b1c = local_2694;
          local_b18 = local_2694;
          local_b14 = local_2694;
          local_b10 = local_2694;
          local_b0c = local_2694;
          local_b08 = local_2694;
          local_b04 = local_2694;
          local_b00 = auVar102;
          local_ae0 = local_2698;
          local_adc = local_2698;
          local_ad8 = local_2698;
          local_ad4 = local_2698;
          local_ad0 = local_2698;
          local_acc = local_2698;
          local_ac8 = local_2698;
          local_ac4 = local_2698;
          local_ac0 = auVar103;
          local_aa0 = local_269c;
          local_a9c = local_269c;
          local_a98 = local_269c;
          local_a94 = local_269c;
          local_a90 = local_269c;
          local_a8c = local_269c;
          local_a88 = local_269c;
          local_a84 = local_269c;
          local_a80 = auVar104;
          local_a60 = local_26a0;
          local_a5c = local_26a0;
          local_a58 = local_26a0;
          local_a54 = local_26a0;
          local_a50 = local_26a0;
          local_a4c = local_26a0;
          local_a48 = local_26a0;
          local_a44 = local_26a0;
          fStack_484 = fStack_1a44;
          fStack_444 = fStack_1ae4;
          fStack_404 = fStack_1b84;
          fStack_3c4 = fStack_1c24;
          local_3c0 = local_1d60;
          uStack_3b8 = uStack_1d58;
          uStack_3b0 = uStack_1d50;
          uStack_3a8 = uStack_1d48;
          fStack_384 = fStack_1cc4;
          local_380 = local_1e00;
          uStack_378 = uStack_1df8;
          uStack_370 = uStack_1df0;
          uStack_368 = uStack_1de8;
          fStack_344 = fStack_1d64;
          local_340 = local_1ea0;
          uStack_338 = uStack_1e98;
          uStack_330 = uStack_1e90;
          uStack_328 = uStack_1e88;
          fStack_304 = fStack_1e04;
          local_300 = local_1f40;
          uStack_2f8 = uStack_1f38;
          uStack_2f0 = uStack_1f30;
          uStack_2e8 = uStack_1f28;
          fStack_2c4 = fStack_1ea4;
          local_2c0 = local_1fe0;
          uStack_2b8 = uStack_1fd8;
          uStack_2b0 = uStack_1fd0;
          uStack_2a8 = uStack_1fc8;
          fStack_284 = fStack_1f44;
          local_280 = local_2080;
          uStack_278 = uStack_2078;
          uStack_270 = uStack_2070;
          uStack_268 = uStack_2068;
          fStack_244 = fStack_1fe4;
          local_240 = local_2120;
          uStack_238 = uStack_2118;
          uStack_230 = uStack_2110;
          uStack_228 = uStack_2108;
          fStack_204 = fStack_2084;
          local_200 = local_21c0;
          uStack_1f8 = uStack_21b8;
          uStack_1f0 = uStack_21b0;
          uStack_1e8 = uStack_21a8;
          fStack_1c4 = fStack_2124;
        }
      }
    }
    local_26a4 = *local_2bd8;
    auVar10 = vinsertps_avx(ZEXT416(local_26a4),ZEXT416(local_26a4),0x10);
    auVar10 = vinsertps_avx(auVar10,ZEXT416(local_26a4),0x20);
    auVar10 = vinsertps_avx(auVar10,ZEXT416(local_26a4),0x30);
    auVar11 = vinsertps_avx(ZEXT416(local_26a4),ZEXT416(local_26a4),0x10);
    auVar11 = vinsertps_avx(auVar11,ZEXT416(local_26a4),0x20);
    auVar11 = vinsertps_avx(auVar11,ZEXT416(local_26a4),0x30);
    auVar105._16_16_ = auVar10;
    auVar105._0_16_ = auVar11;
    local_a40._0_8_ = auVar11._0_8_;
    local_a40._8_8_ = auVar11._8_8_;
    local_a40._16_8_ = auVar10._0_8_;
    local_a40._24_8_ = auVar10._8_8_;
    local_26a8 = local_2bd8[1];
    auVar12 = vinsertps_avx(ZEXT416(local_26a8),ZEXT416(local_26a8),0x10);
    auVar12 = vinsertps_avx(auVar12,ZEXT416(local_26a8),0x20);
    auVar12 = vinsertps_avx(auVar12,ZEXT416(local_26a8),0x30);
    auVar13 = vinsertps_avx(ZEXT416(local_26a8),ZEXT416(local_26a8),0x10);
    auVar13 = vinsertps_avx(auVar13,ZEXT416(local_26a8),0x20);
    auVar13 = vinsertps_avx(auVar13,ZEXT416(local_26a8),0x30);
    auVar106._16_16_ = auVar12;
    auVar106._0_16_ = auVar13;
    local_a00._0_8_ = auVar13._0_8_;
    local_a00._8_8_ = auVar13._8_8_;
    local_a00._16_8_ = auVar12._0_8_;
    local_a00._24_8_ = auVar12._8_8_;
    local_26ac = local_2bd8[2];
    auVar14 = vinsertps_avx(ZEXT416(local_26ac),ZEXT416(local_26ac),0x10);
    auVar14 = vinsertps_avx(auVar14,ZEXT416(local_26ac),0x20);
    auVar14 = vinsertps_avx(auVar14,ZEXT416(local_26ac),0x30);
    auVar15 = vinsertps_avx(ZEXT416(local_26ac),ZEXT416(local_26ac),0x10);
    auVar15 = vinsertps_avx(auVar15,ZEXT416(local_26ac),0x20);
    auVar15 = vinsertps_avx(auVar15,ZEXT416(local_26ac),0x30);
    auVar107._16_16_ = auVar14;
    auVar107._0_16_ = auVar15;
    local_9c0._0_8_ = auVar15._0_8_;
    local_9c0._8_8_ = auVar15._8_8_;
    local_9c0._16_8_ = auVar14._0_8_;
    local_9c0._24_8_ = auVar14._8_8_;
    local_26b0 = local_2bd8[3];
    auVar16 = vinsertps_avx(ZEXT416(local_26b0),ZEXT416(local_26b0),0x10);
    auVar16 = vinsertps_avx(auVar16,ZEXT416(local_26b0),0x20);
    auVar16 = vinsertps_avx(auVar16,ZEXT416(local_26b0),0x30);
    auVar17 = vinsertps_avx(ZEXT416(local_26b0),ZEXT416(local_26b0),0x10);
    auVar17 = vinsertps_avx(auVar17,ZEXT416(local_26b0),0x20);
    auVar17 = vinsertps_avx(auVar17,ZEXT416(local_26b0),0x30);
    auVar108._16_16_ = auVar16;
    auVar108._0_16_ = auVar17;
    local_980._0_8_ = auVar17._0_8_;
    local_980._8_8_ = auVar17._8_8_;
    local_980._16_8_ = auVar16._0_8_;
    local_980._24_8_ = auVar16._8_8_;
    local_37a8 = local_2d20;
    local_37b0 = local_2d28;
    local_37b8 = local_2d30;
    local_37c0 = local_2d38;
    local_2968 = local_2bc0;
    local_296c = local_2d40;
    local_37c8 = (undefined8 *)
                 (*local_2bc0 +
                 (long)*(int *)((long)local_2bc0 + 0x2c) * (long)local_2d40 * local_2bc0[2]);
    for (local_37cc = 0; local_37cc < local_2be4; local_37cc = local_37cc + 1) {
      local_2b98 = local_37a8;
      uVar18 = *local_37a8;
      uVar19 = local_37a8[1];
      uVar20 = local_37a8[2];
      uVar21 = local_37a8[3];
      local_2ba0 = local_37b0;
      uVar22 = *local_37b0;
      uVar23 = local_37b0[1];
      uVar24 = local_37b0[2];
      uVar25 = local_37b0[3];
      local_2ba8 = local_37b8;
      uVar26 = *local_37b8;
      uVar27 = local_37b8[1];
      uVar28 = local_37b8[2];
      uVar29 = local_37b8[3];
      local_2bb0 = local_37c0;
      uVar30 = *local_37c0;
      uVar31 = local_37c0[1];
      uVar32 = local_37c0[2];
      uVar33 = local_37c0[3];
      local_2640._0_4_ = (float)uVar18;
      local_2640._4_4_ = (float)((ulong)uVar18 >> 0x20);
      uStack_2638._0_4_ = (float)uVar19;
      uStack_2638._4_4_ = (float)((ulong)uVar19 >> 0x20);
      uStack_2630._0_4_ = (float)uVar20;
      uStack_2630._4_4_ = (float)((ulong)uVar20 >> 0x20);
      uStack_2628._0_4_ = (float)uVar21;
      uStack_2628._4_4_ = (float)((ulong)uVar21 >> 0x20);
      local_2660._0_4_ = auVar11._0_4_;
      local_2660._4_4_ = auVar11._4_4_;
      uStack_2658._0_4_ = auVar11._8_4_;
      uStack_2658._4_4_ = auVar11._12_4_;
      uStack_2650._0_4_ = auVar10._0_4_;
      uStack_2650._4_4_ = auVar10._4_4_;
      uStack_2648._0_4_ = auVar10._8_4_;
      local_3880 = CONCAT44(local_2640._4_4_ * local_2660._4_4_,
                            (float)local_2640 * (float)local_2660);
      uStack_3878 = CONCAT44(uStack_2638._4_4_ * uStack_2658._4_4_,
                             (float)uStack_2638 * (float)uStack_2658);
      uStack_3870 = CONCAT44(uStack_2630._4_4_ * uStack_2650._4_4_,
                             (float)uStack_2630 * (float)uStack_2650);
      uStack_3868 = CONCAT44(uStack_2628._4_4_,(float)uStack_2628 * (float)uStack_2648);
      local_2240 = local_a00._0_8_;
      uStack_2238 = local_a00._8_8_;
      uStack_2230 = local_a00._16_8_;
      uStack_2228 = local_a00._24_8_;
      local_2260 = local_3880;
      uStack_2258 = uStack_3878;
      uStack_2250 = uStack_3870;
      uStack_2248 = uStack_3868;
      local_2220._0_4_ = (float)uVar22;
      local_21e0 = (float)local_2220;
      local_2220._4_4_ = (float)((ulong)uVar22 >> 0x20);
      fStack_21dc = local_2220._4_4_;
      uStack_2218._0_4_ = (float)uVar23;
      fStack_21d8 = (float)uStack_2218;
      uStack_2218._4_4_ = (float)((ulong)uVar23 >> 0x20);
      fStack_21d4 = uStack_2218._4_4_;
      uStack_2210._0_4_ = (float)uVar24;
      fStack_21d0 = (float)uStack_2210;
      uStack_2210._4_4_ = (float)((ulong)uVar24 >> 0x20);
      fStack_21cc = uStack_2210._4_4_;
      uStack_2208._0_4_ = (float)uVar25;
      fStack_21c8 = (float)uStack_2208;
      uStack_2208._4_4_ = (float)((ulong)uVar25 >> 0x20);
      fStack_21c4 = uStack_2208._4_4_;
      local_2200._0_4_ = auVar13._0_4_;
      local_2200._4_4_ = auVar13._4_4_;
      uStack_21f8._0_4_ = auVar13._8_4_;
      uStack_21f8._4_4_ = auVar13._12_4_;
      uStack_21f0._0_4_ = auVar12._0_4_;
      uStack_21f0._4_4_ = auVar12._4_4_;
      uStack_21e8._0_4_ = auVar12._8_4_;
      local_1a0 = (float)local_2220 * (float)local_2200;
      fStack_19c = local_2220._4_4_ * local_2200._4_4_;
      fStack_198 = (float)uStack_2218 * (float)uStack_21f8;
      fStack_194 = uStack_2218._4_4_ * uStack_21f8._4_4_;
      fStack_190 = (float)uStack_2210 * (float)uStack_21f0;
      fStack_18c = uStack_2210._4_4_ * uStack_21f0._4_4_;
      fStack_188 = (float)uStack_2208 * (float)uStack_21e8;
      local_1c0 = local_3880;
      uStack_1b8 = uStack_3878;
      uStack_1b0 = uStack_3870;
      uStack_1a8 = uStack_3868;
      fVar88 = local_1a0 + (float)local_2640 * (float)local_2660;
      fVar109 = fStack_19c + local_2640._4_4_ * local_2660._4_4_;
      fVar110 = fStack_198 + (float)uStack_2638 * (float)uStack_2658;
      fVar112 = fStack_194 + uStack_2638._4_4_ * uStack_2658._4_4_;
      fVar116 = fStack_190 + (float)uStack_2630 * (float)uStack_2650;
      fVar125 = fStack_18c + uStack_2630._4_4_ * uStack_2650._4_4_;
      fVar135 = fStack_188 + (float)uStack_2628 * (float)uStack_2648;
      local_2300 = CONCAT44(fVar109,fVar88);
      uStack_22f8 = CONCAT44(fVar112,fVar110);
      uStack_22f0 = CONCAT44(fVar125,fVar116);
      uStack_22e8 = CONCAT44(uStack_2208._4_4_ + uStack_2628._4_4_,fVar135);
      local_22e0 = local_9c0._0_8_;
      uStack_22d8 = local_9c0._8_8_;
      uStack_22d0 = local_9c0._16_8_;
      uStack_22c8 = local_9c0._24_8_;
      local_22c0._0_4_ = (float)uVar26;
      local_2280 = (float)local_22c0;
      local_22c0._4_4_ = (float)((ulong)uVar26 >> 0x20);
      fStack_227c = local_22c0._4_4_;
      uStack_22b8._0_4_ = (float)uVar27;
      fStack_2278 = (float)uStack_22b8;
      uStack_22b8._4_4_ = (float)((ulong)uVar27 >> 0x20);
      fStack_2274 = uStack_22b8._4_4_;
      uStack_22b0._0_4_ = (float)uVar28;
      fStack_2270 = (float)uStack_22b0;
      uStack_22b0._4_4_ = (float)((ulong)uVar28 >> 0x20);
      fStack_226c = uStack_22b0._4_4_;
      uStack_22a8._0_4_ = (float)uVar29;
      fStack_2268 = (float)uStack_22a8;
      uStack_22a8._4_4_ = (float)((ulong)uVar29 >> 0x20);
      fStack_2264 = uStack_22a8._4_4_;
      local_22a0._0_4_ = auVar15._0_4_;
      local_22a0._4_4_ = auVar15._4_4_;
      uStack_2298._0_4_ = auVar15._8_4_;
      uStack_2298._4_4_ = auVar15._12_4_;
      uStack_2290._0_4_ = auVar14._0_4_;
      uStack_2290._4_4_ = auVar14._4_4_;
      uStack_2288._0_4_ = auVar14._8_4_;
      local_160 = (float)local_22c0 * (float)local_22a0;
      fStack_15c = local_22c0._4_4_ * local_22a0._4_4_;
      fStack_158 = (float)uStack_22b8 * (float)uStack_2298;
      fStack_154 = uStack_22b8._4_4_ * uStack_2298._4_4_;
      fStack_150 = (float)uStack_22b0 * (float)uStack_2290;
      fStack_14c = uStack_22b0._4_4_ * uStack_2290._4_4_;
      fStack_148 = (float)uStack_22a8 * (float)uStack_2288;
      fVar88 = local_160 + fVar88;
      fVar109 = fStack_15c + fVar109;
      fVar110 = fStack_158 + fVar110;
      fVar112 = fStack_154 + fVar112;
      fVar116 = fStack_150 + fVar116;
      fVar125 = fStack_14c + fVar125;
      fVar135 = fStack_148 + fVar135;
      uStack_22a8._4_4_ = uStack_22a8._4_4_ + uStack_2208._4_4_ + uStack_2628._4_4_;
      local_23a0 = CONCAT44(fVar109,fVar88);
      uStack_2398 = CONCAT44(fVar112,fVar110);
      uStack_2390 = CONCAT44(fVar125,fVar116);
      uStack_2388 = CONCAT44(uStack_22a8._4_4_,fVar135);
      local_2380 = local_980._0_8_;
      uStack_2378 = local_980._8_8_;
      uStack_2370 = local_980._16_8_;
      uStack_2368 = local_980._24_8_;
      local_2360._0_4_ = (float)uVar30;
      local_2320 = (float)local_2360;
      local_2360._4_4_ = (float)((ulong)uVar30 >> 0x20);
      fStack_231c = local_2360._4_4_;
      uStack_2358._0_4_ = (float)uVar31;
      fStack_2318 = (float)uStack_2358;
      uStack_2358._4_4_ = (float)((ulong)uVar31 >> 0x20);
      fStack_2314 = uStack_2358._4_4_;
      uStack_2350._0_4_ = (float)uVar32;
      fStack_2310 = (float)uStack_2350;
      uStack_2350._4_4_ = (float)((ulong)uVar32 >> 0x20);
      fStack_230c = uStack_2350._4_4_;
      uStack_2348._0_4_ = (float)uVar33;
      fStack_2308 = (float)uStack_2348;
      uStack_2348._4_4_ = (float)((ulong)uVar33 >> 0x20);
      fStack_2304 = uStack_2348._4_4_;
      local_2340._0_4_ = auVar17._0_4_;
      local_2340._4_4_ = auVar17._4_4_;
      uStack_2338._0_4_ = auVar17._8_4_;
      uStack_2338._4_4_ = auVar17._12_4_;
      uStack_2330._0_4_ = auVar16._0_4_;
      uStack_2330._4_4_ = auVar16._4_4_;
      uStack_2328._0_4_ = auVar16._8_4_;
      local_120 = (float)local_2360 * (float)local_2340;
      fStack_11c = local_2360._4_4_ * local_2340._4_4_;
      fStack_118 = (float)uStack_2358 * (float)uStack_2338;
      fStack_114 = uStack_2358._4_4_ * uStack_2338._4_4_;
      fStack_110 = (float)uStack_2350 * (float)uStack_2330;
      fStack_10c = uStack_2350._4_4_ * uStack_2330._4_4_;
      fStack_108 = (float)uStack_2348 * (float)uStack_2328;
      local_2960 = CONCAT44(fStack_11c + fVar109,local_120 + fVar88);
      uStack_2958 = CONCAT44(fStack_114 + fVar112,fStack_118 + fVar110);
      uStack_2950 = CONCAT44(fStack_10c + fVar125,fStack_110 + fVar116);
      uStack_2948 = CONCAT44(uStack_2348._4_4_ + uStack_22a8._4_4_,fStack_108 + fVar135);
      local_2928 = local_37c8;
      *local_37c8 = local_2960;
      local_37c8[1] = uStack_2958;
      local_37c8[2] = uStack_2950;
      local_37c8[3] = uStack_2948;
      local_37c8 = local_37c8 + 4;
      local_37a8 = local_37a8 + 4;
      local_37b0 = local_37b0 + 4;
      local_37b8 = local_37b8 + 4;
      local_37c0 = local_37c0 + 4;
      local_2660 = local_a40._0_8_;
      uStack_2658 = local_a40._8_8_;
      uStack_2650 = local_a40._16_8_;
      uStack_2648 = local_a40._24_8_;
      local_2640 = uVar18;
      uStack_2638 = uVar19;
      uStack_2630 = uVar20;
      uStack_2628 = uVar21;
      local_2360 = uVar30;
      uStack_2358 = uVar31;
      uStack_2350 = uVar32;
      uStack_2348 = uVar33;
      local_2340 = local_980._0_8_;
      uStack_2338 = local_980._8_8_;
      uStack_2330 = local_980._16_8_;
      uStack_2328 = local_980._24_8_;
      local_22c0 = uVar26;
      uStack_22b8 = uVar27;
      uStack_22b0 = uVar28;
      uStack_22a8 = uVar29;
      local_22a0 = local_9c0._0_8_;
      uStack_2298 = local_9c0._8_8_;
      uStack_2290 = local_9c0._16_8_;
      uStack_2288 = local_9c0._24_8_;
      local_2220 = uVar22;
      uStack_2218 = uVar23;
      uStack_2210 = uVar24;
      uStack_2208 = uVar25;
      local_2200 = local_a00._0_8_;
      uStack_21f8 = local_a00._8_8_;
      uStack_21f0 = local_a00._16_8_;
      uStack_21e8 = local_a00._24_8_;
      fStack_184 = fStack_21c4;
      local_180 = local_2300;
      uStack_178 = uStack_22f8;
      uStack_170 = uStack_22f0;
      uStack_168 = uStack_22e8;
      fStack_144 = fStack_2264;
      local_140 = local_23a0;
      uStack_138 = uStack_2398;
      uStack_130 = uStack_2390;
      uStack_128 = uStack_2388;
      fStack_104 = fStack_2304;
    }
    local_2bd8 = local_2bd8 + 4;
    local_2d3c = iVar137;
    local_a40 = auVar105;
    local_a20 = local_26a4;
    local_a1c = local_26a4;
    local_a18 = local_26a4;
    local_a14 = local_26a4;
    local_a10 = local_26a4;
    local_a0c = local_26a4;
    local_a08 = local_26a4;
    local_a04 = local_26a4;
    local_a00 = auVar106;
    local_9e0 = local_26a8;
    local_9dc = local_26a8;
    local_9d8 = local_26a8;
    local_9d4 = local_26a8;
    local_9d0 = local_26a8;
    local_9cc = local_26a8;
    local_9c8 = local_26a8;
    local_9c4 = local_26a8;
    local_9c0 = auVar107;
    local_9a0 = local_26ac;
    local_99c = local_26ac;
    local_998 = local_26ac;
    local_994 = local_26ac;
    local_990 = local_26ac;
    local_98c = local_26ac;
    local_988 = local_26ac;
    local_984 = local_26ac;
    local_980 = auVar108;
    local_960 = local_26b0;
    local_95c = local_26b0;
    local_958 = local_26b0;
    local_954 = local_26b0;
    local_950 = local_26b0;
    local_94c = local_26b0;
    local_948 = local_26b0;
    local_944 = local_26b0;
  }
  ppuVar136 = &local_2d18;
  local_2a50 = ppuVar136;
  local_e88 = ppuVar136;
  if (local_2d10 != (int *)0x0) {
    local_e8c = 0xffffffff;
    LOCK();
    local_e90 = *local_2d10;
    *local_2d10 = *local_2d10 + -1;
    UNLOCK();
    if (local_e90 == 1) {
      if (local_2cf8 == (long *)0x0) {
        local_e80 = local_2d18;
        if (local_2d18 != (undefined8 *)0x0) {
          free(local_2d18);
        }
      }
      else {
        (**(code **)(*local_2cf8 + 0x18))(local_2cf8,local_2d18);
      }
    }
  }
  *ppuVar136 = (undefined8 *)0x0;
  ppuVar136[2] = (undefined8 *)0x0;
  *(undefined4 *)(ppuVar136 + 3) = 0;
  *(undefined4 *)(ppuVar136 + 5) = 0;
  *(undefined4 *)((long)ppuVar136 + 0x2c) = 0;
  *(undefined4 *)(ppuVar136 + 6) = 0;
  *(undefined4 *)((long)ppuVar136 + 0x34) = 0;
  *(undefined4 *)(ppuVar136 + 7) = 0;
  ppuVar136[8] = (undefined8 *)0x0;
  ppuVar136[1] = (undefined8 *)0x0;
  ppuVar136 = &local_2cd0;
  local_2a40 = ppuVar136;
  local_ea8 = ppuVar136;
  if (local_2cc8 != (int *)0x0) {
    local_eac = 0xffffffff;
    LOCK();
    local_eb0 = *local_2cc8;
    *local_2cc8 = *local_2cc8 + -1;
    UNLOCK();
    if (local_eb0 == 1) {
      if (local_2cb0 == (long *)0x0) {
        local_e70 = local_2cd0;
        if (local_2cd0 != (undefined8 *)0x0) {
          free(local_2cd0);
        }
      }
      else {
        (**(code **)(*local_2cb0 + 0x18))(local_2cb0,local_2cd0);
      }
    }
  }
  *ppuVar136 = (undefined8 *)0x0;
  ppuVar136[2] = (undefined8 *)0x0;
  *(undefined4 *)(ppuVar136 + 3) = 0;
  *(undefined4 *)(ppuVar136 + 5) = 0;
  *(undefined4 *)((long)ppuVar136 + 0x2c) = 0;
  *(undefined4 *)(ppuVar136 + 6) = 0;
  *(undefined4 *)((long)ppuVar136 + 0x34) = 0;
  *(undefined4 *)(ppuVar136 + 7) = 0;
  ppuVar136[8] = (undefined8 *)0x0;
  ppuVar136[1] = (undefined8 *)0x0;
  ppuVar136 = &local_2c78;
  local_2a30 = ppuVar136;
  local_ec8 = ppuVar136;
  if (local_2c70 != (int *)0x0) {
    local_ecc = 0xffffffff;
    LOCK();
    local_ed0 = *local_2c70;
    *local_2c70 = *local_2c70 + -1;
    UNLOCK();
    if (local_ed0 == 1) {
      if (local_2c58 == (long *)0x0) {
        local_e60 = local_2c78;
        if (local_2c78 != (undefined8 *)0x0) {
          free(local_2c78);
        }
      }
      else {
        (**(code **)(*local_2c58 + 0x18))(local_2c58,local_2c78);
      }
    }
  }
  *ppuVar136 = (undefined8 *)0x0;
  ppuVar136[2] = (undefined8 *)0x0;
  *(undefined4 *)(ppuVar136 + 3) = 0;
  *(undefined4 *)(ppuVar136 + 5) = 0;
  *(undefined4 *)((long)ppuVar136 + 0x2c) = 0;
  *(undefined4 *)(ppuVar136 + 6) = 0;
  *(undefined4 *)((long)ppuVar136 + 0x34) = 0;
  *(undefined4 *)(ppuVar136 + 7) = 0;
  ppuVar136[8] = (undefined8 *)0x0;
  ppuVar136[1] = (undefined8 *)0x0;
  ppuVar136 = &local_2c30;
  if (local_2c28 != (int *)0x0) {
    local_eec = 0xffffffff;
    LOCK();
    local_ef0 = *local_2c28;
    *local_2c28 = *local_2c28 + -1;
    UNLOCK();
    if (local_ef0 == 1) {
      local_2a20 = ppuVar136;
      local_ee8 = ppuVar136;
      if (local_2c10 == (long *)0x0) {
        local_e50 = local_2c30;
        if (local_2c30 != (undefined8 *)0x0) {
          free(local_2c30);
        }
      }
      else {
        (**(code **)(*local_2c10 + 0x18))(local_2c10,local_2c30);
      }
    }
  }
  *ppuVar136 = (undefined8 *)0x0;
  ppuVar136[2] = (undefined8 *)0x0;
  *(undefined4 *)(ppuVar136 + 3) = 0;
  *(undefined4 *)(ppuVar136 + 5) = 0;
  *(undefined4 *)((long)ppuVar136 + 0x2c) = 0;
  *(undefined4 *)(ppuVar136 + 6) = 0;
  *(undefined4 *)((long)ppuVar136 + 0x34) = 0;
  *(undefined4 *)(ppuVar136 + 7) = 0;
  ppuVar136[8] = (undefined8 *)0x0;
  ppuVar136[1] = (undefined8 *)0x0;
  return;
}

Assistant:

static void resize_bicubic_image_pack8(const Mat& src, Mat& dst, float* alpha, int* xofs, float* beta, int* yofs)
{
    int w = dst.w;
    int h = dst.h;

    // loop body
    Mat rowsbuf0(w, (size_t)8 * 4u, 8);
    Mat rowsbuf1(w, (size_t)8 * 4u, 8);
    Mat rowsbuf2(w, (size_t)8 * 4u, 8);
    Mat rowsbuf3(w, (size_t)8 * 4u, 8);
    float* rows0 = rowsbuf0;
    float* rows1 = rowsbuf1;
    float* rows2 = rowsbuf2;
    float* rows3 = rowsbuf3;

    int prev_sy1 = -3;

    for (int dy = 0; dy < h; dy++)
    {
        int sy = yofs[dy];

        if (sy == prev_sy1)
        {
            // reuse all rows
        }
        else if (sy == prev_sy1 + 1)
        {
            // hresize one row
            float* rows0_old = rows0;
            rows0 = rows1;
            rows1 = rows2;
            rows2 = rows3;
            rows3 = rows0_old;
            const float* S3 = src.row(sy + 2);

            const float* alphap = alpha;
            float* rows3p = rows3;
            for (int dx = 0; dx < w; dx++)
            {
                int sx = xofs[dx] * 8;
                const float* S3p = S3 + sx;

                __m256 _a0 = _mm256_set1_ps(alphap[0]);
                __m256 _a1 = _mm256_set1_ps(alphap[1]);
                __m256 _a2 = _mm256_set1_ps(alphap[2]);
                __m256 _a3 = _mm256_set1_ps(alphap[3]);

                __m256 _S30 = _mm256_load_ps(S3p - 8);
                __m256 _S31 = _mm256_load_ps(S3p + 0);
                __m256 _S32 = _mm256_load_ps(S3p + 8);
                __m256 _S33 = _mm256_load_ps(S3p + 16);
                __m256 _rows3 = _mm256_mul_ps(_S30, _a0);
                _rows3 = _mm256_comp_fmadd_ps(_S31, _a1, _rows3);
                _rows3 = _mm256_comp_fmadd_ps(_S32, _a2, _rows3);
                _rows3 = _mm256_comp_fmadd_ps(_S33, _a3, _rows3);
                _mm256_store_ps(rows3p + dx * 8, _rows3);

                alphap += 4;
            }
        }
        else if (sy == prev_sy1 + 2)
        {
            // hresize two rows
            float* rows0_old = rows0;
            float* rows1_old = rows1;
            rows0 = rows2;
            rows1 = rows3;
            rows2 = rows0_old;
            rows3 = rows1_old;
            const float* S2 = src.row(sy + 1);
            const float* S3 = src.row(sy + 2);

            const float* alphap = alpha;
            float* rows2p = rows2;
            float* rows3p = rows3;
            for (int dx = 0; dx < w; dx++)
            {
                int sx = xofs[dx] * 8;
                const float* S2p = S2 + sx;
                const float* S3p = S3 + sx;

                __m256 _a0 = _mm256_set1_ps(alphap[0]);
                __m256 _a1 = _mm256_set1_ps(alphap[1]);
                __m256 _a2 = _mm256_set1_ps(alphap[2]);
                __m256 _a3 = _mm256_set1_ps(alphap[3]);

                __m256 _S20 = _mm256_load_ps(S2p - 8);
                __m256 _S21 = _mm256_load_ps(S2p + 0);
                __m256 _S22 = _mm256_load_ps(S2p + 8);
                __m256 _S23 = _mm256_load_ps(S2p + 16);
                __m256 _S30 = _mm256_load_ps(S3p - 8);
                __m256 _S31 = _mm256_load_ps(S3p + 0);
                __m256 _S32 = _mm256_load_ps(S3p + 8);
                __m256 _S33 = _mm256_load_ps(S3p + 16);
                __m256 _rows2 = _mm256_mul_ps(_S20, _a0);
                __m256 _rows3 = _mm256_mul_ps(_S30, _a0);
                _rows2 = _mm256_comp_fmadd_ps(_S21, _a1, _rows2);
                _rows3 = _mm256_comp_fmadd_ps(_S31, _a1, _rows3);
                _rows2 = _mm256_comp_fmadd_ps(_S22, _a2, _rows2);
                _rows3 = _mm256_comp_fmadd_ps(_S32, _a2, _rows3);
                _rows2 = _mm256_comp_fmadd_ps(_S23, _a3, _rows2);
                _rows3 = _mm256_comp_fmadd_ps(_S33, _a3, _rows3);
                _mm256_store_ps(rows2p + dx * 8, _rows2);
                _mm256_store_ps(rows3p + dx * 8, _rows3);

                alphap += 4;
            }
        }
        else if (sy == prev_sy1 + 3)
        {
            // hresize three rows
            float* rows0_old = rows0;
            float* rows1_old = rows1;
            float* rows2_old = rows2;
            rows0 = rows3;
            rows1 = rows0_old;
            rows2 = rows1_old;
            rows3 = rows2_old;
            const float* S1 = src.row(sy);
            const float* S2 = src.row(sy + 1);
            const float* S3 = src.row(sy + 2);

            const float* alphap = alpha;
            float* rows1p = rows1;
            float* rows2p = rows2;
            float* rows3p = rows3;
            for (int dx = 0; dx < w; dx++)
            {
                int sx = xofs[dx] * 8;
                const float* S1p = S1 + sx;
                const float* S2p = S2 + sx;
                const float* S3p = S3 + sx;

                __m256 _a0 = _mm256_set1_ps(alphap[0]);
                __m256 _a1 = _mm256_set1_ps(alphap[1]);
                __m256 _a2 = _mm256_set1_ps(alphap[2]);
                __m256 _a3 = _mm256_set1_ps(alphap[3]);

                __m256 _S10 = _mm256_load_ps(S1p - 8);
                __m256 _S11 = _mm256_load_ps(S1p + 0);
                __m256 _S12 = _mm256_load_ps(S1p + 8);
                __m256 _S13 = _mm256_load_ps(S1p + 16);
                __m256 _S20 = _mm256_load_ps(S2p - 8);
                __m256 _S21 = _mm256_load_ps(S2p + 0);
                __m256 _S22 = _mm256_load_ps(S2p + 8);
                __m256 _S23 = _mm256_load_ps(S2p + 16);
                __m256 _S30 = _mm256_load_ps(S3p - 8);
                __m256 _S31 = _mm256_load_ps(S3p + 0);
                __m256 _S32 = _mm256_load_ps(S3p + 8);
                __m256 _S33 = _mm256_load_ps(S3p + 16);
                __m256 _rows1 = _mm256_mul_ps(_S10, _a0);
                __m256 _rows2 = _mm256_mul_ps(_S20, _a0);
                __m256 _rows3 = _mm256_mul_ps(_S30, _a0);
                _rows1 = _mm256_comp_fmadd_ps(_S11, _a1, _rows1);
                _rows2 = _mm256_comp_fmadd_ps(_S21, _a1, _rows2);
                _rows3 = _mm256_comp_fmadd_ps(_S31, _a1, _rows3);
                _rows1 = _mm256_comp_fmadd_ps(_S12, _a2, _rows1);
                _rows2 = _mm256_comp_fmadd_ps(_S22, _a2, _rows2);
                _rows3 = _mm256_comp_fmadd_ps(_S32, _a2, _rows3);
                _rows1 = _mm256_comp_fmadd_ps(_S13, _a3, _rows1);
                _rows2 = _mm256_comp_fmadd_ps(_S23, _a3, _rows2);
                _rows3 = _mm256_comp_fmadd_ps(_S33, _a3, _rows3);
                _mm256_store_ps(rows1p + dx * 8, _rows1);
                _mm256_store_ps(rows2p + dx * 8, _rows2);
                _mm256_store_ps(rows3p + dx * 8, _rows3);

                alphap += 4;
            }
        }
        else
        {
            // hresize four rows
            const float* S0 = src.row(sy - 1);
            const float* S1 = src.row(sy);
            const float* S2 = src.row(sy + 1);
            const float* S3 = src.row(sy + 2);

            const float* alphap = alpha;
            float* rows0p = rows0;
            float* rows1p = rows1;
            float* rows2p = rows2;
            float* rows3p = rows3;
            for (int dx = 0; dx < w; dx++)
            {
                int sx = xofs[dx] * 8;
                const float* S0p = S0 + sx;
                const float* S1p = S1 + sx;
                const float* S2p = S2 + sx;
                const float* S3p = S3 + sx;

                __m256 _a0 = _mm256_set1_ps(alphap[0]);
                __m256 _a1 = _mm256_set1_ps(alphap[1]);
                __m256 _a2 = _mm256_set1_ps(alphap[2]);
                __m256 _a3 = _mm256_set1_ps(alphap[3]);

                __m256 _S00 = _mm256_load_ps(S0p - 8);
                __m256 _S01 = _mm256_load_ps(S0p + 0);
                __m256 _S02 = _mm256_load_ps(S0p + 8);
                __m256 _S03 = _mm256_load_ps(S0p + 16);
                __m256 _S10 = _mm256_load_ps(S1p - 8);
                __m256 _S11 = _mm256_load_ps(S1p + 0);
                __m256 _S12 = _mm256_load_ps(S1p + 8);
                __m256 _S13 = _mm256_load_ps(S1p + 16);
                __m256 _S20 = _mm256_load_ps(S2p - 8);
                __m256 _S21 = _mm256_load_ps(S2p + 0);
                __m256 _S22 = _mm256_load_ps(S2p + 8);
                __m256 _S23 = _mm256_load_ps(S2p + 16);
                __m256 _S30 = _mm256_load_ps(S3p - 8);
                __m256 _S31 = _mm256_load_ps(S3p + 0);
                __m256 _S32 = _mm256_load_ps(S3p + 8);
                __m256 _S33 = _mm256_load_ps(S3p + 16);
                __m256 _rows0 = _mm256_mul_ps(_S00, _a0);
                __m256 _rows1 = _mm256_mul_ps(_S10, _a0);
                __m256 _rows2 = _mm256_mul_ps(_S20, _a0);
                __m256 _rows3 = _mm256_mul_ps(_S30, _a0);
                _rows0 = _mm256_comp_fmadd_ps(_S01, _a1, _rows0);
                _rows1 = _mm256_comp_fmadd_ps(_S11, _a1, _rows1);
                _rows2 = _mm256_comp_fmadd_ps(_S21, _a1, _rows2);
                _rows3 = _mm256_comp_fmadd_ps(_S31, _a1, _rows3);
                _rows0 = _mm256_comp_fmadd_ps(_S02, _a2, _rows0);
                _rows1 = _mm256_comp_fmadd_ps(_S12, _a2, _rows1);
                _rows2 = _mm256_comp_fmadd_ps(_S22, _a2, _rows2);
                _rows3 = _mm256_comp_fmadd_ps(_S32, _a2, _rows3);
                _rows0 = _mm256_comp_fmadd_ps(_S03, _a3, _rows0);
                _rows1 = _mm256_comp_fmadd_ps(_S13, _a3, _rows1);
                _rows2 = _mm256_comp_fmadd_ps(_S23, _a3, _rows2);
                _rows3 = _mm256_comp_fmadd_ps(_S33, _a3, _rows3);
                _mm256_store_ps(rows0p + dx * 8, _rows0);
                _mm256_store_ps(rows1p + dx * 8, _rows1);
                _mm256_store_ps(rows2p + dx * 8, _rows2);
                _mm256_store_ps(rows3p + dx * 8, _rows3);

                alphap += 4;
            }
        }

        prev_sy1 = sy;

        // vresize
        __m256 _b0 = _mm256_set1_ps(beta[0]);
        __m256 _b1 = _mm256_set1_ps(beta[1]);
        __m256 _b2 = _mm256_set1_ps(beta[2]);
        __m256 _b3 = _mm256_set1_ps(beta[3]);

        float* rows0p = rows0;
        float* rows1p = rows1;
        float* rows2p = rows2;
        float* rows3p = rows3;
        float* Dp = dst.row(dy);

        for (int dx = 0; dx < w; dx++)
        {
            __m256 _rows0 = _mm256_load_ps(rows0p);
            __m256 _rows1 = _mm256_load_ps(rows1p);
            __m256 _rows2 = _mm256_load_ps(rows2p);
            __m256 _rows3 = _mm256_load_ps(rows3p);
            __m256 _D = _mm256_mul_ps(_rows0, _b0);
            _D = _mm256_comp_fmadd_ps(_rows1, _b1, _D);
            _D = _mm256_comp_fmadd_ps(_rows2, _b2, _D);
            _D = _mm256_comp_fmadd_ps(_rows3, _b3, _D);
            _mm256_store_ps(Dp, _D);

            Dp += 8;
            rows0p += 8;
            rows1p += 8;
            rows2p += 8;
            rows3p += 8;
        }

        beta += 4;
    }
}